

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

bool embree::avx::CurveNvIntersectorK<4,8>::
     occluded_t<embree::avx::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined4 uVar1;
  undefined8 uVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCRayQueryContext *pRVar5;
  RTCFilterFunctionN p_Var6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [12];
  ulong uVar78;
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  byte bVar86;
  ulong uVar87;
  undefined1 (*pauVar88) [32];
  uint uVar89;
  long lVar90;
  uint uVar91;
  ulong uVar92;
  uint uVar93;
  bool bVar94;
  int iVar95;
  bool bVar96;
  float fVar122;
  float fVar123;
  vint4 bi_2;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar108 [16];
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar124;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar106 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar107 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar128;
  float fVar151;
  float fVar152;
  vint4 bi_1;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar153;
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  float fVar154;
  float fVar183;
  float fVar184;
  vint4 ai;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar185;
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  float fVar186;
  float fVar204;
  float fVar205;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [28];
  float fVar206;
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  vint4 bi;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar214 [32];
  undefined1 auVar213 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  float fVar217;
  float fVar231;
  float fVar232;
  vint4 ai_2;
  undefined1 auVar218 [16];
  float fVar233;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar235;
  float fVar236;
  float fVar238;
  undefined1 auVar224 [32];
  float fVar234;
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  float fVar237;
  float fVar239;
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  float fVar240;
  float fVar241;
  float fVar242;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar254;
  float fVar259;
  undefined1 auVar243 [16];
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar260;
  float fVar261;
  float fVar262;
  float fVar265;
  float fVar266;
  float fVar267;
  float fVar270;
  float fVar271;
  float fVar274;
  float fVar275;
  float fVar278;
  float fVar279;
  float fVar281;
  undefined1 auVar246 [32];
  float fVar258;
  float fVar263;
  float fVar268;
  float fVar272;
  float fVar276;
  float fVar280;
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  float fVar264;
  float fVar269;
  float fVar273;
  float fVar277;
  undefined1 auVar253 [64];
  float fVar282;
  float fVar289;
  float fVar290;
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  float fVar292;
  undefined1 auVar286 [32];
  float fVar291;
  float fVar293;
  float fVar295;
  float fVar297;
  float fVar299;
  undefined1 auVar287 [32];
  float fVar294;
  float fVar296;
  float fVar298;
  undefined1 auVar288 [64];
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar310;
  float fVar313;
  vint4 ai_1;
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  float fVar311;
  float fVar312;
  float fVar314;
  float fVar315;
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar331 [16];
  float fVar337;
  float fVar338;
  undefined1 auVar332 [32];
  float fVar334;
  float fVar335;
  float fVar336;
  undefined1 auVar333 [64];
  float fVar342;
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [64];
  undefined1 auVar343 [16];
  float fVar347;
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  float fVar348;
  float fVar353;
  float fVar354;
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  float fVar355;
  float fVar356;
  float fVar357;
  float fVar358;
  undefined1 auVar351 [32];
  float fVar359;
  float fVar370;
  float fVar372;
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  float fVar360;
  float fVar371;
  float fVar373;
  float fVar374;
  float fVar375;
  float fVar376;
  float fVar377;
  float fVar378;
  float fVar379;
  float fVar380;
  float fVar381;
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_ccc;
  float local_cc0;
  undefined1 local_c80 [32];
  undefined1 local_ba0 [16];
  undefined1 local_b90 [16];
  undefined1 local_b80 [8];
  float fStack_b78;
  float fStack_b74;
  undefined1 local_b70 [8];
  float fStack_b68;
  float fStack_b64;
  undefined1 local_b60 [8];
  float fStack_b58;
  float fStack_b54;
  undefined1 local_b50 [8];
  float fStack_b48;
  float fStack_b44;
  undefined1 local_b40 [8];
  float fStack_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float fStack_b28;
  float fStack_b24;
  undefined1 (*local_b10) [16];
  undefined1 (*local_b08) [16];
  uint *local_b00;
  ulong local_af8;
  RTCFilterFunctionNArguments local_af0;
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [16];
  undefined1 local_a50 [8];
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [32];
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  float local_9a0;
  float fStack_99c;
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [16];
  undefined1 local_930 [16];
  Primitive *local_918;
  Primitive *local_910;
  ulong local_908;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [16];
  undefined1 auStack_7f0 [16];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  RTCHitN local_6e0 [16];
  undefined1 auStack_6d0 [16];
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [16];
  undefined1 local_690 [16];
  undefined1 local_680 [16];
  undefined1 local_670 [16];
  undefined1 local_660 [32];
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  uint local_600;
  uint uStack_5fc;
  uint uStack_5f8;
  uint uStack_5f4;
  uint uStack_5f0;
  uint uStack_5ec;
  uint uStack_5e8;
  uint uStack_5e4;
  uint local_5e0;
  uint uStack_5dc;
  uint uStack_5d8;
  uint uStack_5d4;
  uint uStack_5d0;
  uint uStack_5cc;
  uint uStack_5c8;
  uint uStack_5c4;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined4 uStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 auVar346 [64];
  undefined1 auVar352 [64];
  
  PVar3 = prim[1];
  uVar92 = (ulong)(byte)PVar3;
  lVar7 = uVar92 * 0x19;
  auVar130 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar130 = vinsertps_avx(auVar130,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar217 = *(float *)(prim + lVar7 + 0x12);
  auVar130 = vsubps_avx(auVar130,*(undefined1 (*) [16])(prim + lVar7 + 6));
  auVar155._0_4_ = fVar217 * auVar130._0_4_;
  auVar155._4_4_ = fVar217 * auVar130._4_4_;
  auVar155._8_4_ = fVar217 * auVar130._8_4_;
  auVar155._12_4_ = fVar217 * auVar130._12_4_;
  auVar283._0_4_ = fVar217 * auVar9._0_4_;
  auVar283._4_4_ = fVar217 * auVar9._4_4_;
  auVar283._8_4_ = fVar217 * auVar9._8_4_;
  auVar283._12_4_ = fVar217 * auVar9._12_4_;
  auVar130 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 4 + 6)));
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 5 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar168 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 6 + 6)));
  auVar168 = vcvtdq2ps_avx(auVar168);
  auVar164 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 0xb + 6)));
  auVar164 = vcvtdq2ps_avx(auVar164);
  auVar104 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar135 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar92 + 6)));
  auVar135 = vcvtdq2ps_avx(auVar135);
  uVar87 = (ulong)(uint)((int)(uVar92 * 9) * 2);
  auVar98 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 + 6)));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar103 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 + uVar92 + 6)));
  auVar103 = vcvtdq2ps_avx(auVar103);
  uVar87 = (ulong)(uint)((int)(uVar92 * 5) << 2);
  auVar129 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 + 6)));
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar97 = vshufps_avx(auVar283,auVar283,0);
  auVar106 = vshufps_avx(auVar283,auVar283,0x55);
  auVar156 = vshufps_avx(auVar283,auVar283,0xaa);
  fVar217 = auVar156._0_4_;
  fVar186 = auVar156._4_4_;
  fVar231 = auVar156._8_4_;
  fVar204 = auVar156._12_4_;
  fVar240 = auVar106._0_4_;
  fVar254 = auVar106._4_4_;
  fVar259 = auVar106._8_4_;
  fVar264 = auVar106._12_4_;
  fVar232 = auVar97._0_4_;
  fVar205 = auVar97._4_4_;
  fVar233 = auVar97._8_4_;
  fVar206 = auVar97._12_4_;
  auVar349._0_4_ = fVar232 * auVar130._0_4_ + fVar240 * auVar9._0_4_ + fVar217 * auVar168._0_4_;
  auVar349._4_4_ = fVar205 * auVar130._4_4_ + fVar254 * auVar9._4_4_ + fVar186 * auVar168._4_4_;
  auVar349._8_4_ = fVar233 * auVar130._8_4_ + fVar259 * auVar9._8_4_ + fVar231 * auVar168._8_4_;
  auVar349._12_4_ = fVar206 * auVar130._12_4_ + fVar264 * auVar9._12_4_ + fVar204 * auVar168._12_4_;
  auVar361._0_4_ = fVar232 * auVar164._0_4_ + fVar240 * auVar104._0_4_ + auVar135._0_4_ * fVar217;
  auVar361._4_4_ = fVar205 * auVar164._4_4_ + fVar254 * auVar104._4_4_ + auVar135._4_4_ * fVar186;
  auVar361._8_4_ = fVar233 * auVar164._8_4_ + fVar259 * auVar104._8_4_ + auVar135._8_4_ * fVar231;
  auVar361._12_4_ =
       fVar206 * auVar164._12_4_ + fVar264 * auVar104._12_4_ + auVar135._12_4_ * fVar204;
  auVar284._0_4_ = fVar232 * auVar98._0_4_ + fVar240 * auVar103._0_4_ + auVar129._0_4_ * fVar217;
  auVar284._4_4_ = fVar205 * auVar98._4_4_ + fVar254 * auVar103._4_4_ + auVar129._4_4_ * fVar186;
  auVar284._8_4_ = fVar233 * auVar98._8_4_ + fVar259 * auVar103._8_4_ + auVar129._8_4_ * fVar231;
  auVar284._12_4_ = fVar206 * auVar98._12_4_ + fVar264 * auVar103._12_4_ + auVar129._12_4_ * fVar204
  ;
  auVar97 = vshufps_avx(auVar155,auVar155,0);
  auVar106 = vshufps_avx(auVar155,auVar155,0x55);
  auVar156 = vshufps_avx(auVar155,auVar155,0xaa);
  fVar217 = auVar156._0_4_;
  fVar186 = auVar156._4_4_;
  fVar231 = auVar156._8_4_;
  fVar204 = auVar156._12_4_;
  fVar240 = auVar106._0_4_;
  fVar254 = auVar106._4_4_;
  fVar259 = auVar106._8_4_;
  fVar264 = auVar106._12_4_;
  fVar232 = auVar97._0_4_;
  fVar205 = auVar97._4_4_;
  fVar233 = auVar97._8_4_;
  fVar206 = auVar97._12_4_;
  auVar207._0_4_ = fVar232 * auVar130._0_4_ + fVar240 * auVar9._0_4_ + fVar217 * auVar168._0_4_;
  auVar207._4_4_ = fVar205 * auVar130._4_4_ + fVar254 * auVar9._4_4_ + fVar186 * auVar168._4_4_;
  auVar207._8_4_ = fVar233 * auVar130._8_4_ + fVar259 * auVar9._8_4_ + fVar231 * auVar168._8_4_;
  auVar207._12_4_ = fVar206 * auVar130._12_4_ + fVar264 * auVar9._12_4_ + fVar204 * auVar168._12_4_;
  auVar106._0_4_ = fVar232 * auVar164._0_4_ + auVar135._0_4_ * fVar217 + fVar240 * auVar104._0_4_;
  auVar106._4_4_ = fVar205 * auVar164._4_4_ + auVar135._4_4_ * fVar186 + fVar254 * auVar104._4_4_;
  auVar106._8_4_ = fVar233 * auVar164._8_4_ + auVar135._8_4_ * fVar231 + fVar259 * auVar104._8_4_;
  auVar106._12_4_ =
       fVar206 * auVar164._12_4_ + auVar135._12_4_ * fVar204 + fVar264 * auVar104._12_4_;
  auVar97._0_4_ = fVar232 * auVar98._0_4_ + fVar240 * auVar103._0_4_ + auVar129._0_4_ * fVar217;
  auVar97._4_4_ = fVar205 * auVar98._4_4_ + fVar254 * auVar103._4_4_ + auVar129._4_4_ * fVar186;
  auVar97._8_4_ = fVar233 * auVar98._8_4_ + fVar259 * auVar103._8_4_ + auVar129._8_4_ * fVar231;
  auVar97._12_4_ = fVar206 * auVar98._12_4_ + fVar264 * auVar103._12_4_ + auVar129._12_4_ * fVar204;
  auVar243._8_4_ = 0x7fffffff;
  auVar243._0_8_ = 0x7fffffff7fffffff;
  auVar243._12_4_ = 0x7fffffff;
  auVar130 = vandps_avx(auVar349,auVar243);
  auVar187._8_4_ = 0x219392ef;
  auVar187._0_8_ = 0x219392ef219392ef;
  auVar187._12_4_ = 0x219392ef;
  auVar130 = vcmpps_avx(auVar130,auVar187,1);
  auVar9 = vblendvps_avx(auVar349,auVar187,auVar130);
  auVar130 = vandps_avx(auVar361,auVar243);
  auVar130 = vcmpps_avx(auVar130,auVar187,1);
  auVar168 = vblendvps_avx(auVar361,auVar187,auVar130);
  auVar130 = vandps_avx(auVar284,auVar243);
  auVar130 = vcmpps_avx(auVar130,auVar187,1);
  auVar130 = vblendvps_avx(auVar284,auVar187,auVar130);
  auVar164 = vrcpps_avx(auVar9);
  fVar240 = auVar164._0_4_;
  auVar156._0_4_ = fVar240 * auVar9._0_4_;
  fVar254 = auVar164._4_4_;
  auVar156._4_4_ = fVar254 * auVar9._4_4_;
  fVar259 = auVar164._8_4_;
  auVar156._8_4_ = fVar259 * auVar9._8_4_;
  fVar264 = auVar164._12_4_;
  auVar156._12_4_ = fVar264 * auVar9._12_4_;
  auVar285._8_4_ = 0x3f800000;
  auVar285._0_8_ = 0x3f8000003f800000;
  auVar285._12_4_ = 0x3f800000;
  auVar9 = vsubps_avx(auVar285,auVar156);
  fVar240 = fVar240 + fVar240 * auVar9._0_4_;
  fVar254 = fVar254 + fVar254 * auVar9._4_4_;
  fVar259 = fVar259 + fVar259 * auVar9._8_4_;
  fVar264 = fVar264 + fVar264 * auVar9._12_4_;
  auVar9 = vrcpps_avx(auVar168);
  fVar217 = auVar9._0_4_;
  auVar218._0_4_ = fVar217 * auVar168._0_4_;
  fVar231 = auVar9._4_4_;
  auVar218._4_4_ = fVar231 * auVar168._4_4_;
  fVar232 = auVar9._8_4_;
  auVar218._8_4_ = fVar232 * auVar168._8_4_;
  fVar233 = auVar9._12_4_;
  auVar218._12_4_ = fVar233 * auVar168._12_4_;
  auVar9 = vsubps_avx(auVar285,auVar218);
  fVar217 = fVar217 + fVar217 * auVar9._0_4_;
  fVar231 = fVar231 + fVar231 * auVar9._4_4_;
  fVar232 = fVar232 + fVar232 * auVar9._8_4_;
  fVar233 = fVar233 + fVar233 * auVar9._12_4_;
  auVar9 = vrcpps_avx(auVar130);
  fVar186 = auVar9._0_4_;
  auVar188._0_4_ = fVar186 * auVar130._0_4_;
  fVar204 = auVar9._4_4_;
  auVar188._4_4_ = fVar204 * auVar130._4_4_;
  fVar205 = auVar9._8_4_;
  auVar188._8_4_ = fVar205 * auVar130._8_4_;
  fVar206 = auVar9._12_4_;
  auVar188._12_4_ = fVar206 * auVar130._12_4_;
  auVar130 = vsubps_avx(auVar285,auVar188);
  fVar186 = fVar186 + fVar186 * auVar130._0_4_;
  fVar204 = fVar204 + fVar204 * auVar130._4_4_;
  fVar205 = fVar205 + fVar205 * auVar130._8_4_;
  fVar206 = fVar206 + fVar206 * auVar130._12_4_;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = *(ulong *)(prim + uVar92 * 7 + 6);
  auVar130 = vpmovsxwd_avx(auVar130);
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar130 = vsubps_avx(auVar130,auVar207);
  auVar157._0_4_ = fVar240 * auVar130._0_4_;
  auVar157._4_4_ = fVar254 * auVar130._4_4_;
  auVar157._8_4_ = fVar259 * auVar130._8_4_;
  auVar157._12_4_ = fVar264 * auVar130._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar92 * 9 + 6);
  auVar130 = vpmovsxwd_avx(auVar9);
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar130 = vsubps_avx(auVar130,auVar207);
  auVar208._0_4_ = fVar240 * auVar130._0_4_;
  auVar208._4_4_ = fVar254 * auVar130._4_4_;
  auVar208._8_4_ = fVar259 * auVar130._8_4_;
  auVar208._12_4_ = fVar264 * auVar130._12_4_;
  auVar168._8_8_ = 0;
  auVar168._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar9 = vpmovsxwd_avx(auVar168);
  auVar164._8_8_ = 0;
  auVar164._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar92 * -2 + 6);
  auVar130 = vpmovsxwd_avx(auVar164);
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar130 = vsubps_avx(auVar130,auVar106);
  auVar303._0_4_ = auVar130._0_4_ * fVar217;
  auVar303._4_4_ = auVar130._4_4_ * fVar231;
  auVar303._8_4_ = auVar130._8_4_ * fVar232;
  auVar303._12_4_ = auVar130._12_4_ * fVar233;
  auVar130 = vcvtdq2ps_avx(auVar9);
  auVar130 = vsubps_avx(auVar130,auVar106);
  auVar129._0_4_ = fVar217 * auVar130._0_4_;
  auVar129._4_4_ = fVar231 * auVar130._4_4_;
  auVar129._8_4_ = fVar232 * auVar130._8_4_;
  auVar129._12_4_ = fVar233 * auVar130._12_4_;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)(prim + uVar87 + uVar92 + 6);
  auVar130 = vpmovsxwd_avx(auVar104);
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar130 = vsubps_avx(auVar130,auVar97);
  auVar219._0_4_ = auVar130._0_4_ * fVar186;
  auVar219._4_4_ = auVar130._4_4_ * fVar204;
  auVar219._8_4_ = auVar130._8_4_ * fVar205;
  auVar219._12_4_ = auVar130._12_4_ * fVar206;
  auVar135._8_8_ = 0;
  auVar135._0_8_ = *(ulong *)(prim + uVar92 * 0x17 + 6);
  auVar130 = vpmovsxwd_avx(auVar135);
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar130 = vsubps_avx(auVar130,auVar97);
  auVar98._0_4_ = auVar130._0_4_ * fVar186;
  auVar98._4_4_ = auVar130._4_4_ * fVar204;
  auVar98._8_4_ = auVar130._8_4_ * fVar205;
  auVar98._12_4_ = auVar130._12_4_ * fVar206;
  auVar130 = vpminsd_avx(auVar157,auVar208);
  auVar9 = vpminsd_avx(auVar303,auVar129);
  auVar130 = vmaxps_avx(auVar130,auVar9);
  auVar9 = vpminsd_avx(auVar219,auVar98);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar331._4_4_ = uVar1;
  auVar331._0_4_ = uVar1;
  auVar331._8_4_ = uVar1;
  auVar331._12_4_ = uVar1;
  auVar9 = vmaxps_avx(auVar9,auVar331);
  auVar130 = vmaxps_avx(auVar130,auVar9);
  local_700._0_4_ = auVar130._0_4_ * 0.99999964;
  local_700._4_4_ = auVar130._4_4_ * 0.99999964;
  local_700._8_4_ = auVar130._8_4_ * 0.99999964;
  local_700._12_4_ = auVar130._12_4_ * 0.99999964;
  auVar130 = vpmaxsd_avx(auVar157,auVar208);
  auVar9 = vpmaxsd_avx(auVar303,auVar129);
  auVar130 = vminps_avx(auVar130,auVar9);
  auVar9 = vpmaxsd_avx(auVar219,auVar98);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar158._4_4_ = uVar1;
  auVar158._0_4_ = uVar1;
  auVar158._8_4_ = uVar1;
  auVar158._12_4_ = uVar1;
  auVar9 = vminps_avx(auVar9,auVar158);
  auVar130 = vminps_avx(auVar130,auVar9);
  auVar103._0_4_ = auVar130._0_4_ * 1.0000004;
  auVar103._4_4_ = auVar130._4_4_ * 1.0000004;
  auVar103._8_4_ = auVar130._8_4_ * 1.0000004;
  auVar103._12_4_ = auVar130._12_4_ * 1.0000004;
  auVar130 = vpshufd_avx(ZEXT116((byte)PVar3),0);
  auVar9 = vpcmpgtd_avx(auVar130,_DAT_01f7fcf0);
  auVar130 = vcmpps_avx(local_700,auVar103,2);
  auVar130 = vandps_avx(auVar130,auVar9);
  uVar91 = vmovmskps_avx(auVar130);
  if (uVar91 == 0) {
    return false;
  }
  uVar91 = uVar91 & 0xff;
  auVar109._16_16_ = mm_lookupmask_ps._240_16_;
  auVar109._0_16_ = mm_lookupmask_ps._240_16_;
  local_918 = prim + lVar7 + 0x16;
  local_500 = vblendps_avx(auVar109,ZEXT832(0) << 0x20,0x80);
  uVar93 = 1 << ((byte)k & 0x1f);
  local_b00 = &local_600;
  local_b08 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar93 & 0xf) << 4));
  local_b10 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar93 >> 4) * 0x10);
  local_910 = prim;
LAB_00e226c9:
  local_908 = (ulong)uVar91;
  lVar7 = 0;
  if (local_908 != 0) {
    for (; (uVar91 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
    }
  }
  local_908 = local_908 - 1 & local_908;
  lVar90 = lVar7 * 0x40;
  lVar8 = 0;
  if (local_908 != 0) {
    for (; (local_908 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
    }
  }
  local_af8 = (ulong)*(uint *)(local_910 + 2);
  auVar130 = *(undefined1 (*) [16])(local_918 + lVar90);
  if (((local_908 != 0) && (uVar92 = local_908 - 1 & local_908, uVar92 != 0)) &&
     (lVar8 = 0, uVar92 != 0)) {
    for (; (uVar92 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
    }
  }
  auVar9 = *(undefined1 (*) [16])(local_918 + lVar90 + 0x10);
  auVar168 = *(undefined1 (*) [16])(local_918 + lVar90 + 0x20);
  auVar164 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar135 = vinsertps_avx(auVar164,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar217 = *(float *)(ray + k * 4 + 0x80);
  auVar343._4_4_ = fVar217;
  auVar343._0_4_ = fVar217;
  auVar343._8_4_ = fVar217;
  auVar343._12_4_ = fVar217;
  fStack_ab0 = fVar217;
  _local_ac0 = auVar343;
  fStack_aac = fVar217;
  fStack_aa8 = fVar217;
  fStack_aa4 = fVar217;
  auVar346 = ZEXT3264(_local_ac0);
  auVar164 = *(undefined1 (*) [16])(local_918 + lVar90 + 0x30);
  fVar186 = *(float *)(ray + k * 4 + 0xa0);
  auVar350._4_4_ = fVar186;
  auVar350._0_4_ = fVar186;
  auVar350._8_4_ = fVar186;
  auVar350._12_4_ = fVar186;
  fStack_9f0 = fVar186;
  _local_a00 = auVar350;
  fStack_9ec = fVar186;
  fStack_9e8 = fVar186;
  fStack_9e4 = fVar186;
  auVar352 = ZEXT3264(_local_a00);
  auVar104 = vunpcklps_avx(auVar343,auVar350);
  fVar231 = *(float *)(ray + k * 4 + 0xc0);
  auVar362._4_4_ = fVar231;
  auVar362._0_4_ = fVar231;
  auVar362._8_4_ = fVar231;
  auVar362._12_4_ = fVar231;
  fStack_890 = fVar231;
  _local_8a0 = auVar362;
  fStack_88c = fVar231;
  fStack_888 = fVar231;
  fStack_884 = fVar231;
  _local_a50 = vinsertps_avx(auVar104,auVar362,0x28);
  auVar333 = ZEXT1664(_local_a50);
  auVar99._0_4_ = (auVar130._0_4_ + auVar9._0_4_ + auVar168._0_4_ + auVar164._0_4_) * 0.25;
  auVar99._4_4_ = (auVar130._4_4_ + auVar9._4_4_ + auVar168._4_4_ + auVar164._4_4_) * 0.25;
  auVar99._8_4_ = (auVar130._8_4_ + auVar9._8_4_ + auVar168._8_4_ + auVar164._8_4_) * 0.25;
  auVar99._12_4_ = (auVar130._12_4_ + auVar9._12_4_ + auVar168._12_4_ + auVar164._12_4_) * 0.25;
  auVar104 = vsubps_avx(auVar99,auVar135);
  auVar104 = vdpps_avx(auVar104,_local_a50,0x7f);
  local_a60 = vdpps_avx(_local_a50,_local_a50,0x7f);
  auVar341 = ZEXT1664(local_a60);
  auVar98 = vrcpss_avx(local_a60,local_a60);
  fVar204 = auVar104._0_4_ * auVar98._0_4_ * (2.0 - local_a60._0_4_ * auVar98._0_4_);
  auVar288 = ZEXT464((uint)fVar204);
  auVar98 = vshufps_avx(ZEXT416((uint)fVar204),ZEXT416((uint)fVar204),0);
  auVar209._0_4_ = auVar135._0_4_ + local_a50._0_4_ * auVar98._0_4_;
  auVar209._4_4_ = auVar135._4_4_ + local_a50._4_4_ * auVar98._4_4_;
  auVar209._8_4_ = auVar135._8_4_ + local_a50._8_4_ * auVar98._8_4_;
  auVar209._12_4_ = auVar135._12_4_ + local_a50._12_4_ * auVar98._12_4_;
  auVar104 = vblendps_avx(auVar209,_DAT_01f7aa10,8);
  _local_b50 = vsubps_avx(auVar130,auVar104);
  auVar253 = ZEXT1664(_local_b50);
  _local_b60 = vsubps_avx(auVar168,auVar104);
  _local_b70 = vsubps_avx(auVar9,auVar104);
  _local_b80 = vsubps_avx(auVar164,auVar104);
  auVar130 = vshufps_avx(_local_b50,_local_b50,0);
  register0x00001250 = auVar130;
  _local_1e0 = auVar130;
  auVar130 = vshufps_avx(_local_b50,_local_b50,0x55);
  register0x00001250 = auVar130;
  _local_200 = auVar130;
  auVar130 = vshufps_avx(_local_b50,_local_b50,0xaa);
  register0x00001250 = auVar130;
  _local_220 = auVar130;
  auVar130 = vshufps_avx(_local_b50,_local_b50,0xff);
  register0x00001290 = auVar130;
  _local_240 = auVar130;
  auVar130 = vshufps_avx(_local_b70,_local_b70,0);
  register0x00001290 = auVar130;
  _local_260 = auVar130;
  auVar130 = vshufps_avx(_local_b70,_local_b70,0x55);
  register0x00001290 = auVar130;
  _local_280 = auVar130;
  auVar130 = vshufps_avx(_local_b70,_local_b70,0xaa);
  register0x00001290 = auVar130;
  _local_2a0 = auVar130;
  auVar130 = vshufps_avx(_local_b70,_local_b70,0xff);
  register0x00001290 = auVar130;
  _local_3e0 = auVar130;
  auVar130 = vshufps_avx(_local_b60,_local_b60,0);
  register0x00001290 = auVar130;
  _local_400 = auVar130;
  auVar130 = vshufps_avx(_local_b60,_local_b60,0x55);
  register0x00001290 = auVar130;
  _local_420 = auVar130;
  auVar130 = vshufps_avx(_local_b60,_local_b60,0xaa);
  register0x00001290 = auVar130;
  _local_440 = auVar130;
  auVar130 = vshufps_avx(_local_b60,_local_b60,0xff);
  register0x00001290 = auVar130;
  _local_460 = auVar130;
  auVar130 = vshufps_avx(_local_b80,_local_b80,0);
  register0x00001290 = auVar130;
  _local_480 = auVar130;
  auVar130 = vshufps_avx(_local_b80,_local_b80,0x55);
  register0x00001290 = auVar130;
  _local_4a0 = auVar130;
  auVar130 = vshufps_avx(_local_b80,_local_b80,0xaa);
  register0x00001290 = auVar130;
  _local_4c0 = auVar130;
  auVar130 = vshufps_avx(_local_b80,_local_b80,0xff);
  local_4e0._16_16_ = auVar130;
  local_4e0._0_16_ = auVar130;
  auVar130 = ZEXT416((uint)(fVar217 * fVar217 + fVar186 * fVar186 + fVar231 * fVar231));
  auVar130 = vshufps_avx(auVar130,auVar130,0);
  local_2c0._16_16_ = auVar130;
  local_2c0._0_16_ = auVar130;
  fVar217 = *(float *)(ray + k * 4 + 0x60);
  local_930 = ZEXT416((uint)fVar204);
  auVar130 = vshufps_avx(ZEXT416((uint)(fVar217 - fVar204)),ZEXT416((uint)(fVar217 - fVar204)),0);
  local_2e0._16_16_ = auVar130;
  local_2e0._0_16_ = auVar130;
  auVar130 = vpshufd_avx(ZEXT416(*(uint *)(local_910 + 2)),0);
  local_540._16_16_ = auVar130;
  local_540._0_16_ = auVar130;
  auVar130 = vpshufd_avx(ZEXT416(*(uint *)(local_910 + lVar7 * 4 + 6)),0);
  local_560._16_16_ = auVar130;
  local_560._0_16_ = auVar130;
  register0x00001210 = auVar98;
  _local_960 = auVar98;
  local_ccc = 1;
  uVar92 = 0;
  bVar94 = false;
  auVar110._8_4_ = 0x7fffffff;
  auVar110._0_8_ = 0x7fffffff7fffffff;
  auVar110._12_4_ = 0x7fffffff;
  auVar110._16_4_ = 0x7fffffff;
  auVar110._20_4_ = 0x7fffffff;
  auVar110._24_4_ = 0x7fffffff;
  auVar110._28_4_ = 0x7fffffff;
  local_520 = vandps_avx(local_2c0,auVar110);
  auVar130 = vsqrtss_avx(local_a60,local_a60);
  auVar9 = vsqrtss_avx(local_a60,local_a60);
  local_6f0 = ZEXT816(0x3f80000000000000);
  do {
    auVar224._8_4_ = 0x3f800000;
    auVar224._0_8_ = 0x3f8000003f800000;
    auVar224._12_4_ = 0x3f800000;
    auVar224._16_4_ = 0x3f800000;
    auVar224._20_4_ = 0x3f800000;
    iVar95 = (int)uVar92;
    auVar224._24_4_ = 0x3f800000;
    auVar224._28_4_ = 0x3f800000;
    auVar168 = vmovshdup_avx(local_6f0);
    auVar104 = vsubps_avx(auVar168,local_6f0);
    auVar168 = vshufps_avx(local_6f0,local_6f0,0);
    auVar164 = vshufps_avx(auVar104,auVar104,0);
    fVar128 = auVar164._0_4_;
    fVar151 = auVar164._4_4_;
    fVar152 = auVar164._8_4_;
    fVar153 = auVar164._12_4_;
    fVar154 = auVar168._0_4_;
    auVar200._0_4_ = fVar154 + fVar128 * 0.0;
    fVar183 = auVar168._4_4_;
    auVar200._4_4_ = fVar183 + fVar151 * 0.14285715;
    fVar184 = auVar168._8_4_;
    auVar200._8_4_ = fVar184 + fVar152 * 0.2857143;
    fVar185 = auVar168._12_4_;
    auVar200._12_4_ = fVar185 + fVar153 * 0.42857146;
    auVar200._16_4_ = fVar154 + fVar128 * 0.5714286;
    auVar200._20_4_ = fVar183 + fVar151 * 0.71428573;
    auVar200._24_4_ = fVar184 + fVar152 * 0.8571429;
    auVar200._28_4_ = fVar185 + fVar153;
    auVar109 = vsubps_avx(auVar224,auVar200);
    fVar186 = auVar109._0_4_;
    fVar231 = auVar109._4_4_;
    fVar204 = auVar109._8_4_;
    fVar232 = auVar109._12_4_;
    fVar205 = auVar109._16_4_;
    fVar233 = auVar109._20_4_;
    fVar206 = auVar109._24_4_;
    fVar259 = fVar186 * fVar186 * fVar186;
    fVar255 = fVar231 * fVar231 * fVar231;
    fVar260 = fVar204 * fVar204 * fVar204;
    fVar265 = fVar232 * fVar232 * fVar232;
    fVar269 = fVar205 * fVar205 * fVar205;
    fVar273 = fVar233 * fVar233 * fVar233;
    fVar277 = fVar206 * fVar206 * fVar206;
    fVar282 = auVar200._0_4_ * auVar200._0_4_ * auVar200._0_4_;
    fVar289 = auVar200._4_4_ * auVar200._4_4_ * auVar200._4_4_;
    fVar290 = auVar200._8_4_ * auVar200._8_4_ * auVar200._8_4_;
    fVar292 = auVar200._12_4_ * auVar200._12_4_ * auVar200._12_4_;
    fVar294 = auVar200._16_4_ * auVar200._16_4_ * auVar200._16_4_;
    fVar296 = auVar200._20_4_ * auVar200._20_4_ * auVar200._20_4_;
    fVar298 = auVar200._24_4_ * auVar200._24_4_ * auVar200._24_4_;
    fVar240 = auVar200._0_4_ * fVar186;
    fVar254 = auVar200._4_4_ * fVar231;
    fVar264 = auVar200._8_4_ * fVar204;
    fVar234 = auVar200._12_4_ * fVar232;
    fVar235 = auVar200._16_4_ * fVar205;
    fVar236 = auVar200._20_4_ * fVar233;
    fVar238 = auVar200._24_4_ * fVar206;
    fVar342 = auVar341._28_4_ + auVar352._28_4_;
    fVar328 = auVar288._28_4_ + 1.0 + fVar342;
    fVar337 = fVar342 + auVar253._28_4_ + auVar346._28_4_ + auVar333._28_4_;
    fVar342 = fVar259 * 0.16666667;
    fVar256 = fVar255 * 0.16666667;
    fVar261 = fVar260 * 0.16666667;
    fVar266 = fVar265 * 0.16666667;
    fVar270 = fVar269 * 0.16666667;
    fVar274 = fVar273 * 0.16666667;
    fVar278 = fVar277 * 0.16666667;
    fVar300 = (fVar282 + fVar259 * 4.0 + fVar186 * fVar240 * 12.0 + auVar200._0_4_ * fVar240 * 6.0)
              * 0.16666667;
    fVar310 = (fVar289 + fVar255 * 4.0 + fVar231 * fVar254 * 12.0 + auVar200._4_4_ * fVar254 * 6.0)
              * 0.16666667;
    fVar313 = (fVar290 + fVar260 * 4.0 + fVar204 * fVar264 * 12.0 + auVar200._8_4_ * fVar264 * 6.0)
              * 0.16666667;
    fVar316 = (fVar292 + fVar265 * 4.0 + fVar232 * fVar234 * 12.0 + auVar200._12_4_ * fVar234 * 6.0)
              * 0.16666667;
    fVar319 = (fVar294 + fVar269 * 4.0 + fVar205 * fVar235 * 12.0 + auVar200._16_4_ * fVar235 * 6.0)
              * 0.16666667;
    fVar322 = (fVar296 + fVar273 * 4.0 + fVar233 * fVar236 * 12.0 + auVar200._20_4_ * fVar236 * 6.0)
              * 0.16666667;
    fVar325 = (fVar298 + fVar277 * 4.0 + fVar206 * fVar238 * 12.0 + auVar200._24_4_ * fVar238 * 6.0)
              * 0.16666667;
    fVar259 = (fVar282 * 4.0 + fVar259 + auVar200._0_4_ * fVar240 * 12.0 + fVar186 * fVar240 * 6.0)
              * 0.16666667;
    fVar255 = (fVar289 * 4.0 + fVar255 + auVar200._4_4_ * fVar254 * 12.0 + fVar231 * fVar254 * 6.0)
              * 0.16666667;
    fVar260 = (fVar290 * 4.0 + fVar260 + auVar200._8_4_ * fVar264 * 12.0 + fVar204 * fVar264 * 6.0)
              * 0.16666667;
    fVar265 = (fVar292 * 4.0 + fVar265 + auVar200._12_4_ * fVar234 * 12.0 + fVar232 * fVar234 * 6.0)
              * 0.16666667;
    fVar269 = (fVar294 * 4.0 + fVar269 + auVar200._16_4_ * fVar235 * 12.0 + fVar205 * fVar235 * 6.0)
              * 0.16666667;
    fVar273 = (fVar296 * 4.0 + fVar273 + auVar200._20_4_ * fVar236 * 12.0 + fVar233 * fVar236 * 6.0)
              * 0.16666667;
    fVar277 = (fVar298 * 4.0 + fVar277 + auVar200._24_4_ * fVar238 * 12.0 + fVar206 * fVar238 * 6.0)
              * 0.16666667;
    fVar282 = fVar282 * 0.16666667;
    fVar289 = fVar289 * 0.16666667;
    fVar290 = fVar290 * 0.16666667;
    fVar292 = fVar292 * 0.16666667;
    fVar294 = fVar294 * 0.16666667;
    fVar296 = fVar296 * 0.16666667;
    fVar298 = fVar298 * 0.16666667;
    fVar347 = auVar346._28_4_ + 12.0;
    fVar338 = fVar337 + 12.166667;
    fVar301 = (float)local_1e0._0_4_ * fVar342 +
              fVar300 * (float)local_260._0_4_ +
              fVar282 * (float)local_480._0_4_ + fVar259 * (float)local_400._0_4_;
    fVar311 = (float)local_1e0._4_4_ * fVar256 +
              fVar310 * (float)local_260._4_4_ +
              fVar289 * (float)local_480._4_4_ + fVar255 * (float)local_400._4_4_;
    fVar314 = fStack_1d8 * fVar261 +
              fVar313 * fStack_258 + fVar290 * fStack_478 + fVar260 * fStack_3f8;
    fVar317 = fStack_1d4 * fVar266 +
              fVar316 * fStack_254 + fVar292 * fStack_474 + fVar265 * fStack_3f4;
    fVar320 = fStack_1d0 * fVar270 +
              fVar319 * fStack_250 + fVar294 * fStack_470 + fVar269 * fStack_3f0;
    fVar323 = fStack_1cc * fVar274 +
              fVar322 * fStack_24c + fVar296 * fStack_46c + fVar273 * fStack_3ec;
    fVar326 = fStack_1c8 * fVar278 +
              fVar325 * fStack_248 + fVar298 * fStack_468 + fVar277 * fStack_3e8;
    fVar329 = fVar328 + fVar338;
    fVar302 = (float)local_200._0_4_ * fVar342 +
              (float)local_280._0_4_ * fVar300 +
              fVar282 * (float)local_4a0._0_4_ + fVar259 * (float)local_420._0_4_;
    fVar312 = (float)local_200._4_4_ * fVar256 +
              (float)local_280._4_4_ * fVar310 +
              fVar289 * (float)local_4a0._4_4_ + fVar255 * (float)local_420._4_4_;
    fVar315 = fStack_1f8 * fVar261 +
              fStack_278 * fVar313 + fVar290 * fStack_498 + fVar260 * fStack_418;
    fVar318 = fStack_1f4 * fVar266 +
              fStack_274 * fVar316 + fVar292 * fStack_494 + fVar265 * fStack_414;
    fVar321 = fStack_1f0 * fVar270 +
              fStack_270 * fVar319 + fVar294 * fStack_490 + fVar269 * fStack_410;
    fVar324 = fStack_1ec * fVar274 +
              fStack_26c * fVar322 + fVar296 * fStack_48c + fVar273 * fStack_40c;
    fVar327 = fStack_1e8 * fVar278 +
              fStack_268 * fVar325 + fVar298 * fStack_488 + fVar277 * fStack_408;
    fVar330 = fVar329 + fVar347 + 12.166667;
    local_9a0 = (float)local_220._0_4_ * fVar342 +
                (float)local_2a0._0_4_ * fVar300 +
                fVar282 * (float)local_4c0._0_4_ + fVar259 * (float)local_440._0_4_;
    fStack_99c = (float)local_220._4_4_ * fVar256 +
                 (float)local_2a0._4_4_ * fVar310 +
                 fVar289 * (float)local_4c0._4_4_ + fVar255 * (float)local_440._4_4_;
    fStack_998 = fStack_218 * fVar261 +
                 fStack_298 * fVar313 + fVar290 * fStack_4b8 + fVar260 * fStack_438;
    fStack_994 = fStack_214 * fVar266 +
                 fStack_294 * fVar316 + fVar292 * fStack_4b4 + fVar265 * fStack_434;
    fStack_990 = fStack_210 * fVar270 +
                 fStack_290 * fVar319 + fVar294 * fStack_4b0 + fVar269 * fStack_430;
    fStack_98c = fStack_20c * fVar274 +
                 fStack_28c * fVar322 + fVar296 * fStack_4ac + fVar273 * fStack_42c;
    fStack_988 = fStack_208 * fVar278 +
                 fStack_288 * fVar325 + fVar298 * fStack_4a8 + fVar277 * fStack_428;
    fStack_984 = fVar330 + fVar347 + auVar352._28_4_ + 12.0;
    local_b40._0_4_ =
         (float)local_240._0_4_ * fVar342 +
         fVar300 * (float)local_3e0._0_4_ +
         fVar259 * (float)local_460._0_4_ + local_4e0._0_4_ * fVar282;
    local_b40._4_4_ =
         (float)local_240._4_4_ * fVar256 +
         fVar310 * (float)local_3e0._4_4_ +
         fVar255 * (float)local_460._4_4_ + local_4e0._4_4_ * fVar289;
    fStack_b38 = fStack_238 * fVar261 +
                 fVar313 * fStack_3d8 + fVar260 * fStack_458 + local_4e0._8_4_ * fVar290;
    fStack_b34 = fStack_234 * fVar266 +
                 fVar316 * fStack_3d4 + fVar265 * fStack_454 + local_4e0._12_4_ * fVar292;
    fStack_b30 = fStack_230 * fVar270 +
                 fVar319 * fStack_3d0 + fVar269 * fStack_450 + local_4e0._16_4_ * fVar294;
    fStack_b2c = fStack_22c * fVar274 +
                 fVar322 * fStack_3cc + fVar273 * fStack_44c + local_4e0._20_4_ * fVar296;
    fStack_b28 = fStack_228 * fVar278 +
                 fVar325 * fStack_3c8 + fVar277 * fStack_448 + local_4e0._24_4_ * fVar298;
    fStack_b24 = auVar253._28_4_ + fVar328 + fVar337 + auVar288._28_4_;
    auVar29._4_4_ = auVar200._4_4_ * -auVar200._4_4_;
    auVar29._0_4_ = auVar200._0_4_ * -auVar200._0_4_;
    auVar29._8_4_ = auVar200._8_4_ * -auVar200._8_4_;
    auVar29._12_4_ = auVar200._12_4_ * -auVar200._12_4_;
    auVar29._16_4_ = auVar200._16_4_ * -auVar200._16_4_;
    auVar29._20_4_ = auVar200._20_4_ * -auVar200._20_4_;
    auVar29._24_4_ = auVar200._24_4_ * -auVar200._24_4_;
    auVar29._28_4_ = auVar200._28_4_;
    auVar26._4_4_ = fVar254 * 4.0;
    auVar26._0_4_ = fVar240 * 4.0;
    auVar26._8_4_ = fVar264 * 4.0;
    auVar26._12_4_ = fVar234 * 4.0;
    auVar26._16_4_ = fVar235 * 4.0;
    auVar26._20_4_ = fVar236 * 4.0;
    auVar26._24_4_ = fVar238 * 4.0;
    auVar26._28_4_ = 0x3f800000;
    auVar109 = vsubps_avx(auVar29,auVar26);
    fVar274 = fVar186 * -fVar186 * 0.5;
    fVar277 = fVar231 * -fVar231 * 0.5;
    fVar278 = fVar204 * -fVar204 * 0.5;
    fVar282 = fVar232 * -fVar232 * 0.5;
    fVar289 = fVar205 * -fVar205 * 0.5;
    fVar290 = fVar233 * -fVar233 * 0.5;
    fVar292 = fVar206 * -fVar206 * 0.5;
    fVar255 = auVar109._0_4_ * 0.5;
    fVar260 = auVar109._4_4_ * 0.5;
    fVar265 = auVar109._8_4_ * 0.5;
    fVar266 = auVar109._12_4_ * 0.5;
    fVar269 = auVar109._16_4_ * 0.5;
    fVar270 = auVar109._20_4_ * 0.5;
    fVar273 = auVar109._24_4_ * 0.5;
    fVar240 = (fVar186 * fVar186 + fVar240 * 4.0) * 0.5;
    fVar259 = (fVar231 * fVar231 + fVar254 * 4.0) * 0.5;
    fVar342 = (fVar204 * fVar204 + fVar264 * 4.0) * 0.5;
    fVar234 = (fVar232 * fVar232 + fVar234 * 4.0) * 0.5;
    fVar235 = (fVar205 * fVar205 + fVar235 * 4.0) * 0.5;
    fVar236 = (fVar233 * fVar233 + fVar236 * 4.0) * 0.5;
    fVar261 = (fVar206 * fVar206 + fVar238 * 4.0) * 0.5;
    fVar186 = auVar200._0_4_ * auVar200._0_4_ * 0.5;
    fVar231 = auVar200._4_4_ * auVar200._4_4_ * 0.5;
    fVar204 = auVar200._8_4_ * auVar200._8_4_ * 0.5;
    fVar232 = auVar200._12_4_ * auVar200._12_4_ * 0.5;
    fVar205 = auVar200._16_4_ * auVar200._16_4_ * 0.5;
    fVar233 = auVar200._20_4_ * auVar200._20_4_ * 0.5;
    fVar264 = auVar200._24_4_ * auVar200._24_4_ * 0.5;
    fVar281 = fStack_984 + fVar338 + fVar338 + 4.0;
    auVar168 = vpermilps_avx(ZEXT416((uint)(auVar104._0_4_ * 0.04761905)),0);
    fVar206 = auVar168._0_4_;
    fVar241 = fVar206 * ((float)local_1e0._0_4_ * fVar274 +
                        (float)local_260._0_4_ * fVar255 +
                        fVar240 * (float)local_400._0_4_ + fVar186 * (float)local_480._0_4_);
    fVar254 = auVar168._4_4_;
    fVar257 = fVar254 * ((float)local_1e0._4_4_ * fVar277 +
                        (float)local_260._4_4_ * fVar260 +
                        fVar259 * (float)local_400._4_4_ + fVar231 * (float)local_480._4_4_);
    auVar37._4_4_ = fVar257;
    auVar37._0_4_ = fVar241;
    fVar238 = auVar168._8_4_;
    fVar262 = fVar238 * (fStack_1d8 * fVar278 +
                        fStack_258 * fVar265 + fVar342 * fStack_3f8 + fVar204 * fStack_478);
    auVar37._8_4_ = fVar262;
    fVar256 = auVar168._12_4_;
    fVar267 = fVar256 * (fStack_1d4 * fVar282 +
                        fStack_254 * fVar266 + fVar234 * fStack_3f4 + fVar232 * fStack_474);
    auVar37._12_4_ = fVar267;
    fVar271 = fVar206 * (fStack_1d0 * fVar289 +
                        fStack_250 * fVar269 + fVar235 * fStack_3f0 + fVar205 * fStack_470);
    auVar37._16_4_ = fVar271;
    fVar275 = fVar254 * (fStack_1cc * fVar290 +
                        fStack_24c * fVar270 + fVar236 * fStack_3ec + fVar233 * fStack_46c);
    auVar37._20_4_ = fVar275;
    fVar279 = fVar238 * (fStack_1c8 * fVar292 +
                        fStack_248 * fVar273 + fVar261 * fStack_3e8 + fVar264 * fStack_468);
    auVar37._24_4_ = fVar279;
    auVar37._28_4_ = fVar281;
    fVar348 = fVar206 * ((float)local_200._0_4_ * fVar274 +
                        (float)local_280._0_4_ * fVar255 +
                        fVar240 * (float)local_420._0_4_ + fVar186 * (float)local_4a0._0_4_);
    fVar353 = fVar254 * ((float)local_200._4_4_ * fVar277 +
                        (float)local_280._4_4_ * fVar260 +
                        fVar259 * (float)local_420._4_4_ + fVar231 * (float)local_4a0._4_4_);
    auVar33._4_4_ = fVar353;
    auVar33._0_4_ = fVar348;
    fVar354 = fVar238 * (fStack_1f8 * fVar278 +
                        fStack_278 * fVar265 + fVar342 * fStack_418 + fVar204 * fStack_498);
    auVar33._8_4_ = fVar354;
    fVar355 = fVar256 * (fStack_1f4 * fVar282 +
                        fStack_274 * fVar266 + fVar234 * fStack_414 + fVar232 * fStack_494);
    auVar33._12_4_ = fVar355;
    fVar356 = fVar206 * (fStack_1f0 * fVar289 +
                        fStack_270 * fVar269 + fVar235 * fStack_410 + fVar205 * fStack_490);
    auVar33._16_4_ = fVar356;
    fVar357 = fVar254 * (fStack_1ec * fVar290 +
                        fStack_26c * fVar270 + fVar236 * fStack_40c + fVar233 * fStack_48c);
    auVar33._20_4_ = fVar357;
    fVar358 = fVar238 * (fStack_1e8 * fVar292 +
                        fStack_268 * fVar273 + fVar261 * fStack_408 + fVar264 * fStack_488);
    auVar33._24_4_ = fVar358;
    auVar33._28_4_ = uStack_1c4;
    fVar359 = fVar206 * ((float)local_220._0_4_ * fVar274 +
                        fVar186 * (float)local_4c0._0_4_ + fVar240 * (float)local_440._0_4_ +
                        (float)local_2a0._0_4_ * fVar255);
    fVar370 = fVar254 * ((float)local_220._4_4_ * fVar277 +
                        fVar231 * (float)local_4c0._4_4_ + fVar259 * (float)local_440._4_4_ +
                        (float)local_2a0._4_4_ * fVar260);
    auVar366._4_4_ = fVar370;
    auVar366._0_4_ = fVar359;
    fVar372 = fVar238 * (fStack_218 * fVar278 +
                        fVar204 * fStack_4b8 + fVar342 * fStack_438 + fStack_298 * fVar265);
    auVar366._8_4_ = fVar372;
    fVar374 = fVar256 * (fStack_214 * fVar282 +
                        fVar232 * fStack_4b4 + fVar234 * fStack_434 + fStack_294 * fVar266);
    auVar366._12_4_ = fVar374;
    fVar376 = fVar206 * (fStack_210 * fVar289 +
                        fVar205 * fStack_4b0 + fVar235 * fStack_430 + fStack_290 * fVar269);
    auVar366._16_4_ = fVar376;
    fVar378 = fVar254 * (fStack_20c * fVar290 +
                        fVar233 * fStack_4ac + fVar236 * fStack_42c + fStack_28c * fVar270);
    auVar366._20_4_ = fVar378;
    fVar380 = fVar238 * (fStack_208 * fVar292 +
                        fVar264 * fStack_4a8 + fVar261 * fStack_428 + fStack_288 * fVar273);
    auVar366._24_4_ = fVar380;
    auVar366._28_4_ = uStack_1e4;
    fVar240 = fVar206 * ((float)local_240._0_4_ * fVar274 +
                        fVar255 * (float)local_3e0._0_4_ +
                        fVar186 * local_4e0._0_4_ + fVar240 * (float)local_460._0_4_);
    fVar259 = fVar254 * ((float)local_240._4_4_ * fVar277 +
                        fVar260 * (float)local_3e0._4_4_ +
                        fVar231 * local_4e0._4_4_ + fVar259 * (float)local_460._4_4_);
    auVar141._4_4_ = fVar259;
    auVar141._0_4_ = fVar240;
    fVar255 = fVar238 * (fStack_238 * fVar278 +
                        fVar265 * fStack_3d8 + fVar204 * local_4e0._8_4_ + fVar342 * fStack_458);
    auVar141._8_4_ = fVar255;
    fVar260 = fVar256 * (fStack_234 * fVar282 +
                        fVar266 * fStack_3d4 + fVar232 * local_4e0._12_4_ + fVar234 * fStack_454);
    auVar141._12_4_ = fVar260;
    fVar206 = fVar206 * (fStack_230 * fVar289 +
                        fVar269 * fStack_3d0 + fVar205 * local_4e0._16_4_ + fVar235 * fStack_450);
    auVar141._16_4_ = fVar206;
    fVar254 = fVar254 * (fStack_22c * fVar290 +
                        fVar270 * fStack_3cc + fVar233 * local_4e0._20_4_ + fVar236 * fStack_44c);
    auVar141._20_4_ = fVar254;
    fVar238 = fVar238 * (fStack_228 * fVar292 +
                        fVar273 * fStack_3c8 + fVar264 * local_4e0._24_4_ + fVar261 * fStack_448);
    auVar141._24_4_ = fVar238;
    auVar141._28_4_ = fVar256;
    auVar27._4_4_ = fVar312;
    auVar27._0_4_ = fVar302;
    auVar27._8_4_ = fVar315;
    auVar27._12_4_ = fVar318;
    auVar27._16_4_ = fVar321;
    auVar27._20_4_ = fVar324;
    auVar27._24_4_ = fVar327;
    auVar27._28_4_ = fVar330;
    auVar109 = vperm2f128_avx(auVar27,auVar27,1);
    auVar109 = vshufps_avx(auVar109,auVar27,0x30);
    local_9c0 = vshufps_avx(auVar27,auVar109,0x29);
    auVar83._4_4_ = fStack_99c;
    auVar83._0_4_ = local_9a0;
    auVar83._8_4_ = fStack_998;
    auVar83._12_4_ = fStack_994;
    auVar83._16_4_ = fStack_990;
    auVar83._20_4_ = fStack_98c;
    auVar83._24_4_ = fStack_988;
    auVar83._28_4_ = fStack_984;
    auVar109 = vperm2f128_avx(auVar83,auVar83,1);
    auVar109 = vshufps_avx(auVar109,auVar83,0x30);
    auVar26 = vshufps_avx(auVar83,auVar109,0x29);
    auVar110 = vsubps_avx(_local_b40,auVar141);
    auVar109 = vperm2f128_avx(auVar110,auVar110,1);
    auVar109 = vshufps_avx(auVar109,auVar110,0x30);
    auVar141 = vshufps_avx(auVar110,auVar109,0x29);
    auVar27 = vsubps_avx(local_9c0,auVar27);
    auVar28 = vsubps_avx(auVar26,auVar83);
    fVar231 = auVar27._0_4_;
    fVar264 = auVar27._4_4_;
    auVar367._4_4_ = fVar370 * fVar264;
    auVar367._0_4_ = fVar359 * fVar231;
    fVar261 = auVar27._8_4_;
    auVar367._8_4_ = fVar372 * fVar261;
    fVar282 = auVar27._12_4_;
    auVar367._12_4_ = fVar374 * fVar282;
    fVar313 = auVar27._16_4_;
    auVar367._16_4_ = fVar376 * fVar313;
    fVar10 = auVar27._20_4_;
    auVar367._20_4_ = fVar378 * fVar10;
    fVar18 = auVar27._24_4_;
    auVar367._24_4_ = fVar380 * fVar18;
    auVar367._28_4_ = auVar110._28_4_;
    fVar204 = auVar28._0_4_;
    fVar342 = auVar28._4_4_;
    auVar172._4_4_ = fVar353 * fVar342;
    auVar172._0_4_ = fVar348 * fVar204;
    fVar265 = auVar28._8_4_;
    auVar172._8_4_ = fVar354 * fVar265;
    fVar289 = auVar28._12_4_;
    auVar172._12_4_ = fVar355 * fVar289;
    fVar316 = auVar28._16_4_;
    auVar172._16_4_ = fVar356 * fVar316;
    fVar11 = auVar28._20_4_;
    auVar172._20_4_ = fVar357 * fVar11;
    fVar19 = auVar28._24_4_;
    auVar172._24_4_ = fVar358 * fVar19;
    auVar172._28_4_ = auVar109._28_4_;
    auVar29 = vsubps_avx(auVar172,auVar367);
    auVar30._4_4_ = fVar311;
    auVar30._0_4_ = fVar301;
    auVar30._8_4_ = fVar314;
    auVar30._12_4_ = fVar317;
    auVar30._16_4_ = fVar320;
    auVar30._20_4_ = fVar323;
    auVar30._24_4_ = fVar326;
    auVar30._28_4_ = fVar329;
    auVar109 = vperm2f128_avx(auVar30,auVar30,1);
    auVar109 = vshufps_avx(auVar109,auVar30,0x30);
    auVar367 = vshufps_avx(auVar30,auVar109,0x29);
    auVar30 = vsubps_avx(auVar367,auVar30);
    auVar31._4_4_ = fVar342 * fVar257;
    auVar31._0_4_ = fVar204 * fVar241;
    auVar31._8_4_ = fVar265 * fVar262;
    auVar31._12_4_ = fVar289 * fVar267;
    auVar31._16_4_ = fVar316 * fVar271;
    auVar31._20_4_ = fVar11 * fVar275;
    auVar31._24_4_ = fVar19 * fVar279;
    auVar31._28_4_ = auVar367._28_4_;
    fVar232 = auVar30._0_4_;
    fVar234 = auVar30._4_4_;
    auVar32._4_4_ = fVar370 * fVar234;
    auVar32._0_4_ = fVar359 * fVar232;
    fVar266 = auVar30._8_4_;
    auVar32._8_4_ = fVar372 * fVar266;
    fVar290 = auVar30._12_4_;
    auVar32._12_4_ = fVar374 * fVar290;
    fVar319 = auVar30._16_4_;
    auVar32._16_4_ = fVar376 * fVar319;
    fVar12 = auVar30._20_4_;
    auVar32._20_4_ = fVar378 * fVar12;
    fVar20 = auVar30._24_4_;
    auVar32._24_4_ = fVar380 * fVar20;
    auVar32._28_4_ = fVar329;
    auVar172 = vsubps_avx(auVar32,auVar31);
    auVar34._4_4_ = fVar353 * fVar234;
    auVar34._0_4_ = fVar348 * fVar232;
    auVar34._8_4_ = fVar354 * fVar266;
    auVar34._12_4_ = fVar355 * fVar290;
    auVar34._16_4_ = fVar356 * fVar319;
    auVar34._20_4_ = fVar357 * fVar12;
    auVar34._24_4_ = fVar358 * fVar20;
    auVar34._28_4_ = fVar329;
    auVar351._4_4_ = fVar264 * fVar257;
    auVar351._0_4_ = fVar231 * fVar241;
    auVar351._8_4_ = fVar261 * fVar262;
    auVar351._12_4_ = fVar282 * fVar267;
    auVar351._16_4_ = fVar313 * fVar271;
    auVar351._20_4_ = fVar10 * fVar275;
    auVar351._24_4_ = fVar18 * fVar279;
    auVar351._28_4_ = uStack_204;
    auVar31 = vsubps_avx(auVar351,auVar34);
    fVar186 = auVar31._28_4_;
    auVar140._0_4_ = fVar232 * fVar232 + fVar231 * fVar231 + fVar204 * fVar204;
    auVar140._4_4_ = fVar234 * fVar234 + fVar264 * fVar264 + fVar342 * fVar342;
    auVar140._8_4_ = fVar266 * fVar266 + fVar261 * fVar261 + fVar265 * fVar265;
    auVar140._12_4_ = fVar290 * fVar290 + fVar282 * fVar282 + fVar289 * fVar289;
    auVar140._16_4_ = fVar319 * fVar319 + fVar313 * fVar313 + fVar316 * fVar316;
    auVar140._20_4_ = fVar12 * fVar12 + fVar10 * fVar10 + fVar11 * fVar11;
    auVar140._24_4_ = fVar20 * fVar20 + fVar18 * fVar18 + fVar19 * fVar19;
    auVar140._28_4_ = fVar186 + fVar186 + auVar29._28_4_;
    auVar109 = vrcpps_avx(auVar140);
    fVar273 = auVar109._0_4_;
    fVar274 = auVar109._4_4_;
    auVar35._4_4_ = fVar274 * auVar140._4_4_;
    auVar35._0_4_ = fVar273 * auVar140._0_4_;
    fVar277 = auVar109._8_4_;
    auVar35._8_4_ = fVar277 * auVar140._8_4_;
    fVar278 = auVar109._12_4_;
    auVar35._12_4_ = fVar278 * auVar140._12_4_;
    fVar296 = auVar109._16_4_;
    auVar35._16_4_ = fVar296 * auVar140._16_4_;
    fVar298 = auVar109._20_4_;
    auVar35._20_4_ = fVar298 * auVar140._20_4_;
    fVar300 = auVar109._24_4_;
    auVar35._24_4_ = fVar300 * auVar140._24_4_;
    auVar35._28_4_ = uStack_204;
    auVar214._8_4_ = 0x3f800000;
    auVar214._0_8_ = 0x3f8000003f800000;
    auVar214._12_4_ = 0x3f800000;
    auVar214._16_4_ = 0x3f800000;
    auVar214._20_4_ = 0x3f800000;
    auVar214._24_4_ = 0x3f800000;
    auVar214._28_4_ = 0x3f800000;
    auVar32 = vsubps_avx(auVar214,auVar35);
    fVar273 = auVar32._0_4_ * fVar273 + fVar273;
    fVar274 = auVar32._4_4_ * fVar274 + fVar274;
    fVar277 = auVar32._8_4_ * fVar277 + fVar277;
    fVar278 = auVar32._12_4_ * fVar278 + fVar278;
    fVar296 = auVar32._16_4_ * fVar296 + fVar296;
    fVar298 = auVar32._20_4_ * fVar298 + fVar298;
    fVar300 = auVar32._24_4_ * fVar300 + fVar300;
    auVar110 = vperm2f128_avx(auVar33,auVar33,1);
    auVar110 = vshufps_avx(auVar110,auVar33,0x30);
    local_a80 = vshufps_avx(auVar33,auVar110,0x29);
    auVar110 = vperm2f128_avx(auVar366,auVar366,1);
    auVar110 = vshufps_avx(auVar110,auVar366,0x30);
    local_880 = vshufps_avx(auVar366,auVar110,0x29);
    fVar360 = local_880._0_4_;
    fVar371 = local_880._4_4_;
    auVar36._4_4_ = fVar371 * fVar264;
    auVar36._0_4_ = fVar360 * fVar231;
    fVar373 = local_880._8_4_;
    auVar36._8_4_ = fVar373 * fVar261;
    fVar375 = local_880._12_4_;
    auVar36._12_4_ = fVar375 * fVar282;
    fVar377 = local_880._16_4_;
    auVar36._16_4_ = fVar377 * fVar313;
    fVar379 = local_880._20_4_;
    auVar36._20_4_ = fVar379 * fVar10;
    fVar381 = local_880._24_4_;
    auVar36._24_4_ = fVar381 * fVar18;
    auVar36._28_4_ = auVar110._28_4_;
    fVar205 = local_a80._0_4_;
    fVar235 = local_a80._4_4_;
    auVar38._4_4_ = fVar342 * fVar235;
    auVar38._0_4_ = fVar204 * fVar205;
    fVar269 = local_a80._8_4_;
    auVar38._8_4_ = fVar265 * fVar269;
    fVar292 = local_a80._12_4_;
    auVar38._12_4_ = fVar289 * fVar292;
    fVar322 = local_a80._16_4_;
    auVar38._16_4_ = fVar316 * fVar322;
    fVar13 = local_a80._20_4_;
    auVar38._20_4_ = fVar11 * fVar13;
    fVar21 = local_a80._24_4_;
    auVar38._24_4_ = fVar19 * fVar21;
    auVar38._28_4_ = uStack_1c4;
    auVar33 = vsubps_avx(auVar38,auVar36);
    auVar110 = vperm2f128_avx(auVar37,auVar37,1);
    auVar110 = vshufps_avx(auVar110,auVar37,0x30);
    local_860 = vshufps_avx(auVar37,auVar110,0x29);
    fVar233 = local_860._0_4_;
    fVar236 = local_860._4_4_;
    auVar39._4_4_ = fVar342 * fVar236;
    auVar39._0_4_ = fVar204 * fVar233;
    fVar270 = local_860._8_4_;
    auVar39._8_4_ = fVar265 * fVar270;
    fVar294 = local_860._12_4_;
    auVar39._12_4_ = fVar289 * fVar294;
    fVar325 = local_860._16_4_;
    auVar39._16_4_ = fVar316 * fVar325;
    fVar14 = local_860._20_4_;
    auVar39._20_4_ = fVar11 * fVar14;
    fVar22 = local_860._24_4_;
    auVar39._24_4_ = fVar19 * fVar22;
    auVar39._28_4_ = auVar110._28_4_;
    auVar40._4_4_ = fVar371 * fVar234;
    auVar40._0_4_ = fVar360 * fVar232;
    auVar40._8_4_ = fVar373 * fVar266;
    auVar40._12_4_ = fVar375 * fVar290;
    auVar40._16_4_ = fVar377 * fVar319;
    auVar40._20_4_ = fVar379 * fVar12;
    uVar91 = local_880._28_4_;
    auVar40._24_4_ = fVar381 * fVar20;
    auVar40._28_4_ = uVar91;
    auVar110 = vsubps_avx(auVar40,auVar39);
    auVar41._4_4_ = fVar234 * fVar235;
    auVar41._0_4_ = fVar232 * fVar205;
    auVar41._8_4_ = fVar266 * fVar269;
    auVar41._12_4_ = fVar290 * fVar292;
    auVar41._16_4_ = fVar319 * fVar322;
    auVar41._20_4_ = fVar12 * fVar13;
    auVar41._24_4_ = fVar20 * fVar21;
    auVar41._28_4_ = uVar91;
    auVar42._4_4_ = fVar264 * fVar236;
    auVar42._0_4_ = fVar231 * fVar233;
    auVar42._8_4_ = fVar261 * fVar270;
    auVar42._12_4_ = fVar282 * fVar294;
    auVar42._16_4_ = fVar313 * fVar325;
    auVar42._20_4_ = fVar10 * fVar14;
    auVar42._24_4_ = fVar18 * fVar22;
    auVar42._28_4_ = fVar330;
    auVar366 = vsubps_avx(auVar42,auVar41);
    auVar43._4_4_ =
         (auVar29._4_4_ * auVar29._4_4_ +
         auVar172._4_4_ * auVar172._4_4_ + auVar31._4_4_ * auVar31._4_4_) * fVar274;
    auVar43._0_4_ =
         (auVar29._0_4_ * auVar29._0_4_ +
         auVar172._0_4_ * auVar172._0_4_ + auVar31._0_4_ * auVar31._0_4_) * fVar273;
    auVar43._8_4_ =
         (auVar29._8_4_ * auVar29._8_4_ +
         auVar172._8_4_ * auVar172._8_4_ + auVar31._8_4_ * auVar31._8_4_) * fVar277;
    auVar43._12_4_ =
         (auVar29._12_4_ * auVar29._12_4_ +
         auVar172._12_4_ * auVar172._12_4_ + auVar31._12_4_ * auVar31._12_4_) * fVar278;
    auVar43._16_4_ =
         (auVar29._16_4_ * auVar29._16_4_ +
         auVar172._16_4_ * auVar172._16_4_ + auVar31._16_4_ * auVar31._16_4_) * fVar296;
    auVar43._20_4_ =
         (auVar29._20_4_ * auVar29._20_4_ +
         auVar172._20_4_ * auVar172._20_4_ + auVar31._20_4_ * auVar31._20_4_) * fVar298;
    auVar43._24_4_ =
         (auVar29._24_4_ * auVar29._24_4_ +
         auVar172._24_4_ * auVar172._24_4_ + auVar31._24_4_ * auVar31._24_4_) * fVar300;
    auVar43._28_4_ = auVar29._28_4_ + auVar172._28_4_ + fVar186;
    auVar44._4_4_ =
         (auVar33._4_4_ * auVar33._4_4_ +
         auVar110._4_4_ * auVar110._4_4_ + auVar366._4_4_ * auVar366._4_4_) * fVar274;
    auVar44._0_4_ =
         (auVar33._0_4_ * auVar33._0_4_ +
         auVar110._0_4_ * auVar110._0_4_ + auVar366._0_4_ * auVar366._0_4_) * fVar273;
    auVar44._8_4_ =
         (auVar33._8_4_ * auVar33._8_4_ +
         auVar110._8_4_ * auVar110._8_4_ + auVar366._8_4_ * auVar366._8_4_) * fVar277;
    auVar44._12_4_ =
         (auVar33._12_4_ * auVar33._12_4_ +
         auVar110._12_4_ * auVar110._12_4_ + auVar366._12_4_ * auVar366._12_4_) * fVar278;
    auVar44._16_4_ =
         (auVar33._16_4_ * auVar33._16_4_ +
         auVar110._16_4_ * auVar110._16_4_ + auVar366._16_4_ * auVar366._16_4_) * fVar296;
    auVar44._20_4_ =
         (auVar33._20_4_ * auVar33._20_4_ +
         auVar110._20_4_ * auVar110._20_4_ + auVar366._20_4_ * auVar366._20_4_) * fVar298;
    auVar44._24_4_ =
         (auVar33._24_4_ * auVar33._24_4_ +
         auVar110._24_4_ * auVar110._24_4_ + auVar366._24_4_ * auVar366._24_4_) * fVar300;
    auVar44._28_4_ = auVar32._28_4_ + auVar109._28_4_;
    auVar109 = vmaxps_avx(auVar43,auVar44);
    auVar110 = vperm2f128_avx(_local_b40,_local_b40,1);
    auVar110 = vshufps_avx(auVar110,_local_b40,0x30);
    auVar172 = vshufps_avx(_local_b40,auVar110,0x29);
    auVar111._0_4_ = (float)local_b40._0_4_ + fVar240;
    auVar111._4_4_ = (float)local_b40._4_4_ + fVar259;
    auVar111._8_4_ = fStack_b38 + fVar255;
    auVar111._12_4_ = fStack_b34 + fVar260;
    auVar111._16_4_ = fStack_b30 + fVar206;
    auVar111._20_4_ = fStack_b2c + fVar254;
    auVar111._24_4_ = fStack_b28 + fVar238;
    auVar111._28_4_ = fStack_b24 + fVar256;
    auVar110 = vmaxps_avx(_local_b40,auVar111);
    auVar29 = vmaxps_avx(auVar141,auVar172);
    auVar110 = vmaxps_avx(auVar110,auVar29);
    auVar29 = vrsqrtps_avx(auVar140);
    fVar186 = auVar29._0_4_;
    fVar206 = auVar29._4_4_;
    fVar240 = auVar29._8_4_;
    fVar254 = auVar29._12_4_;
    fVar259 = auVar29._16_4_;
    fVar238 = auVar29._20_4_;
    fVar255 = auVar29._24_4_;
    auVar45._4_4_ = fVar206 * fVar206 * fVar206 * auVar140._4_4_ * 0.5;
    auVar45._0_4_ = fVar186 * fVar186 * fVar186 * auVar140._0_4_ * 0.5;
    auVar45._8_4_ = fVar240 * fVar240 * fVar240 * auVar140._8_4_ * 0.5;
    auVar45._12_4_ = fVar254 * fVar254 * fVar254 * auVar140._12_4_ * 0.5;
    auVar45._16_4_ = fVar259 * fVar259 * fVar259 * auVar140._16_4_ * 0.5;
    auVar45._20_4_ = fVar238 * fVar238 * fVar238 * auVar140._20_4_ * 0.5;
    auVar45._24_4_ = fVar255 * fVar255 * fVar255 * auVar140._24_4_ * 0.5;
    auVar45._28_4_ = auVar140._28_4_;
    auVar46._4_4_ = fVar206 * 1.5;
    auVar46._0_4_ = fVar186 * 1.5;
    auVar46._8_4_ = fVar240 * 1.5;
    auVar46._12_4_ = fVar254 * 1.5;
    auVar46._16_4_ = fVar259 * 1.5;
    auVar46._20_4_ = fVar238 * 1.5;
    auVar46._24_4_ = fVar255 * 1.5;
    auVar46._28_4_ = auVar29._28_4_;
    local_580 = vsubps_avx(auVar46,auVar45);
    auVar77 = ZEXT412(0);
    auVar352 = ZEXT1264(auVar77) << 0x20;
    auVar79._4_4_ = fVar312;
    auVar79._0_4_ = fVar302;
    auVar79._8_4_ = fVar315;
    auVar79._12_4_ = fVar318;
    auVar79._16_4_ = fVar321;
    auVar79._20_4_ = fVar324;
    auVar79._24_4_ = fVar327;
    auVar79._28_4_ = fVar330;
    auVar31 = vsubps_avx(ZEXT1232(auVar77) << 0x20,auVar79);
    auVar32 = vsubps_avx(ZEXT1232(auVar77) << 0x20,auVar83);
    fVar206 = auVar32._0_4_;
    fVar238 = auVar32._4_4_;
    fVar273 = auVar32._8_4_;
    fVar296 = auVar32._12_4_;
    fVar328 = auVar32._16_4_;
    fVar15 = auVar32._20_4_;
    fVar23 = auVar32._24_4_;
    fVar240 = auVar31._0_4_;
    fVar255 = auVar31._4_4_;
    fVar274 = auVar31._8_4_;
    fVar298 = auVar31._12_4_;
    fVar337 = auVar31._16_4_;
    fVar16 = auVar31._20_4_;
    fVar24 = auVar31._24_4_;
    auVar80._4_4_ = fVar311;
    auVar80._0_4_ = fVar301;
    auVar80._8_4_ = fVar314;
    auVar80._12_4_ = fVar317;
    auVar80._16_4_ = fVar320;
    auVar80._20_4_ = fVar323;
    auVar80._24_4_ = fVar326;
    auVar80._28_4_ = fVar329;
    auVar351 = ZEXT1232(auVar77) << 0x20;
    auVar33 = vsubps_avx(auVar351,auVar80);
    fVar254 = auVar33._0_4_;
    fVar256 = auVar33._4_4_;
    fVar277 = auVar33._8_4_;
    fVar300 = auVar33._12_4_;
    fVar338 = auVar33._16_4_;
    fVar17 = auVar33._20_4_;
    fVar25 = auVar33._24_4_;
    auVar363._0_4_ =
         (float)local_ac0._0_4_ * fVar254 +
         (float)local_a00._0_4_ * fVar240 + (float)local_8a0._0_4_ * fVar206;
    auVar363._4_4_ =
         (float)local_ac0._4_4_ * fVar256 +
         (float)local_a00._4_4_ * fVar255 + (float)local_8a0._4_4_ * fVar238;
    auVar363._8_4_ = fStack_ab8 * fVar277 + fStack_9f8 * fVar274 + fStack_898 * fVar273;
    auVar363._12_4_ = fStack_ab4 * fVar300 + fStack_9f4 * fVar298 + fStack_894 * fVar296;
    auVar363._16_4_ = fStack_ab0 * fVar338 + fStack_9f0 * fVar337 + fStack_890 * fVar328;
    auVar363._20_4_ = fStack_aac * fVar17 + fStack_9ec * fVar16 + fStack_88c * fVar15;
    auVar363._24_4_ = fStack_aa8 * fVar25 + fStack_9e8 * fVar24 + fStack_888 * fVar23;
    auVar363._28_4_ = fVar330 + auVar366._28_4_ + auVar29._28_4_;
    auVar382._0_4_ = fVar254 * fVar254 + fVar240 * fVar240 + fVar206 * fVar206;
    auVar382._4_4_ = fVar256 * fVar256 + fVar255 * fVar255 + fVar238 * fVar238;
    auVar382._8_4_ = fVar277 * fVar277 + fVar274 * fVar274 + fVar273 * fVar273;
    auVar382._12_4_ = fVar300 * fVar300 + fVar298 * fVar298 + fVar296 * fVar296;
    auVar382._16_4_ = fVar338 * fVar338 + fVar337 * fVar337 + fVar328 * fVar328;
    auVar382._20_4_ = fVar17 * fVar17 + fVar16 * fVar16 + fVar15 * fVar15;
    auVar382._24_4_ = fVar25 * fVar25 + fVar24 * fVar24 + fVar23 * fVar23;
    auVar382._28_4_ = fStack_b24 + fStack_b24 + fVar330;
    fVar259 = local_580._0_4_;
    fVar260 = local_580._4_4_;
    fVar278 = local_580._8_4_;
    fVar310 = local_580._12_4_;
    fVar347 = local_580._16_4_;
    fVar237 = local_580._20_4_;
    fVar239 = local_580._24_4_;
    local_5c0 = (float)local_ac0._0_4_ * fVar232 * fVar259 +
                fVar231 * fVar259 * (float)local_a00._0_4_ +
                fVar204 * fVar259 * (float)local_8a0._0_4_;
    fStack_5bc = (float)local_ac0._4_4_ * fVar234 * fVar260 +
                 fVar264 * fVar260 * (float)local_a00._4_4_ +
                 fVar342 * fVar260 * (float)local_8a0._4_4_;
    fStack_5b8 = fStack_ab8 * fVar266 * fVar278 +
                 fVar261 * fVar278 * fStack_9f8 + fVar265 * fVar278 * fStack_898;
    fStack_5b4 = fStack_ab4 * fVar290 * fVar310 +
                 fVar282 * fVar310 * fStack_9f4 + fVar289 * fVar310 * fStack_894;
    fStack_5b0 = fStack_ab0 * fVar319 * fVar347 +
                 fVar313 * fVar347 * fStack_9f0 + fVar316 * fVar347 * fStack_890;
    fStack_5ac = fStack_aac * fVar12 * fVar237 +
                 fVar10 * fVar237 * fStack_9ec + fVar11 * fVar237 * fStack_88c;
    fStack_5a8 = fStack_aa8 * fVar20 * fVar239 +
                 fVar18 * fVar239 * fStack_9e8 + fVar19 * fVar239 * fStack_888;
    fStack_5a4 = fStack_aa4 + fStack_9e4 + fStack_884;
    fVar186 = fStack_aa4 + fStack_9e4 + fStack_884;
    local_aa0._0_4_ =
         fVar254 * fVar232 * fVar259 + fVar231 * fVar259 * fVar240 + fVar204 * fVar259 * fVar206;
    local_aa0._4_4_ =
         fVar256 * fVar234 * fVar260 + fVar264 * fVar260 * fVar255 + fVar342 * fVar260 * fVar238;
    local_aa0._8_4_ =
         fVar277 * fVar266 * fVar278 + fVar261 * fVar278 * fVar274 + fVar265 * fVar278 * fVar273;
    local_aa0._12_4_ =
         fVar300 * fVar290 * fVar310 + fVar282 * fVar310 * fVar298 + fVar289 * fVar310 * fVar296;
    local_aa0._16_4_ =
         fVar338 * fVar319 * fVar347 + fVar313 * fVar347 * fVar337 + fVar316 * fVar347 * fVar328;
    local_aa0._20_4_ =
         fVar17 * fVar12 * fVar237 + fVar10 * fVar237 * fVar16 + fVar11 * fVar237 * fVar15;
    local_aa0._24_4_ =
         fVar25 * fVar20 * fVar239 + fVar18 * fVar239 * fVar24 + fVar19 * fVar239 * fVar23;
    local_aa0._28_4_ = fStack_9e4 + fVar186;
    auVar47._4_4_ = fStack_5bc * local_aa0._4_4_;
    auVar47._0_4_ = local_5c0 * (float)local_aa0._0_4_;
    auVar47._8_4_ = fStack_5b8 * local_aa0._8_4_;
    auVar47._12_4_ = fStack_5b4 * local_aa0._12_4_;
    auVar47._16_4_ = fStack_5b0 * local_aa0._16_4_;
    auVar47._20_4_ = fStack_5ac * local_aa0._20_4_;
    auVar47._24_4_ = fStack_5a8 * local_aa0._24_4_;
    auVar47._28_4_ = fVar186;
    auVar366 = vsubps_avx(auVar363,auVar47);
    auVar48._4_4_ = local_aa0._4_4_ * local_aa0._4_4_;
    auVar48._0_4_ = (float)local_aa0._0_4_ * (float)local_aa0._0_4_;
    auVar48._8_4_ = local_aa0._8_4_ * local_aa0._8_4_;
    auVar48._12_4_ = local_aa0._12_4_ * local_aa0._12_4_;
    auVar48._16_4_ = local_aa0._16_4_ * local_aa0._16_4_;
    auVar48._20_4_ = local_aa0._20_4_ * local_aa0._20_4_;
    auVar48._24_4_ = local_aa0._24_4_ * local_aa0._24_4_;
    auVar48._28_4_ = fStack_9e4;
    auVar34 = vsubps_avx(auVar382,auVar48);
    auVar29 = vsqrtps_avx(auVar109);
    fVar186 = (auVar29._0_4_ + auVar110._0_4_) * 1.0000002;
    fVar122 = (auVar29._4_4_ + auVar110._4_4_) * 1.0000002;
    fVar123 = (auVar29._8_4_ + auVar110._8_4_) * 1.0000002;
    fVar124 = (auVar29._12_4_ + auVar110._12_4_) * 1.0000002;
    fVar125 = (auVar29._16_4_ + auVar110._16_4_) * 1.0000002;
    fVar126 = (auVar29._20_4_ + auVar110._20_4_) * 1.0000002;
    fVar127 = (auVar29._24_4_ + auVar110._24_4_) * 1.0000002;
    auVar49._4_4_ = fVar122 * fVar122;
    auVar49._0_4_ = fVar186 * fVar186;
    auVar49._8_4_ = fVar123 * fVar123;
    auVar49._12_4_ = fVar124 * fVar124;
    auVar49._16_4_ = fVar125 * fVar125;
    auVar49._20_4_ = fVar126 * fVar126;
    auVar49._24_4_ = fVar127 * fVar127;
    auVar49._28_4_ = auVar29._28_4_ + auVar110._28_4_;
    fVar122 = auVar366._0_4_ + auVar366._0_4_;
    fVar123 = auVar366._4_4_ + auVar366._4_4_;
    local_9e0._0_8_ = CONCAT44(fVar123,fVar122);
    local_9e0._8_4_ = auVar366._8_4_ + auVar366._8_4_;
    local_9e0._12_4_ = auVar366._12_4_ + auVar366._12_4_;
    local_9e0._16_4_ = auVar366._16_4_ + auVar366._16_4_;
    local_9e0._20_4_ = auVar366._20_4_ + auVar366._20_4_;
    local_9e0._24_4_ = auVar366._24_4_ + auVar366._24_4_;
    fVar186 = auVar366._28_4_;
    local_9e0._28_4_ = fVar186 + fVar186;
    auVar110 = vsubps_avx(auVar34,auVar49);
    local_340._4_4_ = fStack_5bc * fStack_5bc;
    local_340._0_4_ = local_5c0 * local_5c0;
    local_340._8_4_ = fStack_5b8 * fStack_5b8;
    local_340._12_4_ = fStack_5b4 * fStack_5b4;
    local_340._16_4_ = fStack_5b0 * fStack_5b0;
    local_340._20_4_ = fStack_5ac * fStack_5ac;
    local_340._24_4_ = fStack_5a8 * fStack_5a8;
    local_340._28_4_ = auVar28._28_4_;
    auVar346 = ZEXT3264(local_340);
    local_5a0 = vsubps_avx(local_2c0,local_340);
    auVar333 = ZEXT3264(local_5a0);
    auVar50._4_4_ = fVar123 * fVar123;
    auVar50._0_4_ = fVar122 * fVar122;
    auVar50._8_4_ = local_9e0._8_4_ * local_9e0._8_4_;
    auVar50._12_4_ = local_9e0._12_4_ * local_9e0._12_4_;
    auVar50._16_4_ = local_9e0._16_4_ * local_9e0._16_4_;
    auVar50._20_4_ = local_9e0._20_4_ * local_9e0._20_4_;
    auVar50._24_4_ = local_9e0._24_4_ * local_9e0._24_4_;
    auVar50._28_4_ = fVar186;
    fVar124 = local_5a0._0_4_;
    fVar125 = local_5a0._4_4_;
    fVar126 = local_5a0._8_4_;
    fVar127 = local_5a0._12_4_;
    fVar334 = local_5a0._16_4_;
    fVar335 = local_5a0._20_4_;
    fVar336 = local_5a0._24_4_;
    auVar28._4_4_ = auVar110._4_4_ * fVar125 * 4.0;
    auVar28._0_4_ = auVar110._0_4_ * fVar124 * 4.0;
    auVar28._8_4_ = auVar110._8_4_ * fVar126 * 4.0;
    auVar28._12_4_ = auVar110._12_4_ * fVar127 * 4.0;
    auVar28._16_4_ = auVar110._16_4_ * fVar334 * 4.0;
    auVar28._20_4_ = auVar110._20_4_ * fVar335 * 4.0;
    auVar28._24_4_ = auVar110._24_4_ * fVar336 * 4.0;
    auVar28._28_4_ = 0x40800000;
    auVar28 = vsubps_avx(auVar50,auVar28);
    auVar109 = vcmpps_avx(auVar28,auVar351,5);
    fVar186 = local_5a0._28_4_;
    if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar109 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar109 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar109 >> 0x7f,0) == '\0') &&
          (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar109 >> 0xbf,0) == '\0') &&
        (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar109[0x1f])
    {
      local_c80._8_4_ = 0x7f800000;
      local_c80._0_8_ = 0x7f8000007f800000;
      local_c80._12_4_ = 0x7f800000;
      local_c80._16_4_ = 0x7f800000;
      local_c80._20_4_ = 0x7f800000;
      local_c80._24_4_ = 0x7f800000;
      local_c80._28_4_ = 0x7f800000;
      auVar383._8_4_ = 0xff800000;
      auVar383._0_8_ = 0xff800000ff800000;
      auVar383._12_4_ = 0xff800000;
      auVar383._16_4_ = 0xff800000;
      auVar383._20_4_ = 0xff800000;
      auVar383._24_4_ = 0xff800000;
      auVar383._28_4_ = 0xff800000;
    }
    else {
      auVar366 = vcmpps_avx(auVar28,auVar351,5);
      auVar352 = ZEXT3264(auVar366);
      auVar351 = vsqrtps_avx(auVar28);
      auVar246._0_4_ = fVar124 + fVar124;
      auVar246._4_4_ = fVar125 + fVar125;
      auVar246._8_4_ = fVar126 + fVar126;
      auVar246._12_4_ = fVar127 + fVar127;
      auVar246._16_4_ = fVar334 + fVar334;
      auVar246._20_4_ = fVar335 + fVar335;
      auVar246._24_4_ = fVar336 + fVar336;
      auVar246._28_4_ = fVar186 + fVar186;
      auVar28 = vrcpps_avx(auVar246);
      fVar242 = auVar28._0_4_;
      fVar258 = auVar28._4_4_;
      auVar51._4_4_ = auVar246._4_4_ * fVar258;
      auVar51._0_4_ = auVar246._0_4_ * fVar242;
      fVar263 = auVar28._8_4_;
      auVar51._8_4_ = auVar246._8_4_ * fVar263;
      fVar268 = auVar28._12_4_;
      auVar51._12_4_ = auVar246._12_4_ * fVar268;
      fVar272 = auVar28._16_4_;
      auVar51._16_4_ = auVar246._16_4_ * fVar272;
      fVar276 = auVar28._20_4_;
      auVar51._20_4_ = auVar246._20_4_ * fVar276;
      fVar280 = auVar28._24_4_;
      auVar51._24_4_ = auVar246._24_4_ * fVar280;
      auVar51._28_4_ = auVar246._28_4_;
      auVar306._8_4_ = 0x3f800000;
      auVar306._0_8_ = 0x3f8000003f800000;
      auVar306._12_4_ = 0x3f800000;
      auVar306._16_4_ = 0x3f800000;
      auVar306._20_4_ = 0x3f800000;
      auVar306._24_4_ = 0x3f800000;
      auVar306._28_4_ = 0x3f800000;
      auVar35 = vsubps_avx(auVar306,auVar51);
      fVar242 = fVar242 + fVar242 * auVar35._0_4_;
      fVar258 = fVar258 + fVar258 * auVar35._4_4_;
      fVar263 = fVar263 + fVar263 * auVar35._8_4_;
      fVar268 = fVar268 + fVar268 * auVar35._12_4_;
      fVar272 = fVar272 + fVar272 * auVar35._16_4_;
      fVar276 = fVar276 + fVar276 * auVar35._20_4_;
      fVar280 = fVar280 + fVar280 * auVar35._24_4_;
      auVar286._0_8_ = CONCAT44(fVar123,fVar122) ^ 0x8000000080000000;
      auVar286._8_4_ = -local_9e0._8_4_;
      auVar286._12_4_ = -local_9e0._12_4_;
      auVar286._16_4_ = -local_9e0._16_4_;
      auVar286._20_4_ = -local_9e0._20_4_;
      auVar286._24_4_ = -local_9e0._24_4_;
      auVar286._28_4_ = -local_9e0._28_4_;
      auVar36 = vsubps_avx(auVar286,auVar351);
      fVar122 = auVar36._0_4_ * fVar242;
      fVar123 = auVar36._4_4_ * fVar258;
      auVar52._4_4_ = fVar123;
      auVar52._0_4_ = fVar122;
      fVar291 = auVar36._8_4_ * fVar263;
      auVar52._8_4_ = fVar291;
      fVar293 = auVar36._12_4_ * fVar268;
      auVar52._12_4_ = fVar293;
      fVar295 = auVar36._16_4_ * fVar272;
      auVar52._16_4_ = fVar295;
      fVar297 = auVar36._20_4_ * fVar276;
      auVar52._20_4_ = fVar297;
      fVar299 = auVar36._24_4_ * fVar280;
      auVar52._24_4_ = fVar299;
      auVar52._28_4_ = auVar36._28_4_;
      auVar351 = vsubps_avx(auVar351,local_9e0);
      fVar242 = auVar351._0_4_ * fVar242;
      fVar258 = auVar351._4_4_ * fVar258;
      auVar53._4_4_ = fVar258;
      auVar53._0_4_ = fVar242;
      fVar263 = auVar351._8_4_ * fVar263;
      auVar53._8_4_ = fVar263;
      fVar268 = auVar351._12_4_ * fVar268;
      auVar53._12_4_ = fVar268;
      fVar272 = auVar351._16_4_ * fVar272;
      auVar53._16_4_ = fVar272;
      fVar276 = auVar351._20_4_ * fVar276;
      auVar53._20_4_ = fVar276;
      fVar280 = auVar351._24_4_ * fVar280;
      auVar53._24_4_ = fVar280;
      auVar53._28_4_ = auVar351._28_4_;
      local_300 = fVar259 * ((float)local_aa0._0_4_ + local_5c0 * fVar122);
      fStack_2fc = fVar260 * (local_aa0._4_4_ + fStack_5bc * fVar123);
      fStack_2f8 = fVar278 * (local_aa0._8_4_ + fStack_5b8 * fVar291);
      fStack_2f4 = fVar310 * (local_aa0._12_4_ + fStack_5b4 * fVar293);
      fStack_2f0 = fVar347 * (local_aa0._16_4_ + fStack_5b0 * fVar295);
      fStack_2ec = fVar237 * (local_aa0._20_4_ + fStack_5ac * fVar297);
      fStack_2e8 = fVar239 * (local_aa0._24_4_ + fStack_5a8 * fVar299);
      fStack_2e4 = local_aa0._28_4_ + auVar28._28_4_ + auVar35._28_4_;
      auVar364._8_4_ = 0x7fffffff;
      auVar364._0_8_ = 0x7fffffff7fffffff;
      auVar364._12_4_ = 0x7fffffff;
      auVar364._16_4_ = 0x7fffffff;
      auVar364._20_4_ = 0x7fffffff;
      auVar364._24_4_ = 0x7fffffff;
      auVar364._28_4_ = 0x7fffffff;
      auVar28 = vandps_avx(local_340,auVar364);
      auVar351 = vmaxps_avx(local_520,auVar28);
      auVar54._4_4_ = auVar351._4_4_ * 1.9073486e-06;
      auVar54._0_4_ = auVar351._0_4_ * 1.9073486e-06;
      auVar54._8_4_ = auVar351._8_4_ * 1.9073486e-06;
      auVar54._12_4_ = auVar351._12_4_ * 1.9073486e-06;
      auVar54._16_4_ = auVar351._16_4_ * 1.9073486e-06;
      auVar54._20_4_ = auVar351._20_4_ * 1.9073486e-06;
      auVar54._24_4_ = auVar351._24_4_ * 1.9073486e-06;
      auVar54._28_4_ = auVar351._28_4_;
      auVar28 = vandps_avx(local_5a0,auVar364);
      auVar28 = vcmpps_avx(auVar28,auVar54,1);
      auVar307._8_4_ = 0x7f800000;
      auVar307._0_8_ = 0x7f8000007f800000;
      auVar307._12_4_ = 0x7f800000;
      auVar307._16_4_ = 0x7f800000;
      auVar307._20_4_ = 0x7f800000;
      auVar307._24_4_ = 0x7f800000;
      auVar307._28_4_ = 0x7f800000;
      local_c80 = vblendvps_avx(auVar307,auVar52,auVar366);
      local_320 = fVar259 * ((float)local_aa0._0_4_ + local_5c0 * fVar242);
      fStack_31c = fVar260 * (local_aa0._4_4_ + fStack_5bc * fVar258);
      fStack_318 = fVar278 * (local_aa0._8_4_ + fStack_5b8 * fVar263);
      fStack_314 = fVar310 * (local_aa0._12_4_ + fStack_5b4 * fVar268);
      fStack_310 = fVar347 * (local_aa0._16_4_ + fStack_5b0 * fVar272);
      fStack_30c = fVar237 * (local_aa0._20_4_ + fStack_5ac * fVar276);
      fStack_308 = fVar239 * (local_aa0._24_4_ + fStack_5a8 * fVar280);
      fStack_304 = local_aa0._28_4_ + auVar351._28_4_;
      auVar247._8_4_ = 0xff800000;
      auVar247._0_8_ = 0xff800000ff800000;
      auVar247._12_4_ = 0xff800000;
      auVar247._16_4_ = 0xff800000;
      auVar247._20_4_ = 0xff800000;
      auVar247._24_4_ = 0xff800000;
      auVar247._28_4_ = 0xff800000;
      auVar383 = vblendvps_avx(auVar247,auVar53,auVar366);
      auVar351 = auVar366 & auVar28;
      if ((((((((auVar351 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar351 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar351 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar351 >> 0x7f,0) != '\0') ||
            (auVar351 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar351 >> 0xbf,0) != '\0') ||
          (auVar351 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar351[0x1f] < '\0') {
        auVar109 = vandps_avx(auVar28,auVar366);
        auVar168 = vpackssdw_avx(auVar109._0_16_,auVar109._16_16_);
        auVar28 = vcmpps_avx(auVar110,ZEXT832(0) << 0x20,2);
        auVar368._8_4_ = 0xff800000;
        auVar368._0_8_ = 0xff800000ff800000;
        auVar368._12_4_ = 0xff800000;
        auVar368._16_4_ = 0xff800000;
        auVar368._20_4_ = 0xff800000;
        auVar368._24_4_ = 0xff800000;
        auVar368._28_4_ = 0xff800000;
        auVar385._8_4_ = 0x7f800000;
        auVar385._0_8_ = 0x7f8000007f800000;
        auVar385._12_4_ = 0x7f800000;
        auVar385._16_4_ = 0x7f800000;
        auVar385._20_4_ = 0x7f800000;
        auVar385._24_4_ = 0x7f800000;
        auVar385._28_4_ = 0x7f800000;
        auVar110 = vblendvps_avx(auVar385,auVar368,auVar28);
        auVar164 = vpmovsxwd_avx(auVar168);
        auVar168 = vpunpckhwd_avx(auVar168,auVar168);
        auVar230._16_16_ = auVar168;
        auVar230._0_16_ = auVar164;
        local_c80 = vblendvps_avx(local_c80,auVar110,auVar230);
        auVar110 = vblendvps_avx(auVar368,auVar385,auVar28);
        auVar383 = vblendvps_avx(auVar383,auVar110,auVar230);
        auVar110 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar120._0_4_ = auVar109._0_4_ ^ auVar110._0_4_;
        auVar120._4_4_ = auVar109._4_4_ ^ auVar110._4_4_;
        auVar120._8_4_ = auVar109._8_4_ ^ auVar110._8_4_;
        auVar120._12_4_ = auVar109._12_4_ ^ auVar110._12_4_;
        auVar120._16_4_ = auVar109._16_4_ ^ auVar110._16_4_;
        auVar120._20_4_ = auVar109._20_4_ ^ auVar110._20_4_;
        auVar120._24_4_ = auVar109._24_4_ ^ auVar110._24_4_;
        auVar120._28_4_ = auVar109._28_4_ ^ auVar110._28_4_;
        auVar109 = vorps_avx(auVar28,auVar120);
        auVar109 = vandps_avx(auVar366,auVar109);
      }
    }
    auVar341 = ZEXT3264(local_aa0);
    auVar288 = ZEXT3264(local_9e0);
    auVar110 = local_500 & auVar109;
    auVar253 = ZEXT3264(_local_a00);
    if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar110 >> 0x7f,0) != '\0') ||
          (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar110 >> 0xbf,0) != '\0') ||
        (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar110[0x1f] < '\0') {
      local_940 = ZEXT416((uint)*(float *)(ray + k * 4 + 0x100));
      auVar168 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_930._0_4_));
      auVar168 = vshufps_avx(auVar168,auVar168,0);
      auVar225._16_16_ = auVar168;
      auVar225._0_16_ = auVar168;
      auVar366 = vminps_avx(auVar225,auVar383);
      fVar276 = auVar32._28_4_;
      auVar341 = ZEXT3264(_local_8a0);
      auVar171._0_4_ =
           (float)local_ac0._0_4_ * fVar241 +
           (float)local_a00._0_4_ * fVar348 + (float)local_8a0._0_4_ * fVar359;
      auVar171._4_4_ =
           (float)local_ac0._4_4_ * fVar257 +
           (float)local_a00._4_4_ * fVar353 + (float)local_8a0._4_4_ * fVar370;
      auVar171._8_4_ = fStack_ab8 * fVar262 + fStack_9f8 * fVar354 + fStack_898 * fVar372;
      auVar171._12_4_ = fStack_ab4 * fVar267 + fStack_9f4 * fVar355 + fStack_894 * fVar374;
      auVar171._16_4_ = fStack_ab0 * fVar271 + fStack_9f0 * fVar356 + fStack_890 * fVar376;
      auVar171._20_4_ = fStack_aac * fVar275 + fStack_9ec * fVar357 + fStack_88c * fVar378;
      auVar171._24_4_ = fStack_aa8 * fVar279 + fStack_9e8 * fVar358 + fStack_888 * fVar380;
      auVar171._28_4_ = fVar276 + fVar276 + auVar33._28_4_;
      auVar110 = vrcpps_avx(auVar171);
      fVar122 = auVar110._0_4_;
      fVar123 = auVar110._4_4_;
      auVar55._4_4_ = auVar171._4_4_ * fVar123;
      auVar55._0_4_ = auVar171._0_4_ * fVar122;
      fVar242 = auVar110._8_4_;
      auVar55._8_4_ = auVar171._8_4_ * fVar242;
      fVar258 = auVar110._12_4_;
      auVar55._12_4_ = auVar171._12_4_ * fVar258;
      fVar263 = auVar110._16_4_;
      auVar55._16_4_ = auVar171._16_4_ * fVar263;
      fVar268 = auVar110._20_4_;
      auVar55._20_4_ = auVar171._20_4_ * fVar268;
      fVar272 = auVar110._24_4_;
      auVar55._24_4_ = auVar171._24_4_ * fVar272;
      auVar55._28_4_ = fVar281;
      auVar308._8_4_ = 0x3f800000;
      auVar308._0_8_ = 0x3f8000003f800000;
      auVar308._12_4_ = 0x3f800000;
      auVar308._16_4_ = 0x3f800000;
      auVar308._20_4_ = 0x3f800000;
      auVar308._24_4_ = 0x3f800000;
      auVar308._28_4_ = 0x3f800000;
      auVar32 = vsubps_avx(auVar308,auVar55);
      auVar287._8_4_ = 0x7fffffff;
      auVar287._0_8_ = 0x7fffffff7fffffff;
      auVar287._12_4_ = 0x7fffffff;
      auVar287._16_4_ = 0x7fffffff;
      auVar287._20_4_ = 0x7fffffff;
      auVar287._24_4_ = 0x7fffffff;
      auVar287._28_4_ = 0x7fffffff;
      auVar110 = vandps_avx(auVar171,auVar287);
      auVar365._8_4_ = 0x219392ef;
      auVar365._0_8_ = 0x219392ef219392ef;
      auVar365._12_4_ = 0x219392ef;
      auVar365._16_4_ = 0x219392ef;
      auVar365._20_4_ = 0x219392ef;
      auVar365._24_4_ = 0x219392ef;
      auVar365._28_4_ = 0x219392ef;
      auVar28 = vcmpps_avx(auVar110,auVar365,1);
      auVar56._4_4_ =
           (fVar123 + fVar123 * auVar32._4_4_) *
           -(fVar257 * fVar256 + fVar353 * fVar255 + fVar370 * fVar238);
      auVar56._0_4_ =
           (fVar122 + fVar122 * auVar32._0_4_) *
           -(fVar241 * fVar254 + fVar348 * fVar240 + fVar359 * fVar206);
      auVar56._8_4_ =
           (fVar242 + fVar242 * auVar32._8_4_) *
           -(fVar262 * fVar277 + fVar354 * fVar274 + fVar372 * fVar273);
      auVar56._12_4_ =
           (fVar258 + fVar258 * auVar32._12_4_) *
           -(fVar267 * fVar300 + fVar355 * fVar298 + fVar374 * fVar296);
      auVar56._16_4_ =
           (fVar263 + fVar263 * auVar32._16_4_) *
           -(fVar271 * fVar338 + fVar356 * fVar337 + fVar376 * fVar328);
      auVar56._20_4_ =
           (fVar268 + fVar268 * auVar32._20_4_) *
           -(fVar275 * fVar17 + fVar357 * fVar16 + fVar378 * fVar15);
      auVar56._24_4_ =
           (fVar272 + fVar272 * auVar32._24_4_) *
           -(fVar279 * fVar25 + fVar358 * fVar24 + fVar380 * fVar23);
      auVar56._28_4_ = -(auVar33._28_4_ + auVar31._28_4_ + fVar276);
      auVar77 = ZEXT812(0);
      auVar110 = vcmpps_avx(auVar171,ZEXT1232(auVar77) << 0x20,1);
      auVar110 = vorps_avx(auVar28,auVar110);
      auVar332._8_4_ = 0xff800000;
      auVar332._0_8_ = 0xff800000ff800000;
      auVar332._12_4_ = 0xff800000;
      auVar332._16_4_ = 0xff800000;
      auVar332._20_4_ = 0xff800000;
      auVar332._24_4_ = 0xff800000;
      auVar332._28_4_ = 0xff800000;
      auVar333 = ZEXT3264(auVar332);
      auVar110 = vblendvps_avx(auVar56,auVar332,auVar110);
      auVar31 = vcmpps_avx(auVar171,ZEXT1232(auVar77) << 0x20,6);
      auVar28 = vorps_avx(auVar28,auVar31);
      auVar344._8_4_ = 0x7f800000;
      auVar344._0_8_ = 0x7f8000007f800000;
      auVar344._12_4_ = 0x7f800000;
      auVar344._16_4_ = 0x7f800000;
      auVar344._20_4_ = 0x7f800000;
      auVar344._24_4_ = 0x7f800000;
      auVar344._28_4_ = 0x7f800000;
      auVar346 = ZEXT3264(auVar344);
      auVar28 = vblendvps_avx(auVar56,auVar344,auVar28);
      auVar31 = vmaxps_avx(local_2e0,local_c80);
      auVar31 = vmaxps_avx(auVar31,auVar110);
      auVar28 = vminps_avx(auVar366,auVar28);
      auVar366 = ZEXT1232(auVar77) << 0x20;
      auVar110 = vsubps_avx(auVar366,local_9c0);
      auVar26 = vsubps_avx(auVar366,auVar26);
      auVar57._4_4_ = auVar26._4_4_ * -fVar371;
      auVar57._0_4_ = auVar26._0_4_ * -fVar360;
      auVar57._8_4_ = auVar26._8_4_ * -fVar373;
      auVar57._12_4_ = auVar26._12_4_ * -fVar375;
      auVar57._16_4_ = auVar26._16_4_ * -fVar377;
      auVar57._20_4_ = auVar26._20_4_ * -fVar379;
      auVar57._24_4_ = auVar26._24_4_ * -fVar381;
      auVar57._28_4_ = auVar26._28_4_;
      auVar58._4_4_ = fVar235 * auVar110._4_4_;
      auVar58._0_4_ = fVar205 * auVar110._0_4_;
      auVar58._8_4_ = fVar269 * auVar110._8_4_;
      auVar58._12_4_ = fVar292 * auVar110._12_4_;
      auVar58._16_4_ = fVar322 * auVar110._16_4_;
      auVar58._20_4_ = fVar13 * auVar110._20_4_;
      auVar58._24_4_ = fVar21 * auVar110._24_4_;
      auVar58._28_4_ = auVar110._28_4_;
      auVar110 = vsubps_avx(auVar57,auVar58);
      auVar26 = vsubps_avx(auVar366,auVar367);
      auVar59._4_4_ = fVar236 * auVar26._4_4_;
      auVar59._0_4_ = fVar233 * auVar26._0_4_;
      auVar59._8_4_ = fVar270 * auVar26._8_4_;
      auVar59._12_4_ = fVar294 * auVar26._12_4_;
      auVar59._16_4_ = fVar325 * auVar26._16_4_;
      auVar59._20_4_ = fVar14 * auVar26._20_4_;
      uVar1 = auVar26._28_4_;
      auVar59._24_4_ = fVar22 * auVar26._24_4_;
      auVar59._28_4_ = uVar1;
      auVar367 = vsubps_avx(auVar110,auVar59);
      auVar60._4_4_ = (float)local_8a0._4_4_ * -fVar371;
      auVar60._0_4_ = (float)local_8a0._0_4_ * -fVar360;
      auVar60._8_4_ = fStack_898 * -fVar373;
      auVar60._12_4_ = fStack_894 * -fVar375;
      auVar60._16_4_ = fStack_890 * -fVar377;
      auVar60._20_4_ = fStack_88c * -fVar379;
      auVar60._24_4_ = fStack_888 * -fVar381;
      auVar60._28_4_ = uVar91 ^ 0x80000000;
      auVar61._4_4_ = (float)local_a00._4_4_ * fVar235;
      auVar61._0_4_ = (float)local_a00._0_4_ * fVar205;
      auVar61._8_4_ = fStack_9f8 * fVar269;
      auVar61._12_4_ = fStack_9f4 * fVar292;
      auVar61._16_4_ = fStack_9f0 * fVar322;
      auVar61._20_4_ = fStack_9ec * fVar13;
      auVar61._24_4_ = fStack_9e8 * fVar21;
      auVar61._28_4_ = uVar1;
      auVar110 = vsubps_avx(auVar60,auVar61);
      auVar62._4_4_ = fVar236 * (float)local_ac0._4_4_;
      auVar62._0_4_ = fVar233 * (float)local_ac0._0_4_;
      auVar62._8_4_ = fVar270 * fStack_ab8;
      auVar62._12_4_ = fVar294 * fStack_ab4;
      auVar62._16_4_ = fVar325 * fStack_ab0;
      auVar62._20_4_ = fVar14 * fStack_aac;
      auVar62._24_4_ = fVar22 * fStack_aa8;
      auVar62._28_4_ = uVar1;
      auVar352 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar288 = ZEXT3264(auVar308);
      auVar32 = vsubps_avx(auVar110,auVar62);
      auVar110 = vrcpps_avx(auVar32);
      fVar205 = auVar110._0_4_;
      fVar233 = auVar110._4_4_;
      auVar63._4_4_ = auVar32._4_4_ * fVar233;
      auVar63._0_4_ = auVar32._0_4_ * fVar205;
      fVar206 = auVar110._8_4_;
      auVar63._8_4_ = auVar32._8_4_ * fVar206;
      fVar240 = auVar110._12_4_;
      auVar63._12_4_ = auVar32._12_4_ * fVar240;
      fVar254 = auVar110._16_4_;
      auVar63._16_4_ = auVar32._16_4_ * fVar254;
      fVar235 = auVar110._20_4_;
      auVar63._20_4_ = auVar32._20_4_ * fVar235;
      fVar236 = auVar110._24_4_;
      auVar63._24_4_ = auVar32._24_4_ * fVar236;
      auVar63._28_4_ = fStack_aa4;
      auVar33 = vsubps_avx(auVar308,auVar63);
      auVar248._8_4_ = 0x7fffffff;
      auVar248._0_8_ = 0x7fffffff7fffffff;
      auVar248._12_4_ = 0x7fffffff;
      auVar248._16_4_ = 0x7fffffff;
      auVar248._20_4_ = 0x7fffffff;
      auVar248._24_4_ = 0x7fffffff;
      auVar248._28_4_ = 0x7fffffff;
      auVar110 = vandps_avx(auVar32,auVar248);
      auVar309._8_4_ = 0x219392ef;
      auVar309._0_8_ = 0x219392ef219392ef;
      auVar309._12_4_ = 0x219392ef;
      auVar309._16_4_ = 0x219392ef;
      auVar309._20_4_ = 0x219392ef;
      auVar309._24_4_ = 0x219392ef;
      auVar309._28_4_ = 0x219392ef;
      auVar26 = vcmpps_avx(auVar110,auVar309,1);
      auVar253 = ZEXT3264(auVar26);
      auVar64._4_4_ = (fVar233 + fVar233 * auVar33._4_4_) * -auVar367._4_4_;
      auVar64._0_4_ = (fVar205 + fVar205 * auVar33._0_4_) * -auVar367._0_4_;
      auVar64._8_4_ = (fVar206 + fVar206 * auVar33._8_4_) * -auVar367._8_4_;
      auVar64._12_4_ = (fVar240 + fVar240 * auVar33._12_4_) * -auVar367._12_4_;
      auVar64._16_4_ = (fVar254 + fVar254 * auVar33._16_4_) * -auVar367._16_4_;
      auVar64._20_4_ = (fVar235 + fVar235 * auVar33._20_4_) * -auVar367._20_4_;
      auVar64._24_4_ = (fVar236 + fVar236 * auVar33._24_4_) * -auVar367._24_4_;
      auVar64._28_4_ = auVar367._28_4_ ^ 0x80000000;
      auVar110 = vcmpps_avx(auVar32,auVar366,1);
      auVar110 = vorps_avx(auVar26,auVar110);
      auVar110 = vblendvps_avx(auVar64,auVar332,auVar110);
      _local_820 = vmaxps_avx(auVar31,auVar110);
      auVar367 = ZEXT1232(auVar77) << 0x20;
      auVar110 = vcmpps_avx(auVar32,auVar367,6);
      auVar110 = vorps_avx(auVar26,auVar110);
      auVar110 = vblendvps_avx(auVar64,auVar344,auVar110);
      auVar109 = vandps_avx(auVar109,local_500);
      local_360 = vminps_avx(auVar28,auVar110);
      auVar110 = vcmpps_avx(_local_820,local_360,2);
      auVar26 = auVar109 & auVar110;
      if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar26 >> 0x7f,0) != '\0') ||
            (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar26 >> 0xbf,0) != '\0') ||
          (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar26[0x1f] < '\0') {
        auVar26 = vminps_avx(_local_b40,auVar111);
        auVar141 = vminps_avx(auVar141,auVar172);
        auVar26 = vminps_avx(auVar26,auVar141);
        auVar29 = vsubps_avx(auVar26,auVar29);
        auVar109 = vandps_avx(auVar110,auVar109);
        auVar85._4_4_ = fStack_2fc;
        auVar85._0_4_ = local_300;
        auVar85._8_4_ = fStack_2f8;
        auVar85._12_4_ = fStack_2f4;
        auVar85._16_4_ = fStack_2f0;
        auVar85._20_4_ = fStack_2ec;
        auVar85._24_4_ = fStack_2e8;
        auVar85._28_4_ = fStack_2e4;
        auVar110 = vminps_avx(auVar85,auVar308);
        auVar110 = vmaxps_avx(auVar110,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar154 + fVar128 * (auVar110._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar183 + fVar151 * (auVar110._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar184 + fVar152 * (auVar110._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar185 + fVar153 * (auVar110._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar154 + fVar128 * (auVar110._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar183 + fVar151 * (auVar110._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar184 + fVar152 * (auVar110._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar185 + auVar110._28_4_ + 7.0;
        auVar84._4_4_ = fStack_31c;
        auVar84._0_4_ = local_320;
        auVar84._8_4_ = fStack_318;
        auVar84._12_4_ = fStack_314;
        auVar84._16_4_ = fStack_310;
        auVar84._20_4_ = fStack_30c;
        auVar84._24_4_ = fStack_308;
        auVar84._28_4_ = fStack_304;
        auVar110 = vminps_avx(auVar84,auVar308);
        auVar110 = vmaxps_avx(auVar110,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar154 + fVar128 * (auVar110._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar183 + fVar151 * (auVar110._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar184 + fVar152 * (auVar110._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar185 + fVar153 * (auVar110._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar154 + fVar128 * (auVar110._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar183 + fVar151 * (auVar110._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar184 + fVar152 * (auVar110._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar185 + auVar110._28_4_ + 7.0;
        auVar65._4_4_ = auVar29._4_4_ * 0.99999976;
        auVar65._0_4_ = auVar29._0_4_ * 0.99999976;
        auVar65._8_4_ = auVar29._8_4_ * 0.99999976;
        auVar65._12_4_ = auVar29._12_4_ * 0.99999976;
        auVar65._16_4_ = auVar29._16_4_ * 0.99999976;
        auVar65._20_4_ = auVar29._20_4_ * 0.99999976;
        auVar65._24_4_ = auVar29._24_4_ * 0.99999976;
        auVar65._28_4_ = 0x3f7ffffc;
        auVar110 = vmaxps_avx(auVar367,auVar65);
        auVar66._4_4_ = auVar110._4_4_ * auVar110._4_4_;
        auVar66._0_4_ = auVar110._0_4_ * auVar110._0_4_;
        auVar66._8_4_ = auVar110._8_4_ * auVar110._8_4_;
        auVar66._12_4_ = auVar110._12_4_ * auVar110._12_4_;
        auVar66._16_4_ = auVar110._16_4_ * auVar110._16_4_;
        auVar66._20_4_ = auVar110._20_4_ * auVar110._20_4_;
        auVar66._24_4_ = auVar110._24_4_ * auVar110._24_4_;
        auVar66._28_4_ = auVar110._28_4_;
        local_980 = vsubps_avx(auVar34,auVar66);
        auVar67._4_4_ = local_980._4_4_ * fVar125 * 4.0;
        auVar67._0_4_ = local_980._0_4_ * fVar124 * 4.0;
        auVar67._8_4_ = local_980._8_4_ * fVar126 * 4.0;
        auVar67._12_4_ = local_980._12_4_ * fVar127 * 4.0;
        auVar67._16_4_ = local_980._16_4_ * fVar334 * 4.0;
        auVar67._20_4_ = local_980._20_4_ * fVar335 * 4.0;
        auVar67._24_4_ = local_980._24_4_ * fVar336 * 4.0;
        auVar67._28_4_ = auVar110._28_4_;
        auVar345 = vsubps_avx(auVar50,auVar67);
        auVar110 = vcmpps_avx(auVar345,ZEXT832(0) << 0x20,5);
        if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar110 >> 0x7f,0) == '\0') &&
              (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar110 >> 0xbf,0) == '\0') &&
            (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar110[0x1f]) {
          auVar141 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_8e0 = ZEXT832(0) << 0x20;
          _local_900 = ZEXT832(0) << 0x20;
          auVar172 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar199 = ZEXT1628(ZEXT816(0) << 0x40);
          auVar226._8_4_ = 0x7f800000;
          auVar226._0_8_ = 0x7f8000007f800000;
          auVar226._12_4_ = 0x7f800000;
          auVar226._16_4_ = 0x7f800000;
          auVar226._20_4_ = 0x7f800000;
          auVar226._24_4_ = 0x7f800000;
          auVar226._28_4_ = 0x7f800000;
          auVar249._8_4_ = 0xff800000;
          auVar249._0_8_ = 0xff800000ff800000;
          auVar249._12_4_ = 0xff800000;
          auVar249._16_4_ = 0xff800000;
          auVar249._20_4_ = 0xff800000;
          auVar249._24_4_ = 0xff800000;
          auVar249._28_4_ = 0xff800000;
          local_980 = auVar37;
          _local_8c0 = _local_8e0;
        }
        else {
          auVar26 = vsqrtps_avx(auVar345);
          auVar173._0_4_ = fVar124 + fVar124;
          auVar173._4_4_ = fVar125 + fVar125;
          auVar173._8_4_ = fVar126 + fVar126;
          auVar173._12_4_ = fVar127 + fVar127;
          auVar173._16_4_ = fVar334 + fVar334;
          auVar173._20_4_ = fVar335 + fVar335;
          auVar173._24_4_ = fVar336 + fVar336;
          auVar173._28_4_ = fVar186 + fVar186;
          auVar29 = vrcpps_avx(auVar173);
          fVar186 = auVar29._0_4_;
          fVar205 = auVar29._4_4_;
          auVar68._4_4_ = auVar173._4_4_ * fVar205;
          auVar68._0_4_ = auVar173._0_4_ * fVar186;
          fVar233 = auVar29._8_4_;
          auVar68._8_4_ = auVar173._8_4_ * fVar233;
          fVar206 = auVar29._12_4_;
          auVar68._12_4_ = auVar173._12_4_ * fVar206;
          fVar240 = auVar29._16_4_;
          auVar68._16_4_ = auVar173._16_4_ * fVar240;
          fVar254 = auVar29._20_4_;
          auVar68._20_4_ = auVar173._20_4_ * fVar254;
          fVar235 = auVar29._24_4_;
          auVar68._24_4_ = auVar173._24_4_ * fVar235;
          auVar68._28_4_ = auVar173._28_4_;
          auVar141 = vsubps_avx(auVar308,auVar68);
          fVar186 = fVar186 + fVar186 * auVar141._0_4_;
          fVar205 = fVar205 + fVar205 * auVar141._4_4_;
          fVar233 = fVar233 + fVar233 * auVar141._8_4_;
          fVar206 = fVar206 + fVar206 * auVar141._12_4_;
          fVar240 = fVar240 + fVar240 * auVar141._16_4_;
          fVar254 = fVar254 + fVar254 * auVar141._20_4_;
          fVar235 = fVar235 + fVar235 * auVar141._24_4_;
          fVar236 = auVar29._28_4_ + auVar141._28_4_;
          auVar201._0_8_ = local_9e0._0_8_ ^ 0x8000000080000000;
          auVar201._8_4_ = -local_9e0._8_4_;
          auVar201._12_4_ = -local_9e0._12_4_;
          auVar201._16_4_ = -local_9e0._16_4_;
          auVar201._20_4_ = -local_9e0._20_4_;
          auVar201._24_4_ = -local_9e0._24_4_;
          auVar201._28_4_ = -local_9e0._28_4_;
          auVar29 = vsubps_avx(auVar201,auVar26);
          fVar277 = auVar29._0_4_ * fVar186;
          fVar292 = auVar29._4_4_ * fVar205;
          auVar69._4_4_ = fVar292;
          auVar69._0_4_ = fVar277;
          fVar294 = auVar29._8_4_ * fVar233;
          auVar69._8_4_ = fVar294;
          fVar296 = auVar29._12_4_ * fVar206;
          auVar69._12_4_ = fVar296;
          fVar298 = auVar29._16_4_ * fVar240;
          auVar69._16_4_ = fVar298;
          fVar300 = auVar29._20_4_ * fVar254;
          auVar69._20_4_ = fVar300;
          fVar322 = auVar29._24_4_ * fVar235;
          auVar69._24_4_ = fVar322;
          auVar69._28_4_ = 0x3f800000;
          auVar26 = vsubps_avx(auVar26,local_9e0);
          fVar186 = auVar26._0_4_ * fVar186;
          fVar205 = auVar26._4_4_ * fVar205;
          auVar70._4_4_ = fVar205;
          auVar70._0_4_ = fVar186;
          fVar233 = auVar26._8_4_ * fVar233;
          auVar70._8_4_ = fVar233;
          fVar206 = auVar26._12_4_ * fVar206;
          auVar70._12_4_ = fVar206;
          fVar240 = auVar26._16_4_ * fVar240;
          auVar70._16_4_ = fVar240;
          fVar254 = auVar26._20_4_ * fVar254;
          auVar70._20_4_ = fVar254;
          fVar235 = auVar26._24_4_ * fVar235;
          auVar70._24_4_ = fVar235;
          auVar70._28_4_ = 0x80000000;
          auVar352 = ZEXT3264(auVar70);
          fVar238 = (fVar277 * local_5c0 + (float)local_aa0._0_4_) * fVar259;
          fVar255 = (fVar292 * fStack_5bc + local_aa0._4_4_) * fVar260;
          fVar256 = (fVar294 * fStack_5b8 + local_aa0._8_4_) * fVar278;
          fVar269 = (fVar296 * fStack_5b4 + local_aa0._12_4_) * fVar310;
          fVar270 = (fVar298 * fStack_5b0 + local_aa0._16_4_) * fVar347;
          fVar273 = (fVar300 * fStack_5ac + local_aa0._20_4_) * fVar237;
          fVar274 = (fVar322 * fStack_5a8 + local_aa0._24_4_) * fVar239;
          local_a40._28_4_ = auVar30._28_4_;
          auVar142._0_4_ = fVar301 + fVar232 * fVar238;
          auVar142._4_4_ = fVar311 + fVar234 * fVar255;
          auVar142._8_4_ = fVar314 + fVar266 * fVar256;
          auVar142._12_4_ = fVar317 + fVar290 * fVar269;
          auVar142._16_4_ = fVar320 + fVar319 * fVar270;
          auVar142._20_4_ = fVar323 + fVar12 * fVar273;
          auVar142._24_4_ = fVar326 + fVar20 * fVar274;
          auVar142._28_4_ = fVar329 + auVar26._28_4_ + local_aa0._28_4_;
          auVar71._4_4_ = (float)local_ac0._4_4_ * fVar292;
          auVar71._0_4_ = (float)local_ac0._0_4_ * fVar277;
          auVar71._8_4_ = fStack_ab8 * fVar294;
          auVar71._12_4_ = fStack_ab4 * fVar296;
          auVar71._16_4_ = fStack_ab0 * fVar298;
          auVar71._20_4_ = fStack_aac * fVar300;
          auVar71._24_4_ = fStack_aa8 * fVar322;
          auVar71._28_4_ = fVar236;
          auVar141 = vsubps_avx(auVar71,auVar142);
          auVar174._0_4_ = fVar302 + fVar231 * fVar238;
          auVar174._4_4_ = fVar312 + fVar264 * fVar255;
          auVar174._8_4_ = fVar315 + fVar261 * fVar256;
          auVar174._12_4_ = fVar318 + fVar282 * fVar269;
          auVar174._16_4_ = fVar321 + fVar313 * fVar270;
          auVar174._20_4_ = fVar324 + fVar10 * fVar273;
          auVar174._24_4_ = fVar327 + fVar18 * fVar274;
          auVar174._28_4_ = fVar330 + fVar236;
          auVar227._0_4_ = (float)local_a00._0_4_ * fVar277;
          auVar227._4_4_ = (float)local_a00._4_4_ * fVar292;
          auVar227._8_4_ = fStack_9f8 * fVar294;
          auVar227._12_4_ = fStack_9f4 * fVar296;
          auVar227._16_4_ = fStack_9f0 * fVar298;
          auVar227._20_4_ = fStack_9ec * fVar300;
          auVar227._24_4_ = fStack_9e8 * fVar322;
          auVar227._28_4_ = 0;
          auVar172 = vsubps_avx(auVar227,auVar174);
          auVar202._0_4_ = local_9a0 + fVar204 * fVar238;
          auVar202._4_4_ = fStack_99c + fVar342 * fVar255;
          auVar202._8_4_ = fStack_998 + fVar265 * fVar256;
          auVar202._12_4_ = fStack_994 + fVar289 * fVar269;
          auVar202._16_4_ = fStack_990 + fVar316 * fVar270;
          auVar202._20_4_ = fStack_98c + fVar11 * fVar273;
          auVar202._24_4_ = fStack_988 + fVar19 * fVar274;
          auVar202._28_4_ = fStack_984 + auVar29._28_4_;
          auVar72._4_4_ = (float)local_8a0._4_4_ * fVar292;
          auVar72._0_4_ = (float)local_8a0._0_4_ * fVar277;
          auVar72._8_4_ = fStack_898 * fVar294;
          auVar72._12_4_ = fStack_894 * fVar296;
          auVar72._16_4_ = fStack_890 * fVar298;
          auVar72._20_4_ = fStack_88c * fVar300;
          auVar72._24_4_ = fStack_888 * fVar322;
          auVar72._28_4_ = 0;
          auVar29 = vsubps_avx(auVar72,auVar202);
          auVar199 = auVar29._0_28_;
          fVar259 = (fVar186 * local_5c0 + (float)local_aa0._0_4_) * fVar259;
          fVar260 = (fVar205 * fStack_5bc + local_aa0._4_4_) * fVar260;
          fVar278 = (fVar233 * fStack_5b8 + local_aa0._8_4_) * fVar278;
          fVar310 = (fVar206 * fStack_5b4 + local_aa0._12_4_) * fVar310;
          fVar347 = (fVar240 * fStack_5b0 + local_aa0._16_4_) * fVar347;
          fVar237 = (fVar254 * fStack_5ac + local_aa0._20_4_) * fVar237;
          fVar239 = (fVar235 * fStack_5a8 + local_aa0._24_4_) * fVar239;
          auVar250._0_4_ = fVar301 + fVar232 * fVar259;
          auVar250._4_4_ = fVar311 + fVar234 * fVar260;
          auVar250._8_4_ = fVar314 + fVar266 * fVar278;
          auVar250._12_4_ = fVar317 + fVar290 * fVar310;
          auVar250._16_4_ = fVar320 + fVar319 * fVar347;
          auVar250._20_4_ = fVar323 + fVar12 * fVar237;
          auVar250._24_4_ = fVar326 + fVar20 * fVar239;
          auVar250._28_4_ = fVar329 + (float)local_a40._28_4_;
          auVar73._4_4_ = (float)local_ac0._4_4_ * fVar205;
          auVar73._0_4_ = (float)local_ac0._0_4_ * fVar186;
          auVar73._8_4_ = fStack_ab8 * fVar233;
          auVar73._12_4_ = fStack_ab4 * fVar206;
          auVar73._16_4_ = fStack_ab0 * fVar240;
          auVar73._20_4_ = fStack_aac * fVar254;
          auVar73._24_4_ = fStack_aa8 * fVar235;
          auVar73._28_4_ = fStack_aa4;
          _local_8c0 = vsubps_avx(auVar73,auVar250);
          auVar251._0_4_ = fVar302 + fVar231 * fVar259;
          auVar251._4_4_ = fVar312 + fVar264 * fVar260;
          auVar251._8_4_ = fVar315 + fVar261 * fVar278;
          auVar251._12_4_ = fVar318 + fVar282 * fVar310;
          auVar251._16_4_ = fVar321 + fVar313 * fVar347;
          auVar251._20_4_ = fVar324 + fVar10 * fVar237;
          auVar251._24_4_ = fVar327 + fVar18 * fVar239;
          auVar251._28_4_ = fVar330 + local_8c0._28_4_;
          auVar74._4_4_ = (float)local_a00._4_4_ * fVar205;
          auVar74._0_4_ = (float)local_a00._0_4_ * fVar186;
          auVar74._8_4_ = fStack_9f8 * fVar233;
          auVar74._12_4_ = fStack_9f4 * fVar206;
          auVar74._16_4_ = fStack_9f0 * fVar240;
          auVar74._20_4_ = fStack_9ec * fVar254;
          auVar74._24_4_ = fStack_9e8 * fVar235;
          auVar74._28_4_ = fStack_aa4;
          _local_8e0 = vsubps_avx(auVar74,auVar251);
          auVar228._0_4_ = local_9a0 + fVar204 * fVar259;
          auVar228._4_4_ = fStack_99c + fVar342 * fVar260;
          auVar228._8_4_ = fStack_998 + fVar265 * fVar278;
          auVar228._12_4_ = fStack_994 + fVar289 * fVar310;
          auVar228._16_4_ = fStack_990 + fVar316 * fVar347;
          auVar228._20_4_ = fStack_98c + fVar11 * fVar237;
          auVar228._24_4_ = fStack_988 + fVar19 * fVar239;
          auVar228._28_4_ = fStack_984 + local_aa0._28_4_ + 0.0;
          auVar75._4_4_ = (float)local_8a0._4_4_ * fVar205;
          auVar75._0_4_ = (float)local_8a0._0_4_ * fVar186;
          auVar75._8_4_ = fStack_898 * fVar233;
          auVar75._12_4_ = fStack_894 * fVar206;
          auVar75._16_4_ = fStack_890 * fVar240;
          auVar75._20_4_ = fStack_88c * fVar254;
          auVar75._24_4_ = fStack_888 * fVar235;
          auVar75._28_4_ = local_8e0._28_4_;
          _local_900 = vsubps_avx(auVar75,auVar228);
          auVar26 = vcmpps_avx(auVar345,auVar367,5);
          auVar229._8_4_ = 0x7f800000;
          auVar229._0_8_ = 0x7f8000007f800000;
          auVar229._12_4_ = 0x7f800000;
          auVar229._16_4_ = 0x7f800000;
          auVar229._20_4_ = 0x7f800000;
          auVar229._24_4_ = 0x7f800000;
          auVar229._28_4_ = 0x7f800000;
          auVar226 = vblendvps_avx(auVar229,auVar69,auVar26);
          auVar339._8_4_ = 0x7fffffff;
          auVar339._0_8_ = 0x7fffffff7fffffff;
          auVar339._12_4_ = 0x7fffffff;
          auVar339._16_4_ = 0x7fffffff;
          auVar339._20_4_ = 0x7fffffff;
          auVar339._24_4_ = 0x7fffffff;
          auVar339._28_4_ = 0x7fffffff;
          auVar29 = vandps_avx(auVar339,local_340);
          auVar29 = vmaxps_avx(local_520,auVar29);
          auVar345._8_4_ = 0x36000000;
          auVar345._0_8_ = 0x3600000036000000;
          auVar345._12_4_ = 0x36000000;
          auVar345._16_4_ = 0x36000000;
          auVar345._20_4_ = 0x36000000;
          auVar345._24_4_ = 0x36000000;
          auVar345._28_4_ = 0x36000000;
          auVar76._4_4_ = auVar29._4_4_ * 1.9073486e-06;
          auVar76._0_4_ = auVar29._0_4_ * 1.9073486e-06;
          auVar76._8_4_ = auVar29._8_4_ * 1.9073486e-06;
          auVar76._12_4_ = auVar29._12_4_ * 1.9073486e-06;
          auVar76._16_4_ = auVar29._16_4_ * 1.9073486e-06;
          auVar76._20_4_ = auVar29._20_4_ * 1.9073486e-06;
          auVar76._24_4_ = auVar29._24_4_ * 1.9073486e-06;
          auVar76._28_4_ = auVar29._28_4_;
          auVar29 = vandps_avx(auVar339,local_5a0);
          auVar29 = vcmpps_avx(auVar29,auVar76,1);
          auVar252._8_4_ = 0xff800000;
          auVar252._0_8_ = 0xff800000ff800000;
          auVar252._12_4_ = 0xff800000;
          auVar252._16_4_ = 0xff800000;
          auVar252._20_4_ = 0xff800000;
          auVar252._24_4_ = 0xff800000;
          auVar252._28_4_ = 0xff800000;
          auVar249 = vblendvps_avx(auVar252,auVar70,auVar26);
          auVar367 = auVar26 & auVar29;
          _local_b40 = auVar109;
          local_9c0 = auVar172;
          if ((((((((auVar367 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar367 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar367 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar367 >> 0x7f,0) != '\0') ||
                (auVar367 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar367 >> 0xbf,0) != '\0') ||
              (auVar367 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar367[0x1f] < '\0') {
            auVar110 = vandps_avx(auVar29,auVar26);
            auVar168 = vpackssdw_avx(auVar110._0_16_,auVar110._16_16_);
            auVar367 = vcmpps_avx(local_980,ZEXT832(0) << 0x20,2);
            auVar384._8_4_ = 0xff800000;
            auVar384._0_8_ = 0xff800000ff800000;
            auVar384._12_4_ = 0xff800000;
            auVar384._16_4_ = 0xff800000;
            auVar384._20_4_ = 0xff800000;
            auVar384._24_4_ = 0xff800000;
            auVar384._28_4_ = 0xff800000;
            auVar369._8_4_ = 0x7f800000;
            auVar369._0_8_ = 0x7f8000007f800000;
            auVar369._12_4_ = 0x7f800000;
            auVar369._16_4_ = 0x7f800000;
            auVar369._20_4_ = 0x7f800000;
            auVar369._24_4_ = 0x7f800000;
            auVar369._28_4_ = 0x7f800000;
            auVar29 = vblendvps_avx(auVar369,auVar384,auVar367);
            auVar164 = vpmovsxwd_avx(auVar168);
            auVar352 = ZEXT1664(auVar164);
            auVar168 = vpunpckhwd_avx(auVar168,auVar168);
            auVar340._16_16_ = auVar168;
            auVar340._0_16_ = auVar164;
            auVar226 = vblendvps_avx(auVar226,auVar29,auVar340);
            auVar345 = vblendvps_avx(auVar384,auVar369,auVar367);
            auVar249 = vblendvps_avx(auVar249,auVar345,auVar340);
            auVar29 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
            auVar121._0_4_ = auVar29._0_4_ ^ auVar110._0_4_;
            auVar121._4_4_ = auVar29._4_4_ ^ auVar110._4_4_;
            auVar121._8_4_ = auVar29._8_4_ ^ auVar110._8_4_;
            auVar121._12_4_ = auVar29._12_4_ ^ auVar110._12_4_;
            auVar121._16_4_ = auVar29._16_4_ ^ auVar110._16_4_;
            auVar121._20_4_ = auVar29._20_4_ ^ auVar110._20_4_;
            auVar121._24_4_ = auVar29._24_4_ ^ auVar110._24_4_;
            auVar121._28_4_ = auVar29._28_4_ ^ auVar110._28_4_;
            auVar110 = vorps_avx(auVar367,auVar121);
            auVar110 = vandps_avx(auVar26,auVar110);
          }
        }
        auVar346 = ZEXT3264(auVar345);
        auVar341 = ZEXT3264(auVar109);
        auVar333 = ZEXT1664(local_940);
        _local_3c0 = _local_820;
        local_3a0 = vminps_avx(local_360,auVar226);
        _local_840 = vmaxps_avx(_local_820,auVar249);
        auVar253 = ZEXT3264(_local_840);
        local_380 = _local_840;
        auVar29 = vcmpps_avx(_local_820,local_3a0,2);
        local_760 = vandps_avx(auVar109,auVar29);
        auVar29 = vcmpps_avx(_local_840,local_360,2);
        local_7a0 = vandps_avx(auVar109,auVar29);
        auVar288 = ZEXT3264(local_7a0);
        auVar109 = vorps_avx(local_7a0,local_760);
        if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar109 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar109 >> 0x7f,0) != '\0') ||
              (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar109 >> 0xbf,0) != '\0') ||
            (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar109[0x1f] < '\0') {
          local_a40 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
          local_7c0._0_4_ = auVar110._0_4_ ^ local_a40._0_4_;
          local_7c0._4_4_ = auVar110._4_4_ ^ local_a40._4_4_;
          local_7c0._8_4_ = auVar110._8_4_ ^ local_a40._8_4_;
          local_7c0._12_4_ = auVar110._12_4_ ^ local_a40._12_4_;
          local_7c0._16_4_ = auVar110._16_4_ ^ local_a40._16_4_;
          local_7c0._20_4_ = auVar110._20_4_ ^ local_a40._20_4_;
          local_7c0._24_4_ = auVar110._24_4_ ^ local_a40._24_4_;
          local_7c0._28_4_ = (uint)auVar110._28_4_ ^ local_a40._28_4_;
          auVar253 = ZEXT3264(_local_a00);
          auVar112._0_4_ =
               (float)local_ac0._0_4_ * auVar141._0_4_ +
               (float)local_a00._0_4_ * auVar172._0_4_ + (float)local_8a0._0_4_ * auVar199._0_4_;
          auVar112._4_4_ =
               (float)local_ac0._4_4_ * auVar141._4_4_ +
               (float)local_a00._4_4_ * auVar172._4_4_ + (float)local_8a0._4_4_ * auVar199._4_4_;
          auVar112._8_4_ =
               fStack_ab8 * auVar141._8_4_ +
               fStack_9f8 * auVar172._8_4_ + fStack_898 * auVar199._8_4_;
          auVar112._12_4_ =
               fStack_ab4 * auVar141._12_4_ +
               fStack_9f4 * auVar172._12_4_ + fStack_894 * auVar199._12_4_;
          auVar112._16_4_ =
               fStack_ab0 * auVar141._16_4_ +
               fStack_9f0 * auVar172._16_4_ + fStack_890 * auVar199._16_4_;
          auVar112._20_4_ =
               fStack_aac * auVar141._20_4_ +
               fStack_9ec * auVar172._20_4_ + fStack_88c * auVar199._20_4_;
          auVar112._24_4_ =
               fStack_aa8 * auVar141._24_4_ +
               fStack_9e8 * auVar172._24_4_ + fStack_888 * auVar199._24_4_;
          auVar112._28_4_ = auVar110._28_4_ + auVar141._28_4_ + auVar172._28_4_;
          auVar143._8_4_ = 0x7fffffff;
          auVar143._0_8_ = 0x7fffffff7fffffff;
          auVar143._12_4_ = 0x7fffffff;
          auVar143._16_4_ = 0x7fffffff;
          auVar143._20_4_ = 0x7fffffff;
          auVar143._24_4_ = 0x7fffffff;
          auVar143._28_4_ = 0x7fffffff;
          auVar109 = vandps_avx(auVar112,auVar143);
          auVar144._8_4_ = 0x3e99999a;
          auVar144._0_8_ = 0x3e99999a3e99999a;
          auVar144._12_4_ = 0x3e99999a;
          auVar144._16_4_ = 0x3e99999a;
          auVar144._20_4_ = 0x3e99999a;
          auVar144._24_4_ = 0x3e99999a;
          auVar144._28_4_ = 0x3e99999a;
          auVar109 = vcmpps_avx(auVar109,auVar144,1);
          auVar109 = vorps_avx(local_7c0,auVar109);
          auVar145._8_4_ = 3;
          auVar145._0_8_ = 0x300000003;
          auVar145._12_4_ = 3;
          auVar145._16_4_ = 3;
          auVar145._20_4_ = 3;
          auVar145._24_4_ = 3;
          auVar145._28_4_ = 3;
          auVar175._8_4_ = 2;
          auVar175._0_8_ = 0x200000002;
          auVar175._12_4_ = 2;
          auVar175._16_4_ = 2;
          auVar175._20_4_ = 2;
          auVar175._24_4_ = 2;
          auVar175._28_4_ = 2;
          auVar109 = vblendvps_avx(auVar175,auVar145,auVar109);
          local_7e0 = ZEXT432(local_ccc);
          local_800 = vpshufd_avx(ZEXT416(local_ccc),0);
          fVar186 = 0.0;
          auVar168 = vpcmpgtd_avx(auVar109._16_16_,local_800);
          auStack_7f0 = auVar27._16_16_;
          auVar164 = vpcmpgtd_avx(auVar109._0_16_,local_800);
          auVar146._16_16_ = auVar168;
          auVar146._0_16_ = auVar164;
          local_780 = vblendps_avx(ZEXT1632(auVar164),auVar146,0xf0);
          local_720 = vandnps_avx(local_780,local_760);
          auVar288 = ZEXT3264(local_720);
          auVar109 = local_760 & ~local_780;
          if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar109 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar109 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar109 >> 0x7f,0) == '\0') &&
                (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar109 >> 0xbf,0) == '\0') &&
              (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar109[0x1f]) {
            auVar168 = vshufps_avx(local_940,local_940,0);
            auVar113._16_16_ = auVar168;
            auVar113._0_16_ = auVar168;
            fVar204 = (float)local_ac0._0_4_;
            fVar232 = (float)local_ac0._4_4_;
            fVar205 = fStack_ab8;
            fVar233 = fStack_ab4;
            fVar206 = fStack_ab0;
            fVar240 = fStack_aac;
            fVar254 = fStack_aa8;
          }
          else {
            local_a20._4_4_ = (float)local_820._4_4_ + (float)local_960._4_4_;
            local_a20._0_4_ = (float)local_820._0_4_ + (float)local_960._0_4_;
            fStack_a18 = fStack_818 + fStack_958;
            fStack_a14 = fStack_814 + fStack_954;
            fStack_a10 = fStack_810 + fStack_950;
            fStack_a0c = fStack_80c + fStack_94c;
            fStack_a08 = fStack_808 + fStack_948;
            fStack_a04 = fStack_804 + fStack_944;
            do {
              auVar114._8_4_ = 0x7f800000;
              auVar114._0_8_ = 0x7f8000007f800000;
              auVar114._12_4_ = 0x7f800000;
              auVar114._16_4_ = 0x7f800000;
              auVar114._20_4_ = 0x7f800000;
              auVar114._24_4_ = 0x7f800000;
              auVar114._28_4_ = 0x7f800000;
              auVar109 = auVar288._0_32_;
              auVar110 = vblendvps_avx(auVar114,_local_820,auVar109);
              auVar29 = vshufps_avx(auVar110,auVar110,0xb1);
              auVar29 = vminps_avx(auVar110,auVar29);
              auVar26 = vshufpd_avx(auVar29,auVar29,5);
              auVar29 = vminps_avx(auVar29,auVar26);
              auVar26 = vperm2f128_avx(auVar29,auVar29,1);
              auVar29 = vminps_avx(auVar29,auVar26);
              auVar110 = vcmpps_avx(auVar110,auVar29,0);
              auVar29 = auVar109 & auVar110;
              if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar29 >> 0x7f,0) != '\0') ||
                    (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar29 >> 0xbf,0) != '\0') ||
                  (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar29[0x1f] < '\0') {
                auVar109 = vandps_avx(auVar110,auVar109);
              }
              uVar93 = vmovmskps_avx(auVar109);
              uVar91 = 0;
              if (uVar93 != 0) {
                for (; (uVar93 >> uVar91 & 1) == 0; uVar91 = uVar91 + 1) {
                }
              }
              uVar87 = (ulong)uVar91;
              *(undefined4 *)(local_720 + uVar87 * 4) = 0;
              fVar186 = local_1a0[uVar87];
              uVar91 = *(uint *)(local_3c0 + uVar87 * 4);
              fVar231 = auVar130._0_4_;
              if ((float)local_a60._0_4_ < 0.0) {
                fVar231 = sqrtf((float)local_a60._0_4_);
              }
              auVar164 = vminps_avx(_local_b50,_local_b70);
              auVar168 = vmaxps_avx(_local_b50,_local_b70);
              auVar104 = vminps_avx(_local_b60,_local_b80);
              auVar135 = vminps_avx(auVar164,auVar104);
              auVar164 = vmaxps_avx(_local_b60,_local_b80);
              auVar104 = vmaxps_avx(auVar168,auVar164);
              auVar189._8_4_ = 0x7fffffff;
              auVar189._0_8_ = 0x7fffffff7fffffff;
              auVar189._12_4_ = 0x7fffffff;
              auVar168 = vandps_avx(auVar135,auVar189);
              auVar164 = vandps_avx(auVar104,auVar189);
              auVar168 = vmaxps_avx(auVar168,auVar164);
              auVar164 = vmovshdup_avx(auVar168);
              auVar164 = vmaxss_avx(auVar164,auVar168);
              auVar168 = vshufpd_avx(auVar168,auVar168,1);
              auVar168 = vmaxss_avx(auVar168,auVar164);
              local_b40._0_4_ = auVar168._0_4_ * 1.9073486e-06;
              local_980._0_4_ = fVar231 * 1.9073486e-06;
              local_9e0._0_16_ = vshufps_avx(auVar104,auVar104,0xff);
              auVar168 = vinsertps_avx(ZEXT416(uVar91),ZEXT416((uint)fVar186),0x10);
              auVar333 = ZEXT1664(auVar168);
              bVar96 = true;
              uVar87 = 0;
              do {
                auVar98 = auVar333._0_16_;
                auVar168 = vmovshdup_avx(auVar98);
                fVar186 = auVar168._0_4_;
                fVar205 = 1.0 - fVar186;
                fVar231 = fVar205 * fVar205 * fVar205;
                fVar204 = fVar186 * fVar186 * fVar186;
                fVar232 = fVar186 * fVar205;
                auVar168 = vshufps_avx(ZEXT416((uint)(fVar204 * 0.16666667)),
                                       ZEXT416((uint)(fVar204 * 0.16666667)),0);
                auVar164 = ZEXT416((uint)((fVar204 * 4.0 + fVar231 +
                                          fVar186 * fVar232 * 12.0 + fVar205 * fVar232 * 6.0) *
                                         0.16666667));
                auVar164 = vshufps_avx(auVar164,auVar164,0);
                auVar104 = ZEXT416((uint)((fVar231 * 4.0 + fVar204 +
                                          fVar205 * fVar232 * 12.0 + fVar186 * fVar232 * 6.0) *
                                         0.16666667));
                auVar104 = vshufps_avx(auVar104,auVar104,0);
                auVar135 = vshufps_avx(auVar98,auVar98,0);
                auVar159._0_4_ = auVar135._0_4_ * (float)local_a50._0_4_ + 0.0;
                auVar159._4_4_ = auVar135._4_4_ * (float)local_a50._4_4_ + 0.0;
                auVar159._8_4_ = auVar135._8_4_ * fStack_a48 + 0.0;
                auVar159._12_4_ = auVar135._12_4_ * fStack_a44 + 0.0;
                auVar135 = vshufps_avx(ZEXT416((uint)(fVar231 * 0.16666667)),
                                       ZEXT416((uint)(fVar231 * 0.16666667)),0);
                auVar100._0_4_ =
                     auVar135._0_4_ * (float)local_b50._0_4_ +
                     auVar104._0_4_ * (float)local_b70._0_4_ +
                     auVar168._0_4_ * (float)local_b80._0_4_ +
                     auVar164._0_4_ * (float)local_b60._0_4_;
                auVar100._4_4_ =
                     auVar135._4_4_ * (float)local_b50._4_4_ +
                     auVar104._4_4_ * (float)local_b70._4_4_ +
                     auVar168._4_4_ * (float)local_b80._4_4_ +
                     auVar164._4_4_ * (float)local_b60._4_4_;
                auVar100._8_4_ =
                     auVar135._8_4_ * fStack_b48 +
                     auVar104._8_4_ * fStack_b68 +
                     auVar168._8_4_ * fStack_b78 + auVar164._8_4_ * fStack_b58;
                auVar100._12_4_ =
                     auVar135._12_4_ * fStack_b44 +
                     auVar104._12_4_ * fStack_b64 +
                     auVar168._12_4_ * fStack_b74 + auVar164._12_4_ * fStack_b54;
                local_9c0._0_16_ = auVar100;
                auVar168 = vsubps_avx(auVar159,auVar100);
                local_9a0 = auVar168._0_4_;
                fStack_99c = auVar168._4_4_;
                fStack_998 = auVar168._8_4_;
                fStack_994 = auVar168._12_4_;
                auVar168 = vdpps_avx(auVar168,auVar168,0x7f);
                fVar231 = auVar168._0_4_;
                local_cc0 = auVar333._0_4_;
                if (fVar231 < 0.0) {
                  fVar204 = sqrtf(fVar231);
                }
                else {
                  auVar164 = vsqrtss_avx(auVar168,auVar168);
                  fVar204 = auVar164._0_4_;
                }
                auVar164 = ZEXT416((uint)(fVar186 * fVar186 * 0.5));
                auVar164 = vshufps_avx(auVar164,auVar164,0);
                auVar104 = ZEXT416((uint)((fVar205 * fVar205 + fVar232 * 4.0) * 0.5));
                auVar104 = vshufps_avx(auVar104,auVar104,0);
                auVar135 = ZEXT416((uint)((fVar186 * -fVar186 - fVar232 * 4.0) * 0.5));
                auVar135 = vshufps_avx(auVar135,auVar135,0);
                auVar103 = ZEXT416((uint)(fVar205 * -fVar205 * 0.5));
                auVar103 = vshufps_avx(auVar103,auVar103,0);
                auVar304._0_4_ =
                     (float)local_b50._0_4_ * auVar103._0_4_ +
                     (float)local_b70._0_4_ * auVar135._0_4_ +
                     (float)local_b80._0_4_ * auVar164._0_4_ +
                     (float)local_b60._0_4_ * auVar104._0_4_;
                auVar304._4_4_ =
                     (float)local_b50._4_4_ * auVar103._4_4_ +
                     (float)local_b70._4_4_ * auVar135._4_4_ +
                     (float)local_b80._4_4_ * auVar164._4_4_ +
                     (float)local_b60._4_4_ * auVar104._4_4_;
                auVar304._8_4_ =
                     fStack_b48 * auVar103._8_4_ +
                     fStack_b68 * auVar135._8_4_ +
                     fStack_b78 * auVar164._8_4_ + fStack_b58 * auVar104._8_4_;
                auVar304._12_4_ =
                     fStack_b44 * auVar103._12_4_ +
                     fStack_b64 * auVar135._12_4_ +
                     fStack_b74 * auVar164._12_4_ + fStack_b54 * auVar104._12_4_;
                auVar164 = vshufps_avx(auVar98,auVar98,0x55);
                auVar104 = ZEXT416((uint)(fVar205 - (fVar186 + fVar186)));
                auVar135 = vshufps_avx(auVar104,auVar104,0);
                auVar104 = ZEXT416((uint)(fVar186 - (fVar205 + fVar205)));
                auVar103 = vshufps_avx(auVar104,auVar104,0);
                auVar129 = vshufps_avx(ZEXT416((uint)fVar205),ZEXT416((uint)fVar205),0);
                auVar104 = vdpps_avx(auVar304,auVar304,0x7f);
                auVar131._0_4_ =
                     (float)local_b50._0_4_ * auVar129._0_4_ +
                     (float)local_b70._0_4_ * auVar103._0_4_ +
                     (float)local_b80._0_4_ * auVar164._0_4_ +
                     (float)local_b60._0_4_ * auVar135._0_4_;
                auVar131._4_4_ =
                     (float)local_b50._4_4_ * auVar129._4_4_ +
                     (float)local_b70._4_4_ * auVar103._4_4_ +
                     (float)local_b80._4_4_ * auVar164._4_4_ +
                     (float)local_b60._4_4_ * auVar135._4_4_;
                auVar131._8_4_ =
                     fStack_b48 * auVar129._8_4_ +
                     fStack_b68 * auVar103._8_4_ +
                     fStack_b78 * auVar164._8_4_ + fStack_b58 * auVar135._8_4_;
                auVar131._12_4_ =
                     fStack_b44 * auVar129._12_4_ +
                     fStack_b64 * auVar103._12_4_ +
                     fStack_b74 * auVar164._12_4_ + fStack_b54 * auVar135._12_4_;
                auVar164 = vblendps_avx(auVar104,_DAT_01f7aa10,0xe);
                auVar135 = vrsqrtss_avx(auVar164,auVar164);
                fVar232 = auVar135._0_4_;
                fVar186 = auVar104._0_4_;
                auVar135 = vdpps_avx(auVar304,auVar131,0x7f);
                auVar103 = vshufps_avx(auVar104,auVar104,0);
                auVar132._0_4_ = auVar131._0_4_ * auVar103._0_4_;
                auVar132._4_4_ = auVar131._4_4_ * auVar103._4_4_;
                auVar132._8_4_ = auVar131._8_4_ * auVar103._8_4_;
                auVar132._12_4_ = auVar131._12_4_ * auVar103._12_4_;
                auVar135 = vshufps_avx(auVar135,auVar135,0);
                auVar210._0_4_ = auVar304._0_4_ * auVar135._0_4_;
                auVar210._4_4_ = auVar304._4_4_ * auVar135._4_4_;
                auVar210._8_4_ = auVar304._8_4_ * auVar135._8_4_;
                auVar210._12_4_ = auVar304._12_4_ * auVar135._12_4_;
                auVar129 = vsubps_avx(auVar132,auVar210);
                auVar135 = vrcpss_avx(auVar164,auVar164);
                auVar164 = vmaxss_avx(ZEXT416((uint)local_b40._0_4_),
                                      ZEXT416((uint)(local_cc0 * (float)local_980._0_4_)));
                auVar341 = ZEXT1664(auVar164);
                auVar135 = ZEXT416((uint)(auVar135._0_4_ * (2.0 - fVar186 * auVar135._0_4_)));
                auVar135 = vshufps_avx(auVar135,auVar135,0);
                uVar78 = CONCAT44(auVar304._4_4_,auVar304._0_4_);
                auVar220._0_8_ = uVar78 ^ 0x8000000080000000;
                auVar220._8_4_ = -auVar304._8_4_;
                auVar220._12_4_ = -auVar304._12_4_;
                auVar103 = ZEXT416((uint)(fVar232 * 1.5 +
                                         fVar186 * -0.5 * fVar232 * fVar232 * fVar232));
                auVar103 = vshufps_avx(auVar103,auVar103,0);
                auVar190._0_4_ = auVar103._0_4_ * auVar129._0_4_ * auVar135._0_4_;
                auVar190._4_4_ = auVar103._4_4_ * auVar129._4_4_ * auVar135._4_4_;
                auVar190._8_4_ = auVar103._8_4_ * auVar129._8_4_ * auVar135._8_4_;
                auVar190._12_4_ = auVar103._12_4_ * auVar129._12_4_ * auVar135._12_4_;
                auVar244._0_4_ = auVar304._0_4_ * auVar103._0_4_;
                auVar244._4_4_ = auVar304._4_4_ * auVar103._4_4_;
                auVar244._8_4_ = auVar304._8_4_ * auVar103._8_4_;
                auVar244._12_4_ = auVar304._12_4_ * auVar103._12_4_;
                if (fVar186 < 0.0) {
                  local_a80._0_16_ = auVar190;
                  fVar186 = sqrtf(fVar186);
                  auVar341 = ZEXT464(auVar164._0_4_);
                  auVar190 = local_a80._0_16_;
                }
                else {
                  auVar104 = vsqrtss_avx(auVar104,auVar104);
                  fVar186 = auVar104._0_4_;
                }
                auVar81._4_4_ = fStack_99c;
                auVar81._0_4_ = local_9a0;
                auVar81._8_4_ = fStack_998;
                auVar81._12_4_ = fStack_994;
                auVar104 = vdpps_avx(auVar81,auVar244,0x7f);
                fVar186 = ((float)local_b40._0_4_ / fVar186) * (fVar204 + 1.0) +
                          auVar341._0_4_ + fVar204 * (float)local_b40._0_4_;
                auVar135 = vdpps_avx(auVar220,auVar244,0x7f);
                auVar103 = vdpps_avx(auVar81,auVar190,0x7f);
                auVar129 = vdpps_avx(_local_a50,auVar244,0x7f);
                auVar97 = vdpps_avx(auVar81,auVar220,0x7f);
                fVar204 = auVar135._0_4_ + auVar103._0_4_;
                fVar232 = auVar104._0_4_;
                auVar101._0_4_ = fVar232 * fVar232;
                auVar101._4_4_ = auVar104._4_4_ * auVar104._4_4_;
                auVar101._8_4_ = auVar104._8_4_ * auVar104._8_4_;
                auVar101._12_4_ = auVar104._12_4_ * auVar104._12_4_;
                auVar103 = vsubps_avx(auVar168,auVar101);
                auVar135 = vdpps_avx(auVar81,_local_a50,0x7f);
                fVar205 = auVar97._0_4_ - fVar232 * fVar204;
                fVar233 = auVar135._0_4_ - fVar232 * auVar129._0_4_;
                auVar135 = vrsqrtss_avx(auVar103,auVar103);
                fVar206 = auVar103._0_4_;
                fVar232 = auVar135._0_4_;
                fVar232 = fVar232 * 1.5 + fVar206 * -0.5 * fVar232 * fVar232 * fVar232;
                if (fVar206 < 0.0) {
                  local_a80._0_16_ = ZEXT416((uint)fVar204);
                  local_860._0_4_ = fVar205;
                  local_880._0_4_ = fVar233;
                  local_aa0._0_4_ = fVar232;
                  fVar206 = sqrtf(fVar206);
                  auVar341 = ZEXT464(auVar164._0_4_);
                  fVar232 = (float)local_aa0._0_4_;
                  fVar205 = (float)local_860._0_4_;
                  fVar233 = (float)local_880._0_4_;
                  auVar164 = local_a80._0_16_;
                }
                else {
                  auVar164 = vsqrtss_avx(auVar103,auVar103);
                  fVar206 = auVar164._0_4_;
                  auVar164 = ZEXT416((uint)fVar204);
                }
                auVar352 = ZEXT1664(auVar104);
                auVar346 = ZEXT464((uint)fVar186);
                auVar106 = vpermilps_avx(local_9c0._0_16_,0xff);
                auVar97 = vshufps_avx(auVar304,auVar304,0xff);
                fVar204 = fVar205 * fVar232 - auVar97._0_4_;
                auVar211._0_8_ = auVar129._0_8_ ^ 0x8000000080000000;
                auVar211._8_4_ = auVar129._8_4_ ^ 0x80000000;
                auVar211._12_4_ = auVar129._12_4_ ^ 0x80000000;
                auVar221._0_4_ = -fVar204;
                auVar221._4_4_ = 0x80000000;
                auVar221._8_4_ = 0x80000000;
                auVar221._12_4_ = 0x80000000;
                auVar135 = vinsertps_avx(auVar221,ZEXT416((uint)(fVar233 * fVar232)),0x1c);
                auVar103 = vmovsldup_avx(ZEXT416((uint)(auVar164._0_4_ * fVar233 * fVar232 -
                                                       auVar129._0_4_ * fVar204)));
                auVar135 = vdivps_avx(auVar135,auVar103);
                auVar164 = vinsertps_avx(auVar164,auVar211,0x10);
                auVar164 = vdivps_avx(auVar164,auVar103);
                auVar103 = vmovsldup_avx(auVar104);
                auVar106 = ZEXT416((uint)(fVar206 - auVar106._0_4_));
                auVar129 = vmovsldup_avx(auVar106);
                auVar160._0_4_ = auVar103._0_4_ * auVar135._0_4_ + auVar129._0_4_ * auVar164._0_4_;
                auVar160._4_4_ = auVar103._4_4_ * auVar135._4_4_ + auVar129._4_4_ * auVar164._4_4_;
                auVar160._8_4_ = auVar103._8_4_ * auVar135._8_4_ + auVar129._8_4_ * auVar164._8_4_;
                auVar160._12_4_ =
                     auVar103._12_4_ * auVar135._12_4_ + auVar129._12_4_ * auVar164._12_4_;
                auVar135 = vsubps_avx(auVar98,auVar160);
                auVar333 = ZEXT1664(auVar135);
                auVar161._8_4_ = 0x7fffffff;
                auVar161._0_8_ = 0x7fffffff7fffffff;
                auVar161._12_4_ = 0x7fffffff;
                auVar164 = vandps_avx(auVar104,auVar161);
                fVar204 = (float)local_ac0._0_4_;
                fVar232 = (float)local_ac0._4_4_;
                fVar205 = fStack_ab8;
                fVar233 = fStack_ab4;
                fVar206 = fStack_ab0;
                fVar240 = fStack_aac;
                fVar254 = fStack_aa8;
                if (auVar164._0_4_ < fVar186) {
                  auVar191._8_4_ = 0x7fffffff;
                  auVar191._0_8_ = 0x7fffffff7fffffff;
                  auVar191._12_4_ = 0x7fffffff;
                  auVar164 = vandps_avx(auVar106,auVar191);
                  if (auVar164._0_4_ <
                      (float)local_9e0._0_4_ * 1.9073486e-06 + auVar341._0_4_ + fVar186) {
                    fVar259 = auVar135._0_4_ + (float)local_930._0_4_;
                    auVar253 = ZEXT3264(_local_a00);
                    if (fVar259 < fVar217) {
                      bVar86 = 0;
                      goto LAB_00e2431e;
                    }
                    fVar264 = *(float *)(ray + k * 4 + 0x100);
                    auVar341 = ZEXT464((uint)fVar264);
                    if (fVar259 <= fVar264) {
                      auVar164 = vmovshdup_avx(auVar135);
                      bVar86 = 0;
                      if ((auVar164._0_4_ < 0.0) || (bVar86 = 0, 1.0 < auVar164._0_4_))
                      goto LAB_00e2431e;
                      auVar168 = vrsqrtss_avx(auVar168,auVar168);
                      fVar342 = auVar168._0_4_;
                      pGVar4 = (context->scene->geometries).items[local_af8].ptr;
                      if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                        bVar86 = 0;
                        goto LAB_00e2431e;
                      }
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar86 = 1, pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_00e2431e;
                      auVar168 = ZEXT416((uint)(fVar342 * 1.5 +
                                               fVar231 * -0.5 * fVar342 * fVar342 * fVar342));
                      auVar168 = vshufps_avx(auVar168,auVar168,0);
                      auVar162._0_4_ = auVar168._0_4_ * local_9a0;
                      auVar162._4_4_ = auVar168._4_4_ * fStack_99c;
                      auVar162._8_4_ = auVar168._8_4_ * fStack_998;
                      auVar162._12_4_ = auVar168._12_4_ * fStack_994;
                      auVar133._0_4_ = auVar304._0_4_ + auVar97._0_4_ * auVar162._0_4_;
                      auVar133._4_4_ = auVar304._4_4_ + auVar97._4_4_ * auVar162._4_4_;
                      auVar133._8_4_ = auVar304._8_4_ + auVar97._8_4_ * auVar162._8_4_;
                      auVar133._12_4_ = auVar304._12_4_ + auVar97._12_4_ * auVar162._12_4_;
                      auVar168 = vshufps_avx(auVar162,auVar162,0xc9);
                      auVar164 = vshufps_avx(auVar304,auVar304,0xc9);
                      auVar163._0_4_ = auVar164._0_4_ * auVar162._0_4_;
                      auVar163._4_4_ = auVar164._4_4_ * auVar162._4_4_;
                      auVar163._8_4_ = auVar164._8_4_ * auVar162._8_4_;
                      auVar163._12_4_ = auVar164._12_4_ * auVar162._12_4_;
                      auVar192._0_4_ = auVar304._0_4_ * auVar168._0_4_;
                      auVar192._4_4_ = auVar304._4_4_ * auVar168._4_4_;
                      auVar192._8_4_ = auVar304._8_4_ * auVar168._8_4_;
                      auVar192._12_4_ = auVar304._12_4_ * auVar168._12_4_;
                      auVar98 = vsubps_avx(auVar192,auVar163);
                      auVar168 = vshufps_avx(auVar98,auVar98,0xc9);
                      auVar164 = vshufps_avx(auVar133,auVar133,0xc9);
                      auVar193._0_4_ = auVar164._0_4_ * auVar168._0_4_;
                      auVar193._4_4_ = auVar164._4_4_ * auVar168._4_4_;
                      auVar193._8_4_ = auVar164._8_4_ * auVar168._8_4_;
                      auVar193._12_4_ = auVar164._12_4_ * auVar168._12_4_;
                      auVar168 = vshufps_avx(auVar98,auVar98,0xd2);
                      auVar134._0_4_ = auVar133._0_4_ * auVar168._0_4_;
                      auVar134._4_4_ = auVar133._4_4_ * auVar168._4_4_;
                      auVar134._8_4_ = auVar133._8_4_ * auVar168._8_4_;
                      auVar134._12_4_ = auVar133._12_4_ * auVar168._12_4_;
                      auVar168 = vsubps_avx(auVar193,auVar134);
                      pRVar5 = context->user;
                      local_680 = vshufps_avx(auVar135,auVar135,0x55);
                      auStack_6d0 = vshufps_avx(auVar168,auVar168,0x55);
                      local_6c0 = vshufps_avx(auVar168,auVar168,0xaa);
                      local_6a0 = vshufps_avx(auVar168,auVar168,0);
                      local_6e0 = (RTCHitN  [16])auStack_6d0;
                      local_660 = ZEXT832(0) << 0x20;
                      local_640 = local_560._0_8_;
                      uStack_638 = local_560._8_8_;
                      uStack_630 = local_560._16_8_;
                      uStack_628 = local_560._24_8_;
                      local_620 = local_540._0_8_;
                      uStack_618 = local_540._8_8_;
                      uStack_610 = local_540._16_8_;
                      uStack_608 = local_540._24_8_;
                      *(undefined8 *)(local_b00 + 8) = local_a40._0_8_;
                      *(undefined8 *)(local_b00 + 10) = local_a40._8_8_;
                      *(undefined8 *)(local_b00 + 0xc) = local_a40._16_8_;
                      *(undefined8 *)(local_b00 + 0xe) = local_a40._24_8_;
                      *(undefined8 *)local_b00 = local_a40._0_8_;
                      *(undefined8 *)(local_b00 + 2) = local_a40._8_8_;
                      *(undefined8 *)(local_b00 + 4) = local_a40._16_8_;
                      *(undefined8 *)(local_b00 + 6) = local_a40._24_8_;
                      local_600 = pRVar5->instID[0];
                      local_5e0 = pRVar5->instPrimID[0];
                      *(float *)(ray + k * 4 + 0x100) = fVar259;
                      local_ba0 = *local_b08;
                      local_b90 = *local_b10;
                      local_af0.valid = (int *)local_ba0;
                      local_af0.geometryUserPtr = pGVar4->userPtr;
                      local_af0.context = context->user;
                      local_af0.hit = local_6e0;
                      local_af0.N = 8;
                      local_af0.ray = (RTCRayN *)ray;
                      local_6b0 = local_6c0;
                      local_690 = local_6a0;
                      local_670 = local_680;
                      uStack_5fc = local_600;
                      uStack_5f8 = local_600;
                      uStack_5f4 = local_600;
                      uStack_5f0 = local_600;
                      uStack_5ec = local_600;
                      uStack_5e8 = local_600;
                      uStack_5e4 = local_600;
                      uStack_5dc = local_5e0;
                      uStack_5d8 = local_5e0;
                      uStack_5d4 = local_5e0;
                      uStack_5d0 = local_5e0;
                      uStack_5cc = local_5e0;
                      uStack_5c8 = local_5e0;
                      uStack_5c4 = local_5e0;
                      if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar333 = ZEXT1664(auVar135);
                        auVar346 = ZEXT464((uint)fVar186);
                        auVar352 = ZEXT1664(auVar104);
                        (*pGVar4->occlusionFilterN)(&local_af0);
                        auVar253 = ZEXT3264(_local_a00);
                      }
                      auVar168 = vpcmpeqd_avx(local_ba0,ZEXT816(0) << 0x40);
                      auVar164 = vpcmpeqd_avx(local_b90,ZEXT816(0) << 0x40);
                      auVar176._16_16_ = auVar164;
                      auVar176._0_16_ = auVar168;
                      auVar109 = local_a40 & ~auVar176;
                      if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar109 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar109 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar109 >> 0x7f,0) == '\0') &&
                            (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar109 >> 0xbf,0) == '\0') &&
                          (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar109[0x1f]) {
                        fVar204 = (float)local_ac0._0_4_;
                        fVar232 = (float)local_ac0._4_4_;
                        fVar205 = fStack_ab8;
                        fVar233 = fStack_ab4;
                        fVar206 = fStack_ab0;
                        fVar240 = fStack_aac;
                        fVar254 = fStack_aa8;
                      }
                      else {
                        p_Var6 = context->args->filter;
                        if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar333 = ZEXT1664(auVar333._0_16_);
                          auVar346 = ZEXT1664(auVar346._0_16_);
                          auVar352 = ZEXT1664(auVar352._0_16_);
                          (*p_Var6)(&local_af0);
                          auVar253 = ZEXT3264(_local_a00);
                        }
                        auVar341 = ZEXT464((uint)fVar264);
                        auVar168 = vpcmpeqd_avx(local_ba0,ZEXT816(0) << 0x40);
                        auVar164 = vpcmpeqd_avx(local_b90,ZEXT816(0) << 0x40);
                        auVar115._16_16_ = auVar164;
                        auVar115._0_16_ = auVar168;
                        auVar147._8_4_ = 0xff800000;
                        auVar147._0_8_ = 0xff800000ff800000;
                        auVar147._12_4_ = 0xff800000;
                        auVar147._16_4_ = 0xff800000;
                        auVar147._20_4_ = 0xff800000;
                        auVar147._24_4_ = 0xff800000;
                        auVar147._28_4_ = 0xff800000;
                        auVar109 = vblendvps_avx(auVar147,*(undefined1 (*) [32])
                                                           (local_af0.ray + 0x100),auVar115);
                        *(undefined1 (*) [32])(local_af0.ray + 0x100) = auVar109;
                        auVar109 = local_a40 & ~auVar115;
                        fVar204 = (float)local_ac0._0_4_;
                        fVar232 = (float)local_ac0._4_4_;
                        fVar205 = fStack_ab8;
                        fVar233 = fStack_ab4;
                        fVar206 = fStack_ab0;
                        fVar240 = fStack_aac;
                        fVar254 = fStack_aa8;
                        if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar109 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar109 >> 0x7f,0) != '\0')
                              || (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar109 >> 0xbf,0) != '\0') ||
                            (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar109[0x1f] < '\0') {
                          bVar86 = 1;
                          goto LAB_00e2431e;
                        }
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar264;
                    }
                    auVar341 = ZEXT464((uint)fVar264);
                    bVar86 = 0;
                    goto LAB_00e2431e;
                  }
                }
                bVar96 = uVar87 < 4;
                uVar87 = uVar87 + 1;
              } while (uVar87 != 5);
              bVar96 = false;
              auVar253 = ZEXT3264(_local_a00);
              bVar86 = 5;
LAB_00e2431e:
              bVar94 = (bool)(bVar94 | bVar96 & bVar86);
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar113._4_4_ = uVar1;
              auVar113._0_4_ = uVar1;
              auVar113._8_4_ = uVar1;
              auVar113._12_4_ = uVar1;
              auVar113._16_4_ = uVar1;
              auVar113._20_4_ = uVar1;
              auVar113._24_4_ = uVar1;
              auVar113._28_4_ = uVar1;
              auVar110 = vcmpps_avx(_local_a20,auVar113,2);
              fVar186 = auVar110._28_4_;
              auVar109 = vandps_avx(auVar110,local_720);
              auVar288 = ZEXT3264(auVar109);
              auVar110 = local_720 & auVar110;
              local_720 = auVar109;
            } while ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar110 >> 0x7f,0) != '\0') ||
                       (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar110 >> 0xbf,0) != '\0') ||
                     (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar110[0x1f] < '\0');
            auVar288 = ZEXT3264(local_380);
          }
          auVar148._0_4_ =
               fVar204 * (float)local_8c0._0_4_ +
               auVar253._0_4_ * (float)local_8e0._0_4_ +
               (float)local_8a0._0_4_ * (float)local_900._0_4_;
          auVar148._4_4_ =
               fVar232 * (float)local_8c0._4_4_ +
               auVar253._4_4_ * (float)local_8e0._4_4_ +
               (float)local_8a0._4_4_ * (float)local_900._4_4_;
          auVar148._8_4_ =
               fVar205 * fStack_8b8 + auVar253._8_4_ * fStack_8d8 + fStack_898 * fStack_8f8;
          auVar148._12_4_ =
               fVar233 * fStack_8b4 + auVar253._12_4_ * fStack_8d4 + fStack_894 * fStack_8f4;
          auVar148._16_4_ =
               fVar206 * fStack_8b0 + auVar253._16_4_ * fStack_8d0 + fStack_890 * fStack_8f0;
          auVar148._20_4_ =
               fVar240 * fStack_8ac + auVar253._20_4_ * fStack_8cc + fStack_88c * fStack_8ec;
          auVar148._24_4_ =
               fVar254 * fStack_8a8 + auVar253._24_4_ * fStack_8c8 + fStack_888 * fStack_8e8;
          auVar148._28_4_ = fVar186 + fVar186 + auVar288._28_4_;
          auVar177._8_4_ = 0x7fffffff;
          auVar177._0_8_ = 0x7fffffff7fffffff;
          auVar177._12_4_ = 0x7fffffff;
          auVar177._16_4_ = 0x7fffffff;
          auVar177._20_4_ = 0x7fffffff;
          auVar177._24_4_ = 0x7fffffff;
          auVar177._28_4_ = 0x7fffffff;
          auVar109 = vandps_avx(auVar148,auVar177);
          auVar178._8_4_ = 0x3e99999a;
          auVar178._0_8_ = 0x3e99999a3e99999a;
          auVar178._12_4_ = 0x3e99999a;
          auVar178._16_4_ = 0x3e99999a;
          auVar178._20_4_ = 0x3e99999a;
          auVar178._24_4_ = 0x3e99999a;
          auVar178._28_4_ = 0x3e99999a;
          auVar109 = vcmpps_avx(auVar109,auVar178,1);
          auVar110 = vorps_avx(auVar109,local_7c0);
          auVar179._0_4_ = (float)local_960._0_4_ + (float)local_840._0_4_;
          auVar179._4_4_ = (float)local_960._4_4_ + (float)local_840._4_4_;
          auVar179._8_4_ = fStack_958 + fStack_838;
          auVar179._12_4_ = fStack_954 + fStack_834;
          auVar179._16_4_ = fStack_950 + fStack_830;
          auVar179._20_4_ = fStack_94c + fStack_82c;
          auVar179._24_4_ = fStack_948 + fStack_828;
          auVar179._28_4_ = fStack_944 + fStack_824;
          auVar109 = vcmpps_avx(auVar179,auVar113,2);
          _local_900 = vandps_avx(auVar109,local_7a0);
          auVar180._8_4_ = 3;
          auVar180._0_8_ = 0x300000003;
          auVar180._12_4_ = 3;
          auVar180._16_4_ = 3;
          auVar180._20_4_ = 3;
          auVar180._24_4_ = 3;
          auVar180._28_4_ = 3;
          auVar203._8_4_ = 2;
          auVar203._0_8_ = 0x200000002;
          auVar203._12_4_ = 2;
          auVar203._16_4_ = 2;
          auVar203._20_4_ = 2;
          auVar203._24_4_ = 2;
          auVar203._28_4_ = 2;
          auVar109 = vblendvps_avx(auVar203,auVar180,auVar110);
          auVar168 = vpcmpgtd_avx(auVar109._16_16_,local_800);
          auVar164 = vpshufd_avx(local_7e0._0_16_,0);
          auVar164 = vpcmpgtd_avx(auVar109._0_16_,auVar164);
          auVar181._16_16_ = auVar168;
          auVar181._0_16_ = auVar113._0_16_;
          _local_8e0 = vblendps_avx(ZEXT1632(auVar164),auVar181,0xf0);
          auVar109 = vandnps_avx(_local_8e0,_local_900);
          auVar110 = _local_900 & ~_local_8e0;
          local_740 = auVar109;
          if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar110 >> 0x7f,0) != '\0') ||
                (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar110 >> 0xbf,0) != '\0') ||
              (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar110[0x1f] < '\0') {
            local_8c0._4_4_ = (float)local_960._4_4_ + local_380._4_4_;
            local_8c0._0_4_ = (float)local_960._0_4_ + local_380._0_4_;
            fStack_8b8 = fStack_958 + local_380._8_4_;
            fStack_8b4 = fStack_954 + local_380._12_4_;
            fStack_8b0 = fStack_950 + local_380._16_4_;
            fStack_8ac = fStack_94c + local_380._20_4_;
            fStack_8a8 = fStack_948 + local_380._24_4_;
            fStack_8a4 = fStack_944 + local_380._28_4_;
            _local_a20 = local_380;
            do {
              auVar116._8_4_ = 0x7f800000;
              auVar116._0_8_ = 0x7f8000007f800000;
              auVar116._12_4_ = 0x7f800000;
              auVar116._16_4_ = 0x7f800000;
              auVar116._20_4_ = 0x7f800000;
              auVar116._24_4_ = 0x7f800000;
              auVar116._28_4_ = 0x7f800000;
              auVar110 = vblendvps_avx(auVar116,_local_a20,auVar109);
              auVar29 = vshufps_avx(auVar110,auVar110,0xb1);
              auVar29 = vminps_avx(auVar110,auVar29);
              auVar26 = vshufpd_avx(auVar29,auVar29,5);
              auVar29 = vminps_avx(auVar29,auVar26);
              auVar26 = vperm2f128_avx(auVar29,auVar29,1);
              auVar29 = vminps_avx(auVar29,auVar26);
              auVar29 = vcmpps_avx(auVar110,auVar29,0);
              auVar26 = auVar109 & auVar29;
              auVar110 = auVar109;
              if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar26 >> 0x7f,0) != '\0') ||
                    (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0xbf,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar26[0x1f] < '\0') {
                auVar110 = vandps_avx(auVar29,auVar109);
              }
              uVar93 = vmovmskps_avx(auVar110);
              uVar91 = 0;
              if (uVar93 != 0) {
                for (; (uVar93 >> uVar91 & 1) == 0; uVar91 = uVar91 + 1) {
                }
              }
              uVar87 = (ulong)uVar91;
              local_740 = auVar109;
              *(undefined4 *)(local_740 + uVar87 * 4) = 0;
              fVar186 = local_1c0[uVar87];
              uVar91 = *(uint *)(local_360 + uVar87 * 4);
              fVar231 = auVar9._0_4_;
              if ((float)local_a60._0_4_ < 0.0) {
                fVar231 = sqrtf((float)local_a60._0_4_);
              }
              auVar164 = vminps_avx(_local_b50,_local_b70);
              auVar168 = vmaxps_avx(_local_b50,_local_b70);
              auVar104 = vminps_avx(_local_b60,_local_b80);
              auVar135 = vminps_avx(auVar164,auVar104);
              auVar164 = vmaxps_avx(_local_b60,_local_b80);
              auVar104 = vmaxps_avx(auVar168,auVar164);
              auVar194._8_4_ = 0x7fffffff;
              auVar194._0_8_ = 0x7fffffff7fffffff;
              auVar194._12_4_ = 0x7fffffff;
              auVar168 = vandps_avx(auVar135,auVar194);
              auVar164 = vandps_avx(auVar104,auVar194);
              auVar168 = vmaxps_avx(auVar168,auVar164);
              auVar164 = vmovshdup_avx(auVar168);
              auVar164 = vmaxss_avx(auVar164,auVar168);
              auVar168 = vshufpd_avx(auVar168,auVar168,1);
              auVar168 = vmaxss_avx(auVar168,auVar164);
              local_b40._0_4_ = auVar168._0_4_ * 1.9073486e-06;
              local_980._0_4_ = fVar231 * 1.9073486e-06;
              local_9e0._0_16_ = vshufps_avx(auVar104,auVar104,0xff);
              auVar168 = vinsertps_avx(ZEXT416(uVar91),ZEXT416((uint)fVar186),0x10);
              auVar333 = ZEXT1664(auVar168);
              bVar96 = true;
              uVar87 = 0;
              do {
                auVar98 = auVar333._0_16_;
                auVar168 = vmovshdup_avx(auVar98);
                fVar186 = auVar168._0_4_;
                fVar205 = 1.0 - fVar186;
                fVar231 = fVar205 * fVar205 * fVar205;
                fVar204 = fVar186 * fVar186 * fVar186;
                fVar232 = fVar186 * fVar205;
                auVar168 = vshufps_avx(ZEXT416((uint)(fVar204 * 0.16666667)),
                                       ZEXT416((uint)(fVar204 * 0.16666667)),0);
                auVar164 = ZEXT416((uint)((fVar204 * 4.0 + fVar231 +
                                          fVar186 * fVar232 * 12.0 + fVar205 * fVar232 * 6.0) *
                                         0.16666667));
                auVar164 = vshufps_avx(auVar164,auVar164,0);
                auVar104 = ZEXT416((uint)((fVar231 * 4.0 + fVar204 +
                                          fVar205 * fVar232 * 12.0 + fVar186 * fVar232 * 6.0) *
                                         0.16666667));
                auVar104 = vshufps_avx(auVar104,auVar104,0);
                auVar135 = vshufps_avx(auVar98,auVar98,0);
                auVar165._0_4_ = auVar135._0_4_ * (float)local_a50._0_4_ + 0.0;
                auVar165._4_4_ = auVar135._4_4_ * (float)local_a50._4_4_ + 0.0;
                auVar165._8_4_ = auVar135._8_4_ * fStack_a48 + 0.0;
                auVar165._12_4_ = auVar135._12_4_ * fStack_a44 + 0.0;
                auVar135 = vshufps_avx(ZEXT416((uint)(fVar231 * 0.16666667)),
                                       ZEXT416((uint)(fVar231 * 0.16666667)),0);
                auVar102._0_4_ =
                     auVar135._0_4_ * (float)local_b50._0_4_ +
                     auVar104._0_4_ * (float)local_b70._0_4_ +
                     auVar168._0_4_ * (float)local_b80._0_4_ +
                     auVar164._0_4_ * (float)local_b60._0_4_;
                auVar102._4_4_ =
                     auVar135._4_4_ * (float)local_b50._4_4_ +
                     auVar104._4_4_ * (float)local_b70._4_4_ +
                     auVar168._4_4_ * (float)local_b80._4_4_ +
                     auVar164._4_4_ * (float)local_b60._4_4_;
                auVar102._8_4_ =
                     auVar135._8_4_ * fStack_b48 +
                     auVar104._8_4_ * fStack_b68 +
                     auVar168._8_4_ * fStack_b78 + auVar164._8_4_ * fStack_b58;
                auVar102._12_4_ =
                     auVar135._12_4_ * fStack_b44 +
                     auVar104._12_4_ * fStack_b64 +
                     auVar168._12_4_ * fStack_b74 + auVar164._12_4_ * fStack_b54;
                local_9c0._0_16_ = auVar102;
                auVar168 = vsubps_avx(auVar165,auVar102);
                local_9a0 = auVar168._0_4_;
                fStack_99c = auVar168._4_4_;
                fStack_998 = auVar168._8_4_;
                fStack_994 = auVar168._12_4_;
                auVar168 = vdpps_avx(auVar168,auVar168,0x7f);
                fVar231 = auVar168._0_4_;
                local_cc0 = auVar333._0_4_;
                if (fVar231 < 0.0) {
                  fVar204 = sqrtf(fVar231);
                }
                else {
                  auVar164 = vsqrtss_avx(auVar168,auVar168);
                  fVar204 = auVar164._0_4_;
                }
                auVar164 = ZEXT416((uint)(fVar186 * fVar186 * 0.5));
                auVar164 = vshufps_avx(auVar164,auVar164,0);
                auVar104 = ZEXT416((uint)((fVar205 * fVar205 + fVar232 * 4.0) * 0.5));
                auVar104 = vshufps_avx(auVar104,auVar104,0);
                auVar135 = ZEXT416((uint)((fVar186 * -fVar186 - fVar232 * 4.0) * 0.5));
                auVar135 = vshufps_avx(auVar135,auVar135,0);
                auVar103 = ZEXT416((uint)(fVar205 * -fVar205 * 0.5));
                auVar103 = vshufps_avx(auVar103,auVar103,0);
                auVar305._0_4_ =
                     (float)local_b50._0_4_ * auVar103._0_4_ +
                     (float)local_b70._0_4_ * auVar135._0_4_ +
                     (float)local_b80._0_4_ * auVar164._0_4_ +
                     (float)local_b60._0_4_ * auVar104._0_4_;
                auVar305._4_4_ =
                     (float)local_b50._4_4_ * auVar103._4_4_ +
                     (float)local_b70._4_4_ * auVar135._4_4_ +
                     (float)local_b80._4_4_ * auVar164._4_4_ +
                     (float)local_b60._4_4_ * auVar104._4_4_;
                auVar305._8_4_ =
                     fStack_b48 * auVar103._8_4_ +
                     fStack_b68 * auVar135._8_4_ +
                     fStack_b78 * auVar164._8_4_ + fStack_b58 * auVar104._8_4_;
                auVar305._12_4_ =
                     fStack_b44 * auVar103._12_4_ +
                     fStack_b64 * auVar135._12_4_ +
                     fStack_b74 * auVar164._12_4_ + fStack_b54 * auVar104._12_4_;
                auVar164 = vshufps_avx(auVar98,auVar98,0x55);
                auVar104 = ZEXT416((uint)(fVar205 - (fVar186 + fVar186)));
                auVar135 = vshufps_avx(auVar104,auVar104,0);
                auVar104 = ZEXT416((uint)(fVar186 - (fVar205 + fVar205)));
                auVar103 = vshufps_avx(auVar104,auVar104,0);
                auVar129 = vshufps_avx(ZEXT416((uint)fVar205),ZEXT416((uint)fVar205),0);
                auVar104 = vdpps_avx(auVar305,auVar305,0x7f);
                auVar136._0_4_ =
                     (float)local_b50._0_4_ * auVar129._0_4_ +
                     (float)local_b70._0_4_ * auVar103._0_4_ +
                     (float)local_b80._0_4_ * auVar164._0_4_ +
                     (float)local_b60._0_4_ * auVar135._0_4_;
                auVar136._4_4_ =
                     (float)local_b50._4_4_ * auVar129._4_4_ +
                     (float)local_b70._4_4_ * auVar103._4_4_ +
                     (float)local_b80._4_4_ * auVar164._4_4_ +
                     (float)local_b60._4_4_ * auVar135._4_4_;
                auVar136._8_4_ =
                     fStack_b48 * auVar129._8_4_ +
                     fStack_b68 * auVar103._8_4_ +
                     fStack_b78 * auVar164._8_4_ + fStack_b58 * auVar135._8_4_;
                auVar136._12_4_ =
                     fStack_b44 * auVar129._12_4_ +
                     fStack_b64 * auVar103._12_4_ +
                     fStack_b74 * auVar164._12_4_ + fStack_b54 * auVar135._12_4_;
                auVar164 = vblendps_avx(auVar104,_DAT_01f7aa10,0xe);
                auVar135 = vrsqrtss_avx(auVar164,auVar164);
                fVar232 = auVar135._0_4_;
                fVar186 = auVar104._0_4_;
                auVar135 = vdpps_avx(auVar305,auVar136,0x7f);
                auVar103 = vshufps_avx(auVar104,auVar104,0);
                auVar137._0_4_ = auVar136._0_4_ * auVar103._0_4_;
                auVar137._4_4_ = auVar136._4_4_ * auVar103._4_4_;
                auVar137._8_4_ = auVar136._8_4_ * auVar103._8_4_;
                auVar137._12_4_ = auVar136._12_4_ * auVar103._12_4_;
                auVar135 = vshufps_avx(auVar135,auVar135,0);
                auVar212._0_4_ = auVar305._0_4_ * auVar135._0_4_;
                auVar212._4_4_ = auVar305._4_4_ * auVar135._4_4_;
                auVar212._8_4_ = auVar305._8_4_ * auVar135._8_4_;
                auVar212._12_4_ = auVar305._12_4_ * auVar135._12_4_;
                auVar129 = vsubps_avx(auVar137,auVar212);
                auVar135 = vrcpss_avx(auVar164,auVar164);
                auVar164 = vmaxss_avx(ZEXT416((uint)local_b40._0_4_),
                                      ZEXT416((uint)(local_cc0 * (float)local_980._0_4_)));
                auVar341 = ZEXT1664(auVar164);
                auVar135 = ZEXT416((uint)(auVar135._0_4_ * (2.0 - fVar186 * auVar135._0_4_)));
                auVar135 = vshufps_avx(auVar135,auVar135,0);
                uVar78 = CONCAT44(auVar305._4_4_,auVar305._0_4_);
                auVar222._0_8_ = uVar78 ^ 0x8000000080000000;
                auVar222._8_4_ = -auVar305._8_4_;
                auVar222._12_4_ = -auVar305._12_4_;
                auVar103 = ZEXT416((uint)(fVar232 * 1.5 +
                                         fVar186 * -0.5 * fVar232 * fVar232 * fVar232));
                auVar103 = vshufps_avx(auVar103,auVar103,0);
                auVar195._0_4_ = auVar103._0_4_ * auVar129._0_4_ * auVar135._0_4_;
                auVar195._4_4_ = auVar103._4_4_ * auVar129._4_4_ * auVar135._4_4_;
                auVar195._8_4_ = auVar103._8_4_ * auVar129._8_4_ * auVar135._8_4_;
                auVar195._12_4_ = auVar103._12_4_ * auVar129._12_4_ * auVar135._12_4_;
                auVar245._0_4_ = auVar305._0_4_ * auVar103._0_4_;
                auVar245._4_4_ = auVar305._4_4_ * auVar103._4_4_;
                auVar245._8_4_ = auVar305._8_4_ * auVar103._8_4_;
                auVar245._12_4_ = auVar305._12_4_ * auVar103._12_4_;
                if (fVar186 < 0.0) {
                  local_a80._0_16_ = auVar195;
                  fVar186 = sqrtf(fVar186);
                  auVar341 = ZEXT464(auVar164._0_4_);
                  auVar195 = local_a80._0_16_;
                }
                else {
                  auVar104 = vsqrtss_avx(auVar104,auVar104);
                  fVar186 = auVar104._0_4_;
                }
                auVar82._4_4_ = fStack_99c;
                auVar82._0_4_ = local_9a0;
                auVar82._8_4_ = fStack_998;
                auVar82._12_4_ = fStack_994;
                auVar104 = vdpps_avx(auVar82,auVar245,0x7f);
                fVar186 = ((float)local_b40._0_4_ / fVar186) * (fVar204 + 1.0) +
                          auVar341._0_4_ + fVar204 * (float)local_b40._0_4_;
                auVar135 = vdpps_avx(auVar222,auVar245,0x7f);
                auVar103 = vdpps_avx(auVar82,auVar195,0x7f);
                auVar129 = vdpps_avx(_local_a50,auVar245,0x7f);
                auVar97 = vdpps_avx(auVar82,auVar222,0x7f);
                fVar204 = auVar135._0_4_ + auVar103._0_4_;
                fVar232 = auVar104._0_4_;
                auVar105._0_4_ = fVar232 * fVar232;
                auVar105._4_4_ = auVar104._4_4_ * auVar104._4_4_;
                auVar105._8_4_ = auVar104._8_4_ * auVar104._8_4_;
                auVar105._12_4_ = auVar104._12_4_ * auVar104._12_4_;
                auVar103 = vsubps_avx(auVar168,auVar105);
                auVar135 = vdpps_avx(auVar82,_local_a50,0x7f);
                fVar205 = auVar97._0_4_ - fVar232 * fVar204;
                fVar233 = auVar135._0_4_ - fVar232 * auVar129._0_4_;
                auVar135 = vrsqrtss_avx(auVar103,auVar103);
                fVar206 = auVar103._0_4_;
                fVar232 = auVar135._0_4_;
                fVar232 = fVar232 * 1.5 + fVar206 * -0.5 * fVar232 * fVar232 * fVar232;
                if (fVar206 < 0.0) {
                  local_a80._0_16_ = ZEXT416((uint)fVar204);
                  local_860._0_4_ = fVar205;
                  local_880._0_4_ = fVar233;
                  local_aa0._0_4_ = fVar232;
                  fVar206 = sqrtf(fVar206);
                  auVar341 = ZEXT464(auVar164._0_4_);
                  fVar232 = (float)local_aa0._0_4_;
                  fVar205 = (float)local_860._0_4_;
                  fVar233 = (float)local_880._0_4_;
                  auVar164 = local_a80._0_16_;
                }
                else {
                  auVar164 = vsqrtss_avx(auVar103,auVar103);
                  fVar206 = auVar164._0_4_;
                  auVar164 = ZEXT416((uint)fVar204);
                }
                auVar352 = ZEXT1664(auVar104);
                auVar346 = ZEXT464((uint)fVar186);
                auVar106 = vpermilps_avx(local_9c0._0_16_,0xff);
                auVar97 = vshufps_avx(auVar305,auVar305,0xff);
                fVar205 = fVar205 * fVar232 - auVar97._0_4_;
                auVar213._0_8_ = auVar129._0_8_ ^ 0x8000000080000000;
                auVar213._8_4_ = auVar129._8_4_ ^ 0x80000000;
                auVar213._12_4_ = auVar129._12_4_ ^ 0x80000000;
                auVar223._0_4_ = -fVar205;
                auVar223._4_4_ = 0x80000000;
                auVar223._8_4_ = 0x80000000;
                auVar223._12_4_ = 0x80000000;
                fVar204 = auVar164._0_4_ * fVar233 * fVar232;
                auVar253 = ZEXT464((uint)fVar204);
                auVar135 = vinsertps_avx(auVar223,ZEXT416((uint)(fVar233 * fVar232)),0x1c);
                auVar103 = vmovsldup_avx(ZEXT416((uint)(fVar204 - auVar129._0_4_ * fVar205)));
                auVar135 = vdivps_avx(auVar135,auVar103);
                auVar164 = vinsertps_avx(auVar164,auVar213,0x10);
                auVar164 = vdivps_avx(auVar164,auVar103);
                auVar103 = vmovsldup_avx(auVar104);
                auVar106 = ZEXT416((uint)(fVar206 - auVar106._0_4_));
                auVar129 = vmovsldup_avx(auVar106);
                auVar166._0_4_ = auVar103._0_4_ * auVar135._0_4_ + auVar129._0_4_ * auVar164._0_4_;
                auVar166._4_4_ = auVar103._4_4_ * auVar135._4_4_ + auVar129._4_4_ * auVar164._4_4_;
                auVar166._8_4_ = auVar103._8_4_ * auVar135._8_4_ + auVar129._8_4_ * auVar164._8_4_;
                auVar166._12_4_ =
                     auVar103._12_4_ * auVar135._12_4_ + auVar129._12_4_ * auVar164._12_4_;
                auVar135 = vsubps_avx(auVar98,auVar166);
                auVar333 = ZEXT1664(auVar135);
                auVar167._8_4_ = 0x7fffffff;
                auVar167._0_8_ = 0x7fffffff7fffffff;
                auVar167._12_4_ = 0x7fffffff;
                auVar164 = vandps_avx(auVar104,auVar167);
                if (auVar164._0_4_ < fVar186) {
                  auVar196._8_4_ = 0x7fffffff;
                  auVar196._0_8_ = 0x7fffffff7fffffff;
                  auVar196._12_4_ = 0x7fffffff;
                  auVar164 = vandps_avx(auVar106,auVar196);
                  if (auVar164._0_4_ <
                      (float)local_9e0._0_4_ * 1.9073486e-06 + auVar341._0_4_ + fVar186) {
                    fVar232 = auVar135._0_4_ + (float)local_930._0_4_;
                    if (fVar232 < fVar217) {
LAB_00e24c2b:
                      bVar86 = 0;
                      goto LAB_00e24c32;
                    }
                    fVar205 = *(float *)(ray + k * 4 + 0x100);
                    auVar341 = ZEXT464((uint)fVar205);
                    if (fVar232 <= fVar205) {
                      auVar164 = vmovshdup_avx(auVar135);
                      bVar86 = 0;
                      if ((auVar164._0_4_ < 0.0) || (1.0 < auVar164._0_4_)) goto LAB_00e24c32;
                      auVar168 = vrsqrtss_avx(auVar168,auVar168);
                      fVar233 = auVar168._0_4_;
                      pGVar4 = (context->scene->geometries).items[local_af8].ptr;
                      if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) goto LAB_00e24c2b;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar86 = 1, pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_00e24c32;
                      auVar168 = ZEXT416((uint)(fVar233 * 1.5 +
                                               fVar231 * -0.5 * fVar233 * fVar233 * fVar233));
                      auVar168 = vshufps_avx(auVar168,auVar168,0);
                      auVar169._0_4_ = auVar168._0_4_ * local_9a0;
                      auVar169._4_4_ = auVar168._4_4_ * fStack_99c;
                      auVar169._8_4_ = auVar168._8_4_ * fStack_998;
                      auVar169._12_4_ = auVar168._12_4_ * fStack_994;
                      auVar138._0_4_ = auVar305._0_4_ + auVar97._0_4_ * auVar169._0_4_;
                      auVar138._4_4_ = auVar305._4_4_ + auVar97._4_4_ * auVar169._4_4_;
                      auVar138._8_4_ = auVar305._8_4_ + auVar97._8_4_ * auVar169._8_4_;
                      auVar138._12_4_ = auVar305._12_4_ + auVar97._12_4_ * auVar169._12_4_;
                      auVar168 = vshufps_avx(auVar169,auVar169,0xc9);
                      auVar164 = vshufps_avx(auVar305,auVar305,0xc9);
                      auVar170._0_4_ = auVar164._0_4_ * auVar169._0_4_;
                      auVar170._4_4_ = auVar164._4_4_ * auVar169._4_4_;
                      auVar170._8_4_ = auVar164._8_4_ * auVar169._8_4_;
                      auVar170._12_4_ = auVar164._12_4_ * auVar169._12_4_;
                      auVar197._0_4_ = auVar305._0_4_ * auVar168._0_4_;
                      auVar197._4_4_ = auVar305._4_4_ * auVar168._4_4_;
                      auVar197._8_4_ = auVar305._8_4_ * auVar168._8_4_;
                      auVar197._12_4_ = auVar305._12_4_ * auVar168._12_4_;
                      auVar98 = vsubps_avx(auVar197,auVar170);
                      auVar168 = vshufps_avx(auVar98,auVar98,0xc9);
                      auVar164 = vshufps_avx(auVar138,auVar138,0xc9);
                      auVar198._0_4_ = auVar164._0_4_ * auVar168._0_4_;
                      auVar198._4_4_ = auVar164._4_4_ * auVar168._4_4_;
                      auVar198._8_4_ = auVar164._8_4_ * auVar168._8_4_;
                      auVar198._12_4_ = auVar164._12_4_ * auVar168._12_4_;
                      auVar168 = vshufps_avx(auVar98,auVar98,0xd2);
                      auVar139._0_4_ = auVar138._0_4_ * auVar168._0_4_;
                      auVar139._4_4_ = auVar138._4_4_ * auVar168._4_4_;
                      auVar139._8_4_ = auVar138._8_4_ * auVar168._8_4_;
                      auVar139._12_4_ = auVar138._12_4_ * auVar168._12_4_;
                      auVar168 = vsubps_avx(auVar198,auVar139);
                      pRVar5 = context->user;
                      local_680 = vshufps_avx(auVar135,auVar135,0x55);
                      auStack_6d0 = vshufps_avx(auVar168,auVar168,0x55);
                      local_6c0 = vshufps_avx(auVar168,auVar168,0xaa);
                      local_6a0 = vshufps_avx(auVar168,auVar168,0);
                      local_6e0 = (RTCHitN  [16])auStack_6d0;
                      local_660 = ZEXT832(0) << 0x20;
                      local_640 = local_560._0_8_;
                      uStack_638 = local_560._8_8_;
                      uStack_630 = local_560._16_8_;
                      uStack_628 = local_560._24_8_;
                      local_620 = local_540._0_8_;
                      uStack_618 = local_540._8_8_;
                      uStack_610 = local_540._16_8_;
                      uStack_608 = local_540._24_8_;
                      *(undefined8 *)(local_b00 + 8) = local_a40._0_8_;
                      *(undefined8 *)(local_b00 + 10) = local_a40._8_8_;
                      *(undefined8 *)(local_b00 + 0xc) = local_a40._16_8_;
                      *(undefined8 *)(local_b00 + 0xe) = local_a40._24_8_;
                      *(undefined8 *)local_b00 = local_a40._0_8_;
                      *(undefined8 *)(local_b00 + 2) = local_a40._8_8_;
                      *(undefined8 *)(local_b00 + 4) = local_a40._16_8_;
                      *(undefined8 *)(local_b00 + 6) = local_a40._24_8_;
                      local_600 = pRVar5->instID[0];
                      local_5e0 = pRVar5->instPrimID[0];
                      *(float *)(ray + k * 4 + 0x100) = fVar232;
                      local_ba0 = *local_b08;
                      local_b90 = *local_b10;
                      local_af0.valid = (int *)local_ba0;
                      local_af0.geometryUserPtr = pGVar4->userPtr;
                      local_af0.context = context->user;
                      local_af0.hit = local_6e0;
                      local_af0.N = 8;
                      local_af0.ray = (RTCRayN *)ray;
                      local_6b0 = local_6c0;
                      local_690 = local_6a0;
                      local_670 = local_680;
                      uStack_5fc = local_600;
                      uStack_5f8 = local_600;
                      uStack_5f4 = local_600;
                      uStack_5f0 = local_600;
                      uStack_5ec = local_600;
                      uStack_5e8 = local_600;
                      uStack_5e4 = local_600;
                      uStack_5dc = local_5e0;
                      uStack_5d8 = local_5e0;
                      uStack_5d4 = local_5e0;
                      uStack_5d0 = local_5e0;
                      uStack_5cc = local_5e0;
                      uStack_5c8 = local_5e0;
                      uStack_5c4 = local_5e0;
                      if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar253 = ZEXT464((uint)fVar204);
                        auVar333 = ZEXT1664(auVar135);
                        auVar346 = ZEXT464((uint)fVar186);
                        auVar352 = ZEXT1664(auVar104);
                        (*pGVar4->occlusionFilterN)(&local_af0);
                      }
                      auVar168 = vpcmpeqd_avx(local_ba0,ZEXT816(0) << 0x40);
                      auVar164 = vpcmpeqd_avx(local_b90,ZEXT816(0) << 0x40);
                      auVar182._16_16_ = auVar164;
                      auVar182._0_16_ = auVar168;
                      auVar109 = local_a40 & ~auVar182;
                      if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar109 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar109 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar109 >> 0x7f,0) != '\0') ||
                            (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar109 >> 0xbf,0) != '\0') ||
                          (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar109[0x1f] < '\0') {
                        p_Var6 = context->args->filter;
                        if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar253 = ZEXT1664(auVar253._0_16_);
                          auVar333 = ZEXT1664(auVar333._0_16_);
                          auVar346 = ZEXT1664(auVar346._0_16_);
                          auVar352 = ZEXT1664(auVar352._0_16_);
                          (*p_Var6)(&local_af0);
                        }
                        auVar341 = ZEXT464((uint)fVar205);
                        auVar168 = vpcmpeqd_avx(local_ba0,ZEXT816(0) << 0x40);
                        auVar164 = vpcmpeqd_avx(local_b90,ZEXT816(0) << 0x40);
                        auVar117._16_16_ = auVar164;
                        auVar117._0_16_ = auVar168;
                        auVar149._8_4_ = 0xff800000;
                        auVar149._0_8_ = 0xff800000ff800000;
                        auVar149._12_4_ = 0xff800000;
                        auVar149._16_4_ = 0xff800000;
                        auVar149._20_4_ = 0xff800000;
                        auVar149._24_4_ = 0xff800000;
                        auVar149._28_4_ = 0xff800000;
                        auVar109 = vblendvps_avx(auVar149,*(undefined1 (*) [32])
                                                           (local_af0.ray + 0x100),auVar117);
                        *(undefined1 (*) [32])(local_af0.ray + 0x100) = auVar109;
                        auVar109 = local_a40 & ~auVar117;
                        if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar109 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar109 >> 0x7f,0) != '\0')
                              || (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar109 >> 0xbf,0) != '\0') ||
                            (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar109[0x1f] < '\0') {
                          bVar86 = 1;
                          goto LAB_00e24c32;
                        }
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar205;
                    }
                    auVar341 = ZEXT464((uint)fVar205);
                    bVar86 = 0;
                    goto LAB_00e24c32;
                  }
                }
                bVar96 = uVar87 < 4;
                uVar87 = uVar87 + 1;
              } while (uVar87 != 5);
              bVar96 = false;
              bVar86 = 5;
LAB_00e24c32:
              bVar94 = (bool)(bVar94 | bVar96 & bVar86);
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar113._4_4_ = uVar1;
              auVar113._0_4_ = uVar1;
              auVar113._8_4_ = uVar1;
              auVar113._12_4_ = uVar1;
              auVar113._16_4_ = uVar1;
              auVar113._20_4_ = uVar1;
              auVar113._24_4_ = uVar1;
              auVar113._28_4_ = uVar1;
              auVar110 = vcmpps_avx(_local_8c0,auVar113,2);
              auVar109 = vandps_avx(auVar110,local_740);
              auVar110 = local_740 & auVar110;
              local_740 = auVar109;
            } while ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar110 >> 0x7f,0) != '\0') ||
                       (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar110 >> 0xbf,0) != '\0') ||
                     (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar110[0x1f] < '\0');
          }
          auVar109 = vandps_avx(local_780,local_760);
          auVar110 = vandps_avx(_local_900,_local_8e0);
          auVar288 = ZEXT3264(_local_960);
          auVar215._0_4_ = local_960._0_4_ + local_3c0._0_4_;
          auVar215._4_4_ = local_960._4_4_ + local_3c0._4_4_;
          auVar215._8_4_ = local_960._8_4_ + local_3c0._8_4_;
          auVar215._12_4_ = local_960._12_4_ + local_3c0._12_4_;
          auVar215._16_4_ = local_960._16_4_ + local_3c0._16_4_;
          auVar215._20_4_ = local_960._20_4_ + local_3c0._20_4_;
          auVar215._24_4_ = local_960._24_4_ + local_3c0._24_4_;
          auVar215._28_4_ = local_960._28_4_ + local_3c0._28_4_;
          auVar29 = vcmpps_avx(auVar215,auVar113,2);
          auVar109 = vandps_avx(auVar29,auVar109);
          auVar216._0_4_ = local_380._0_4_ + local_960._0_4_;
          auVar216._4_4_ = local_380._4_4_ + local_960._4_4_;
          auVar216._8_4_ = local_380._8_4_ + local_960._8_4_;
          auVar216._12_4_ = local_380._12_4_ + local_960._12_4_;
          auVar216._16_4_ = local_380._16_4_ + local_960._16_4_;
          auVar216._20_4_ = local_380._20_4_ + local_960._20_4_;
          auVar216._24_4_ = local_380._24_4_ + local_960._24_4_;
          auVar216._28_4_ = local_380._28_4_ + local_960._28_4_;
          auVar29 = vcmpps_avx(auVar216,auVar113,2);
          auVar110 = vandps_avx(auVar29,auVar110);
          auVar110 = vorps_avx(auVar109,auVar110);
          if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar110 >> 0x7f,0) != '\0') ||
                (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar110 >> 0xbf,0) != '\0') ||
              (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar110[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar92 * 0x60) = auVar110;
            auVar109 = vblendvps_avx(local_380,_local_3c0,auVar109);
            *(undefined1 (*) [32])(auStack_160 + uVar92 * 0x60) = auVar109;
            uVar2 = vmovlps_avx(local_6f0);
            (&uStack_140)[uVar92 * 0xc] = uVar2;
            aiStack_138[uVar92 * 0x18] = local_ccc + 1;
            iVar95 = iVar95 + 1;
          }
        }
      }
    }
    if (iVar95 == 0) break;
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar118._4_4_ = uVar1;
    auVar118._0_4_ = uVar1;
    auVar118._8_4_ = uVar1;
    auVar118._12_4_ = uVar1;
    auVar118._16_4_ = uVar1;
    auVar118._20_4_ = uVar1;
    auVar118._24_4_ = uVar1;
    auVar118._28_4_ = uVar1;
    uVar91 = -iVar95;
    pauVar88 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar95 - 1) * 0x60);
    while( true ) {
      auVar109 = pauVar88[1];
      auVar150._0_4_ = (float)local_960._0_4_ + auVar109._0_4_;
      auVar150._4_4_ = (float)local_960._4_4_ + auVar109._4_4_;
      auVar150._8_4_ = fStack_958 + auVar109._8_4_;
      auVar150._12_4_ = fStack_954 + auVar109._12_4_;
      auVar150._16_4_ = fStack_950 + auVar109._16_4_;
      auVar150._20_4_ = fStack_94c + auVar109._20_4_;
      auVar150._24_4_ = fStack_948 + auVar109._24_4_;
      auVar150._28_4_ = fStack_944 + auVar109._28_4_;
      auVar110 = vcmpps_avx(auVar150,auVar118,2);
      _local_6e0 = vandps_avx(auVar110,*pauVar88);
      auVar110 = *pauVar88 & auVar110;
      if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar110 >> 0x7f,0) != '\0') ||
            (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar110 >> 0xbf,0) != '\0') ||
          (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar110[0x1f] < '\0') break;
      pauVar88 = pauVar88 + -3;
      uVar91 = uVar91 + 1;
      if (uVar91 == 0) goto LAB_00e252a2;
    }
    auVar119._8_4_ = 0x7f800000;
    auVar119._0_8_ = 0x7f8000007f800000;
    auVar119._12_4_ = 0x7f800000;
    auVar119._16_4_ = 0x7f800000;
    auVar119._20_4_ = 0x7f800000;
    auVar119._24_4_ = 0x7f800000;
    auVar119._28_4_ = 0x7f800000;
    auVar109 = vblendvps_avx(auVar119,auVar109,_local_6e0);
    auVar110 = vshufps_avx(auVar109,auVar109,0xb1);
    auVar110 = vminps_avx(auVar109,auVar110);
    auVar29 = vshufpd_avx(auVar110,auVar110,5);
    auVar110 = vminps_avx(auVar110,auVar29);
    auVar29 = vperm2f128_avx(auVar110,auVar110,1);
    auVar110 = vminps_avx(auVar110,auVar29);
    auVar110 = vcmpps_avx(auVar109,auVar110,0);
    auVar29 = _local_6e0 & auVar110;
    auVar109 = _local_6e0;
    if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar29 >> 0x7f,0) != '\0') ||
          (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar29 >> 0xbf,0) != '\0') ||
        (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar29[0x1f] < '\0')
    {
      auVar109 = vandps_avx(auVar110,_local_6e0);
    }
    auVar107._8_8_ = 0;
    auVar107._0_8_ = *(ulong *)pauVar88[2];
    local_ccc = *(uint *)(pauVar88[2] + 8);
    uVar89 = vmovmskps_avx(auVar109);
    uVar93 = 0;
    if (uVar89 != 0) {
      for (; (uVar89 >> uVar93 & 1) == 0; uVar93 = uVar93 + 1) {
      }
    }
    *(undefined4 *)(local_6e0 + (ulong)uVar93 * 4) = 0;
    *pauVar88 = _local_6e0;
    uVar89 = ~uVar91;
    if ((((((((_local_6e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_6e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_6e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_6e0 >> 0x7f,0) != '\0') ||
          (_local_6e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_6e0 >> 0xbf,0) != '\0') ||
        (_local_6e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_6e0[0x1f] < '\0') {
      uVar89 = -uVar91;
    }
    uVar92 = (ulong)uVar89;
    auVar168 = vshufps_avx(auVar107,auVar107,0);
    auVar164 = vshufps_avx(auVar107,auVar107,0x55);
    auVar164 = vsubps_avx(auVar164,auVar168);
    local_3c0._4_4_ = auVar168._4_4_ + auVar164._4_4_ * 0.14285715;
    local_3c0._0_4_ = auVar168._0_4_ + auVar164._0_4_ * 0.0;
    fStack_3b8 = auVar168._8_4_ + auVar164._8_4_ * 0.2857143;
    fStack_3b4 = auVar168._12_4_ + auVar164._12_4_ * 0.42857146;
    fStack_3b0 = auVar168._0_4_ + auVar164._0_4_ * 0.5714286;
    fStack_3ac = auVar168._4_4_ + auVar164._4_4_ * 0.71428573;
    fStack_3a8 = auVar168._8_4_ + auVar164._8_4_ * 0.8571429;
    fStack_3a4 = auVar168._12_4_ + auVar164._12_4_;
    local_6f0._8_8_ = 0;
    local_6f0._0_8_ = *(ulong *)(local_3c0 + (ulong)uVar93 * 4);
  } while( true );
LAB_00e252a2:
  if (bVar94 != false) {
    return bVar94;
  }
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar108._4_4_ = uVar1;
  auVar108._0_4_ = uVar1;
  auVar108._8_4_ = uVar1;
  auVar108._12_4_ = uVar1;
  auVar130 = vcmpps_avx(local_700,auVar108,2);
  uVar91 = vmovmskps_avx(auVar130);
  uVar91 = (uint)local_908 & uVar91;
  if (uVar91 == 0) {
    return false;
  }
  goto LAB_00e226c9;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }